

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_avx512.cpp
# Opt level: O0

void ncnn::softmax_pack16
               (float *_ptr,int elemcount,int stride,int size1,float *_maxptr,float *_sumptr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  ushort uVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [56];
  undefined1 auVar294 [40];
  undefined1 auVar295 [48];
  undefined1 auVar297 [32];
  float *pfVar296;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 (*in_R8) [64];
  undefined1 (*in_R9) [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  float fVar316;
  float fVar317;
  undefined1 auVar318 [64];
  __m512 _sum_4;
  __m512 _p_2;
  __m512 _p3_2;
  __m512 _p2_2;
  __m512 _p1_2;
  __m512 _p0_2;
  int j_3;
  float *sumptr_2;
  float *ptr_2;
  int i_2;
  __m128 _sum_3;
  __m128 _one;
  __m256 _sum_2;
  __m256 _one_avx;
  __m512 _sum_1;
  __m512 _one_avx512;
  int j_2;
  float *sumptr_1;
  __m512 _max_1;
  __m512 _p_1;
  __m512 _sum;
  __m512 _sum1;
  __m512 _sum89abcdef;
  __m512 _sum01234567;
  __m512 _sumcdef;
  __m512 _sum89ab;
  __m512 _sum4567;
  __m512 _sum0123;
  __m512 _sumef;
  __m512 _sumcd;
  __m512 _sumab;
  __m512 _sum89;
  __m512 _sum67;
  __m512 _sum45;
  __m512 _sum23;
  __m512 _sum01;
  __m512 _tmpf_1;
  __m512 _tmpe_1;
  __m512 _tmpd_1;
  __m512 _tmpc_1;
  __m512 _tmpb_1;
  __m512 _tmpa_1;
  __m512 _tmp9_1;
  __m512 _tmp8_1;
  __m512 _tmp7_1;
  __m512 _tmp6_1;
  __m512 _tmp5_1;
  __m512 _tmp4_1;
  __m512 _tmp3_1;
  __m512 _tmp2_1;
  __m512 _tmp1_1;
  __m512 _tmp0_1;
  __m512 _pf_1;
  __m512 _pe_1;
  __m512 _pd_1;
  __m512 _pc_1;
  __m512 _pb_1;
  __m512 _pa_1;
  __m512 _p9_1;
  __m512 _p8_1;
  __m512 _p7_1;
  __m512 _p6_1;
  __m512 _p5_1;
  __m512 _p4_1;
  __m512 _p3_1;
  __m512 _p2_1;
  __m512 _p1_1;
  __m512 _p0_1;
  int j_1;
  float *sumptr;
  float *maxptr_1;
  float *ptr_1;
  int i_1;
  __m512 _p;
  __m512 _max;
  __m512 _max1;
  __m512 _max89abcdef;
  __m512 _max01234567;
  __m512 _maxcdef;
  __m512 _max89ab;
  __m512 _max4567;
  __m512 _max0123;
  __m512 _maxef;
  __m512 _maxcd;
  __m512 _maxab;
  __m512 _max89;
  __m512 _max67;
  __m512 _max45;
  __m512 _max23;
  __m512 _max01;
  __m512 _tmpf;
  __m512 _tmpe;
  __m512 _tmpd;
  __m512 _tmpc;
  __m512 _tmpb;
  __m512 _tmpa;
  __m512 _tmp9;
  __m512 _tmp8;
  __m512 _tmp7;
  __m512 _tmp6;
  __m512 _tmp5;
  __m512 _tmp4;
  __m512 _tmp3;
  __m512 _tmp2;
  __m512 _tmp1;
  __m512 _tmp0;
  __m512 _pf;
  __m512 _pe;
  __m512 _pd;
  __m512 _pc;
  __m512 _pb;
  __m512 _pa;
  __m512 _p9;
  __m512 _p8;
  __m512 _p7;
  __m512 _p6;
  __m512 _p5;
  __m512 _p4;
  __m512 _p3;
  __m512 _p2;
  __m512 _p1;
  __m512 _p0;
  int j;
  float *maxptr;
  float *ptr;
  int i;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m512 pow2n_16;
  __m512 y_16;
  __mmask16 mask_16;
  __m512 one_16;
  __m512i imm0_16;
  __m512 fx_16;
  __m512 tmp_16;
  __m512 pow2n_15;
  __m512 y_15;
  __mmask16 mask_15;
  __m512 one_15;
  __m512i imm0_15;
  __m512 fx_15;
  __m512 tmp_15;
  __m512 pow2n_14;
  __m512 y_14;
  __mmask16 mask_14;
  __m512 one_14;
  __m512i imm0_14;
  __m512 fx_14;
  __m512 tmp_14;
  __m512 pow2n_13;
  __m512 y_13;
  __mmask16 mask_13;
  __m512 one_13;
  __m512i imm0_13;
  __m512 fx_13;
  __m512 tmp_13;
  __m512 pow2n_12;
  __m512 y_12;
  __mmask16 mask_12;
  __m512 one_12;
  __m512i imm0_12;
  __m512 fx_12;
  __m512 tmp_12;
  __m512 pow2n_11;
  __m512 y_11;
  __mmask16 mask_11;
  __m512 one_11;
  __m512i imm0_11;
  __m512 fx_11;
  __m512 tmp_11;
  __m512 pow2n_10;
  __m512 y_10;
  __mmask16 mask_10;
  __m512 one_10;
  __m512i imm0_10;
  __m512 fx_10;
  __m512 tmp_10;
  __m512 pow2n_9;
  __m512 y_9;
  __mmask16 mask_9;
  __m512 one_9;
  __m512i imm0_9;
  __m512 fx_9;
  __m512 tmp_9;
  __m512 pow2n_8;
  __m512 y_8;
  __mmask16 mask_8;
  __m512 one_8;
  __m512i imm0_8;
  __m512 fx_8;
  __m512 tmp_8;
  __m512 pow2n_7;
  __m512 y_7;
  __mmask16 mask_7;
  __m512 one_7;
  __m512i imm0_7;
  __m512 fx_7;
  __m512 tmp_7;
  __m512 pow2n_6;
  __m512 y_6;
  __mmask16 mask_6;
  __m512 one_6;
  __m512i imm0_6;
  __m512 fx_6;
  __m512 tmp_6;
  __m512 pow2n_5;
  __m512 y_5;
  __mmask16 mask_5;
  __m512 one_5;
  __m512i imm0_5;
  __m512 fx_5;
  __m512 tmp_5;
  __m512 pow2n_4;
  __m512 y_4;
  __mmask16 mask_4;
  __m512 one_4;
  __m512i imm0_4;
  __m512 fx_4;
  __m512 tmp_4;
  __m512 pow2n_3;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_3;
  __m512 tmp_3;
  __m512 pow2n_2;
  __m512 y_2;
  __mmask16 mask_2;
  __m512 one_2;
  __m512i imm0_2;
  __m512 fx_2;
  __m512 tmp_2;
  __m512 pow2n_1;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m256 x256_1;
  undefined8 uStack_17580;
  undefined8 uStack_17578;
  undefined8 uStack_17570;
  undefined8 uStack_17568;
  undefined8 uStack_17560;
  undefined8 uStack_17558;
  undefined8 uStack_17550;
  undefined8 uStack_17548;
  undefined8 uStack_17540;
  undefined8 uStack_17538;
  undefined8 uStack_17530;
  undefined8 uStack_17528;
  undefined8 uStack_17520;
  undefined8 uStack_17518;
  undefined8 uStack_17510;
  undefined8 uStack_17508;
  undefined8 uStack_17500;
  undefined8 uStack_174f8;
  undefined8 uStack_174f0;
  undefined8 uStack_174e8;
  undefined8 uStack_174e0;
  undefined8 uStack_174d8;
  undefined8 uStack_174d0;
  undefined8 uStack_174c8;
  undefined8 uStack_174c0;
  undefined8 uStack_174b8;
  undefined8 uStack_174b0;
  undefined8 uStack_174a8;
  undefined8 uStack_174a0;
  undefined8 uStack_17498;
  undefined8 uStack_17490;
  undefined8 uStack_17488;
  undefined8 uStack_17480;
  undefined8 uStack_17478;
  undefined8 uStack_17470;
  undefined8 uStack_17468;
  undefined8 uStack_17460;
  undefined8 uStack_17458;
  undefined8 uStack_17450;
  undefined8 uStack_17448;
  int iStack_1743c;
  undefined1 (*pauStack_17438) [64];
  undefined1 (*pauStack_17430) [64];
  int iStack_17424;
  undefined8 uStack_17420;
  undefined8 uStack_17418;
  undefined8 uStack_17400;
  undefined8 uStack_173f8;
  undefined8 uStack_173f0;
  undefined8 uStack_173e8;
  undefined8 uStack_173c0;
  undefined8 uStack_173b8;
  undefined8 uStack_173b0;
  undefined8 uStack_173a8;
  undefined8 uStack_173a0;
  undefined8 uStack_17398;
  undefined8 uStack_17390;
  undefined8 uStack_17388;
  int iStack_1730c;
  undefined1 (*pauStack_17308) [64];
  undefined8 uStack_17280;
  undefined8 uStack_17278;
  undefined8 uStack_17270;
  undefined8 uStack_17268;
  undefined8 uStack_17260;
  undefined8 uStack_17258;
  undefined8 uStack_17250;
  undefined8 uStack_17248;
  undefined1 auStack_17180 [32];
  undefined1 auStack_17100 [32];
  int iStack_16664;
  undefined1 (*pauStack_16660) [64];
  undefined1 (*pauStack_16658) [64];
  undefined1 (*pauStack_16650) [64];
  int iStack_16648;
  float fStack_16644;
  undefined8 uStack_16640;
  undefined8 uStack_16638;
  undefined8 uStack_16630;
  undefined8 uStack_16628;
  undefined8 uStack_16620;
  undefined8 uStack_16618;
  undefined8 uStack_16610;
  undefined8 uStack_16608;
  undefined1 auStack_16600 [64];
  undefined1 auStack_165c0 [64];
  undefined1 auStack_16580 [64];
  undefined1 auStack_16540 [64];
  undefined1 auStack_16500 [64];
  undefined1 auStack_164c0 [64];
  undefined1 auStack_16480 [64];
  undefined1 auStack_16440 [64];
  undefined1 auStack_16400 [64];
  undefined1 auStack_163c0 [64];
  undefined1 auStack_16380 [64];
  undefined1 auStack_16340 [64];
  undefined1 auStack_16300 [64];
  undefined1 auStack_162c0 [64];
  undefined1 auStack_16280 [64];
  undefined1 auStack_16240 [64];
  undefined1 auStack_16200 [64];
  undefined1 auStack_161c0 [64];
  undefined1 auStack_16180 [64];
  undefined1 auStack_16140 [64];
  undefined1 auStack_16100 [64];
  undefined1 auStack_160c0 [64];
  undefined1 auStack_16080 [64];
  undefined1 auStack_16040 [64];
  undefined1 auStack_16000 [64];
  undefined1 auStack_15fc0 [64];
  undefined1 auStack_15f80 [64];
  undefined1 auStack_15f40 [64];
  undefined1 auStack_15f00 [64];
  undefined1 auStack_15ec0 [64];
  undefined1 auStack_15e80 [64];
  undefined1 auStack_15e40 [64];
  undefined8 uStack_15e00;
  undefined8 uStack_15df8;
  undefined8 uStack_15df0;
  undefined8 uStack_15de8;
  undefined8 uStack_15de0;
  undefined8 uStack_15dd8;
  undefined8 uStack_15dd0;
  undefined8 uStack_15dc8;
  undefined8 uStack_15dc0;
  undefined8 uStack_15db8;
  undefined8 uStack_15db0;
  undefined8 uStack_15da8;
  undefined8 uStack_15da0;
  undefined8 uStack_15d98;
  undefined8 uStack_15d90;
  undefined8 uStack_15d88;
  undefined8 uStack_15d80;
  undefined8 uStack_15d78;
  undefined8 uStack_15d70;
  undefined8 uStack_15d68;
  undefined8 uStack_15d60;
  undefined8 uStack_15d58;
  undefined8 uStack_15d50;
  undefined8 uStack_15d48;
  undefined8 uStack_15d40;
  undefined8 uStack_15d38;
  undefined8 uStack_15d30;
  undefined8 uStack_15d28;
  undefined8 uStack_15d20;
  undefined8 uStack_15d18;
  undefined8 uStack_15d10;
  undefined8 uStack_15d08;
  undefined8 uStack_15d00;
  undefined8 uStack_15cf8;
  undefined8 uStack_15cf0;
  undefined8 uStack_15ce8;
  undefined8 uStack_15ce0;
  undefined8 uStack_15cd8;
  undefined8 uStack_15cd0;
  undefined8 uStack_15cc8;
  undefined8 uStack_15cc0;
  undefined8 uStack_15cb8;
  undefined8 uStack_15cb0;
  undefined8 uStack_15ca8;
  undefined8 uStack_15ca0;
  undefined8 uStack_15c98;
  undefined8 uStack_15c90;
  undefined8 uStack_15c88;
  undefined8 uStack_15c80;
  undefined8 uStack_15c78;
  undefined8 uStack_15c70;
  undefined8 uStack_15c68;
  undefined8 uStack_15c60;
  undefined8 uStack_15c58;
  undefined8 uStack_15c50;
  undefined8 uStack_15c48;
  undefined8 uStack_15c40;
  undefined8 uStack_15c38;
  undefined8 uStack_15c30;
  undefined8 uStack_15c28;
  undefined8 uStack_15c20;
  undefined8 uStack_15c18;
  undefined8 uStack_15c10;
  undefined8 uStack_15c08;
  undefined8 uStack_15c00;
  undefined8 uStack_15bf8;
  undefined8 uStack_15bf0;
  undefined8 uStack_15be8;
  undefined8 uStack_15be0;
  undefined8 uStack_15bd8;
  undefined8 uStack_15bd0;
  undefined8 uStack_15bc8;
  undefined8 uStack_15bc0;
  undefined8 uStack_15bb8;
  undefined8 uStack_15bb0;
  undefined8 uStack_15ba8;
  undefined8 uStack_15ba0;
  undefined8 uStack_15b98;
  undefined8 uStack_15b90;
  undefined8 uStack_15b88;
  undefined8 uStack_15b80;
  undefined8 uStack_15b78;
  undefined8 uStack_15b70;
  undefined8 uStack_15b68;
  undefined8 uStack_15b60;
  undefined8 uStack_15b58;
  undefined8 uStack_15b50;
  undefined8 uStack_15b48;
  undefined8 uStack_15b40;
  undefined8 uStack_15b38;
  undefined8 uStack_15b30;
  undefined8 uStack_15b28;
  undefined8 uStack_15b20;
  undefined8 uStack_15b18;
  undefined8 uStack_15b10;
  undefined8 uStack_15b08;
  undefined8 uStack_15b00;
  undefined8 uStack_15af8;
  undefined8 uStack_15af0;
  undefined8 uStack_15ae8;
  undefined8 uStack_15ae0;
  undefined8 uStack_15ad8;
  undefined8 uStack_15ad0;
  undefined8 uStack_15ac8;
  undefined8 uStack_15ac0;
  undefined8 uStack_15ab8;
  undefined8 uStack_15ab0;
  undefined8 uStack_15aa8;
  undefined8 uStack_15aa0;
  undefined8 uStack_15a98;
  undefined8 uStack_15a90;
  undefined8 uStack_15a88;
  undefined8 uStack_15a80;
  undefined8 uStack_15a78;
  undefined8 uStack_15a70;
  undefined8 uStack_15a68;
  undefined8 uStack_15a60;
  undefined8 uStack_15a58;
  undefined8 uStack_15a50;
  undefined8 uStack_15a48;
  undefined8 uStack_15a40;
  undefined8 uStack_15a38;
  undefined8 uStack_15a30;
  undefined8 uStack_15a28;
  undefined8 uStack_15a20;
  undefined8 uStack_15a18;
  undefined8 uStack_15a10;
  undefined8 uStack_15a08;
  int iStack_159c4;
  undefined1 (*pauStack_159c0) [64];
  undefined1 (*pauStack_159b8) [64];
  int iStack_159ac;
  undefined1 (*pauStack_159a8) [64];
  undefined1 (*pauStack_159a0) [64];
  int iStack_15994;
  int iStack_15990;
  int iStack_1598c;
  long lStack_15988;
  undefined1 (*pauStack_14d50) [64];
  undefined1 (*pauStack_14d48) [64];
  undefined1 (*pauStack_14d40) [64];
  undefined1 (*pauStack_14d38) [64];
  undefined1 (*pauStack_14d30) [64];
  undefined1 (*pauStack_14d28) [64];
  undefined1 (*pauStack_14d20) [64];
  undefined1 (*pauStack_14d18) [64];
  undefined1 (*pauStack_14d10) [64];
  undefined1 (*pauStack_14d08) [64];
  undefined1 (*pauStack_14d00) [64];
  undefined1 (*pauStack_14cf8) [64];
  undefined1 (*pauStack_14cf0) [64];
  undefined1 (*pauStack_14ce8) [64];
  undefined1 (*pauStack_14ce0) [64];
  undefined1 (*pauStack_14cd8) [64];
  undefined1 (*pauStack_14cd0) [64];
  undefined1 (*pauStack_14cc8) [64];
  undefined8 uStack_14cc0;
  undefined8 uStack_14cb8;
  undefined8 uStack_14cb0;
  undefined8 uStack_14ca8;
  undefined8 uStack_14ca0;
  undefined8 uStack_14c98;
  undefined8 uStack_14c90;
  undefined8 uStack_14c88;
  undefined8 uStack_14c80;
  undefined8 uStack_14c78;
  undefined8 uStack_14c70;
  undefined8 uStack_14c68;
  undefined8 uStack_14c60;
  undefined8 uStack_14c58;
  undefined8 uStack_14c50;
  undefined8 uStack_14c48;
  undefined8 uStack_14c40;
  undefined8 uStack_14c38;
  undefined8 uStack_14c30;
  undefined8 uStack_14c28;
  undefined8 uStack_14c20;
  undefined8 uStack_14c18;
  undefined8 uStack_14c10;
  undefined8 uStack_14c08;
  undefined8 uStack_14c00;
  undefined8 uStack_14bf8;
  undefined8 uStack_14bf0;
  undefined8 uStack_14be8;
  undefined8 uStack_14be0;
  undefined8 uStack_14bd8;
  undefined8 uStack_14bd0;
  undefined8 uStack_14bc8;
  undefined8 uStack_14bc0;
  undefined8 uStack_14bb8;
  undefined8 uStack_14bb0;
  undefined8 uStack_14ba8;
  undefined8 uStack_14ba0;
  undefined8 uStack_14b98;
  undefined8 uStack_14b90;
  undefined8 uStack_14b88;
  undefined8 uStack_14b80;
  undefined8 uStack_14b78;
  undefined8 uStack_14b70;
  undefined8 uStack_14b68;
  undefined8 uStack_14b60;
  undefined8 uStack_14b58;
  undefined8 uStack_14b50;
  undefined8 uStack_14b48;
  undefined8 uStack_14b40;
  undefined8 uStack_14b38;
  undefined8 uStack_14b30;
  undefined8 uStack_14b28;
  undefined8 uStack_14b20;
  undefined8 uStack_14b18;
  undefined8 uStack_14b10;
  undefined8 uStack_14b08;
  undefined8 uStack_14b00;
  undefined8 uStack_14af8;
  undefined8 uStack_14af0;
  undefined8 uStack_14ae8;
  undefined8 uStack_14ae0;
  undefined8 uStack_14ad8;
  undefined8 uStack_14ad0;
  undefined8 uStack_14ac8;
  undefined8 uStack_14ac0;
  undefined8 uStack_14ab8;
  undefined8 uStack_14ab0;
  undefined8 uStack_14aa8;
  undefined8 uStack_14aa0;
  undefined8 uStack_14a98;
  undefined8 uStack_14a90;
  undefined8 uStack_14a88;
  undefined8 uStack_14a80;
  undefined8 uStack_14a78;
  undefined8 uStack_14a70;
  undefined8 uStack_14a68;
  undefined8 uStack_14a60;
  undefined8 uStack_14a58;
  undefined8 uStack_14a50;
  undefined8 uStack_14a48;
  undefined8 uStack_14a40;
  undefined8 uStack_14a38;
  undefined8 uStack_14a30;
  undefined8 uStack_14a28;
  undefined8 uStack_14a20;
  undefined8 uStack_14a18;
  undefined8 uStack_14a10;
  undefined8 uStack_14a08;
  undefined8 uStack_14a00;
  undefined8 uStack_149f8;
  undefined8 uStack_149f0;
  undefined8 uStack_149e8;
  undefined8 uStack_149e0;
  undefined8 uStack_149d8;
  undefined8 uStack_149d0;
  undefined8 uStack_149c8;
  undefined8 uStack_149c0;
  undefined8 uStack_149b8;
  undefined8 uStack_149b0;
  undefined8 uStack_149a8;
  undefined8 uStack_149a0;
  undefined8 uStack_14998;
  undefined8 uStack_14990;
  undefined8 uStack_14988;
  undefined8 uStack_14980;
  undefined8 uStack_14978;
  undefined8 uStack_14970;
  undefined8 uStack_14968;
  undefined8 uStack_14960;
  undefined8 uStack_14958;
  undefined8 uStack_14950;
  undefined8 uStack_14948;
  undefined8 uStack_14940;
  undefined8 uStack_14938;
  undefined8 uStack_14930;
  undefined8 uStack_14928;
  undefined8 uStack_14920;
  undefined8 uStack_14918;
  undefined8 uStack_14910;
  undefined8 uStack_14908;
  undefined8 uStack_14900;
  undefined8 uStack_148f8;
  undefined8 uStack_148f0;
  undefined8 uStack_148e8;
  undefined8 uStack_148e0;
  undefined8 uStack_148d8;
  undefined8 uStack_148d0;
  undefined8 uStack_148c8;
  undefined8 uStack_148c0;
  undefined8 uStack_148b8;
  undefined8 uStack_148b0;
  undefined8 uStack_148a8;
  undefined8 uStack_148a0;
  undefined8 uStack_14898;
  undefined8 uStack_14890;
  undefined8 uStack_14888;
  undefined8 uStack_14880;
  undefined8 uStack_14878;
  undefined8 uStack_14870;
  undefined8 uStack_14868;
  undefined8 uStack_14860;
  undefined8 uStack_14858;
  undefined8 uStack_14850;
  undefined8 uStack_14848;
  undefined8 uStack_14840;
  undefined8 uStack_14838;
  undefined8 uStack_14830;
  undefined8 uStack_14828;
  undefined8 uStack_14820;
  undefined8 uStack_14818;
  undefined8 uStack_14810;
  undefined8 uStack_14808;
  undefined8 uStack_14800;
  undefined8 uStack_147f8;
  undefined8 uStack_147f0;
  undefined8 uStack_147e8;
  undefined8 uStack_147e0;
  undefined8 uStack_147d8;
  undefined8 uStack_147d0;
  undefined8 uStack_147c8;
  undefined8 uStack_147c0;
  undefined8 uStack_147b8;
  undefined8 uStack_147b0;
  undefined8 uStack_147a8;
  undefined8 uStack_147a0;
  undefined8 uStack_14798;
  undefined8 uStack_14790;
  undefined8 uStack_14788;
  undefined8 uStack_14780;
  undefined8 uStack_14778;
  undefined8 uStack_14770;
  undefined8 uStack_14768;
  undefined8 uStack_14760;
  undefined8 uStack_14758;
  undefined8 uStack_14750;
  undefined8 uStack_14748;
  undefined8 uStack_14740;
  undefined8 uStack_14738;
  undefined8 uStack_14730;
  undefined8 uStack_14728;
  undefined8 uStack_14720;
  undefined8 uStack_14718;
  undefined8 uStack_14710;
  undefined8 uStack_14708;
  undefined8 uStack_14700;
  undefined8 uStack_146f8;
  undefined8 uStack_146f0;
  undefined8 uStack_146e8;
  undefined8 uStack_146e0;
  undefined8 uStack_146d8;
  undefined8 uStack_146d0;
  undefined8 uStack_146c8;
  undefined8 uStack_146c0;
  undefined8 uStack_146b8;
  undefined8 uStack_146b0;
  undefined8 uStack_146a8;
  undefined8 uStack_146a0;
  undefined8 uStack_14698;
  undefined8 uStack_14690;
  undefined8 uStack_14688;
  undefined8 uStack_14680;
  undefined8 uStack_14678;
  undefined8 uStack_14670;
  undefined8 uStack_14668;
  undefined8 uStack_14660;
  undefined8 uStack_14658;
  undefined8 uStack_14650;
  undefined8 uStack_14648;
  undefined8 uStack_14640;
  undefined8 uStack_14638;
  undefined8 uStack_14630;
  undefined8 uStack_14628;
  undefined8 uStack_14620;
  undefined8 uStack_14618;
  undefined8 uStack_14610;
  undefined8 uStack_14608;
  undefined8 uStack_14600;
  undefined8 uStack_145f8;
  undefined8 uStack_145f0;
  undefined8 uStack_145e8;
  undefined8 uStack_145e0;
  undefined8 uStack_145d8;
  undefined8 uStack_145d0;
  undefined8 uStack_145c8;
  undefined8 uStack_145c0;
  undefined8 uStack_145b8;
  undefined8 uStack_145b0;
  undefined8 uStack_145a8;
  undefined8 uStack_145a0;
  undefined8 uStack_14598;
  undefined8 uStack_14590;
  undefined8 uStack_14588;
  undefined8 uStack_14580;
  undefined8 uStack_14578;
  undefined8 uStack_14570;
  undefined8 uStack_14568;
  undefined8 uStack_14560;
  undefined8 uStack_14558;
  undefined8 uStack_14550;
  undefined8 uStack_14548;
  undefined8 uStack_14540;
  undefined8 uStack_14538;
  undefined8 uStack_14530;
  undefined8 uStack_14528;
  undefined8 uStack_14520;
  undefined8 uStack_14518;
  undefined8 uStack_14510;
  undefined8 uStack_14508;
  undefined8 uStack_14500;
  undefined8 uStack_144f8;
  undefined8 uStack_144f0;
  undefined8 uStack_144e8;
  undefined8 uStack_144e0;
  undefined8 uStack_144d8;
  undefined8 uStack_144d0;
  undefined8 uStack_144c8;
  undefined8 uStack_14080;
  undefined8 uStack_14078;
  undefined8 uStack_14070;
  undefined8 uStack_14068;
  undefined8 uStack_14060;
  undefined8 uStack_14058;
  undefined8 uStack_14050;
  undefined8 uStack_14048;
  undefined8 uStack_14040;
  undefined8 uStack_14038;
  undefined8 uStack_14030;
  undefined8 uStack_14028;
  undefined8 uStack_14020;
  undefined8 uStack_14018;
  undefined8 uStack_14010;
  undefined8 uStack_14008;
  undefined8 uStack_14000;
  undefined8 uStack_13ff8;
  undefined8 uStack_13ff0;
  undefined8 uStack_13fe8;
  undefined8 uStack_13fe0;
  undefined8 uStack_13fd8;
  undefined8 uStack_13fd0;
  undefined8 uStack_13fc8;
  undefined8 uStack_13fc0;
  undefined8 uStack_13fb8;
  undefined8 uStack_13fb0;
  undefined8 uStack_13fa8;
  undefined8 uStack_13fa0;
  undefined8 uStack_13f98;
  undefined8 uStack_13f90;
  undefined8 uStack_13f88;
  undefined8 uStack_13f80;
  undefined8 uStack_13f78;
  undefined8 uStack_13f70;
  undefined8 uStack_13f68;
  undefined8 uStack_13f60;
  undefined8 uStack_13f58;
  undefined8 uStack_13f50;
  undefined8 uStack_13f48;
  undefined8 uStack_13f40;
  undefined8 uStack_13f38;
  undefined8 uStack_13f30;
  undefined8 uStack_13f28;
  undefined8 uStack_13f20;
  undefined8 uStack_13f18;
  undefined8 uStack_13f10;
  undefined8 uStack_13f08;
  undefined8 uStack_13f00;
  undefined8 uStack_13ef8;
  undefined8 uStack_13ef0;
  undefined8 uStack_13ee8;
  undefined8 uStack_13ee0;
  undefined8 uStack_13ed8;
  undefined8 uStack_13ed0;
  undefined8 uStack_13ec8;
  undefined8 uStack_13ec0;
  undefined8 uStack_13eb8;
  undefined8 uStack_13eb0;
  undefined8 uStack_13ea8;
  undefined8 uStack_13ea0;
  undefined8 uStack_13e98;
  undefined8 uStack_13e90;
  undefined8 uStack_13e88;
  undefined8 uStack_13e80;
  undefined8 uStack_13e78;
  undefined8 uStack_13e70;
  undefined8 uStack_13e68;
  undefined8 uStack_13e60;
  undefined8 uStack_13e58;
  undefined8 uStack_13e50;
  undefined8 uStack_13e48;
  undefined8 uStack_13e40;
  undefined8 uStack_13e38;
  undefined8 uStack_13e30;
  undefined8 uStack_13e28;
  undefined8 uStack_13e20;
  undefined8 uStack_13e18;
  undefined8 uStack_13e10;
  undefined8 uStack_13e08;
  undefined8 uStack_13e00;
  undefined8 uStack_13df8;
  undefined8 uStack_13df0;
  undefined8 uStack_13de8;
  undefined8 uStack_13de0;
  undefined8 uStack_13dd8;
  undefined8 uStack_13dd0;
  undefined8 uStack_13dc8;
  undefined8 uStack_13dc0;
  undefined8 uStack_13db8;
  undefined8 uStack_13db0;
  undefined8 uStack_13da8;
  undefined8 uStack_13da0;
  undefined8 uStack_13d98;
  undefined8 uStack_13d90;
  undefined8 uStack_13d88;
  undefined8 uStack_13d80;
  undefined8 uStack_13d78;
  undefined8 uStack_13d70;
  undefined8 uStack_13d68;
  undefined8 uStack_13d60;
  undefined8 uStack_13d58;
  undefined8 uStack_13d50;
  undefined8 uStack_13d48;
  undefined8 uStack_13d40;
  undefined8 uStack_13d38;
  undefined8 uStack_13d30;
  undefined8 uStack_13d28;
  undefined8 uStack_13d20;
  undefined8 uStack_13d18;
  undefined8 uStack_13d10;
  undefined8 uStack_13d08;
  undefined8 uStack_13d00;
  undefined8 uStack_13cf8;
  undefined8 uStack_13cf0;
  undefined8 uStack_13ce8;
  undefined8 uStack_13ce0;
  undefined8 uStack_13cd8;
  undefined8 uStack_13cd0;
  undefined8 uStack_13cc8;
  undefined8 uStack_13cc0;
  undefined8 uStack_13cb8;
  undefined8 uStack_13cb0;
  undefined8 uStack_13ca8;
  undefined8 uStack_13ca0;
  undefined8 uStack_13c98;
  undefined8 uStack_13c90;
  undefined8 uStack_13c88;
  undefined1 auStack_13c50 [16];
  undefined1 auStack_13c40 [16];
  undefined1 auStack_13c30 [16];
  undefined1 auStack_13c20 [24];
  undefined8 uStack_13c08;
  undefined8 uStack_13c00;
  undefined8 uStack_13bf8;
  undefined8 uStack_13bf0;
  undefined8 uStack_13be8;
  undefined8 uStack_13be0;
  undefined8 uStack_13bd8;
  undefined8 uStack_13bd0;
  undefined8 uStack_13bc8;
  undefined1 auStack_13bc0 [32];
  undefined8 uStack_13ba0;
  undefined8 uStack_13b98;
  undefined8 uStack_13b90;
  undefined8 uStack_13b88;
  undefined1 auStack_13b80 [16];
  undefined8 uStack_13b70;
  undefined8 uStack_13b68;
  undefined1 auStack_13b60 [16];
  undefined8 uStack_13b50;
  undefined8 uStack_13b48;
  undefined8 uStack_13b40;
  undefined8 uStack_13b38;
  undefined8 uStack_13b30;
  undefined8 uStack_13b28;
  undefined8 uStack_13b20;
  undefined8 uStack_13b18;
  undefined8 uStack_13b10;
  undefined8 uStack_13b08;
  undefined8 uStack_13ae0;
  undefined8 uStack_13ad8;
  undefined8 uStack_13ad0;
  undefined8 uStack_13ac8;
  undefined1 auStack_13200 [8];
  undefined8 uStack_131f8;
  undefined8 uStack_131f0;
  undefined8 uStack_131e8;
  undefined8 uStack_131e0;
  undefined8 uStack_131d8;
  undefined8 uStack_131d0;
  undefined8 uStack_131c8;
  undefined1 auStack_13100 [16];
  undefined8 uStack_130f0;
  undefined8 uStack_130e8;
  undefined8 uStack_130e0;
  undefined8 uStack_130d8;
  undefined8 uStack_130d0;
  undefined8 uStack_130c8;
  undefined1 auStack_12f80 [8];
  undefined8 uStack_12f78;
  undefined8 uStack_12f70;
  undefined8 uStack_12f68;
  undefined8 uStack_12f60;
  undefined8 uStack_12f58;
  undefined8 uStack_12f50;
  undefined8 uStack_12f48;
  undefined1 auStack_12e80 [16];
  undefined8 uStack_12e70;
  undefined8 uStack_12e68;
  undefined8 uStack_12e60;
  undefined8 uStack_12e58;
  undefined8 uStack_12e50;
  undefined8 uStack_12e48;
  undefined1 auStack_12d00 [8];
  undefined8 uStack_12cf8;
  undefined8 uStack_12cf0;
  undefined8 uStack_12ce8;
  undefined8 uStack_12ce0;
  undefined8 uStack_12cd8;
  undefined8 uStack_12cd0;
  undefined8 uStack_12cc8;
  undefined1 auStack_12c00 [16];
  undefined8 uStack_12bf0;
  undefined8 uStack_12be8;
  undefined8 uStack_12be0;
  undefined8 uStack_12bd8;
  undefined8 uStack_12bd0;
  undefined8 uStack_12bc8;
  undefined1 auStack_12a80 [8];
  undefined8 uStack_12a78;
  undefined8 uStack_12a70;
  undefined8 uStack_12a68;
  undefined8 uStack_12a60;
  undefined8 uStack_12a58;
  undefined8 uStack_12a50;
  undefined8 uStack_12a48;
  undefined1 auStack_12980 [16];
  undefined8 uStack_12970;
  undefined8 uStack_12968;
  undefined8 uStack_12960;
  undefined8 uStack_12958;
  undefined8 uStack_12950;
  undefined8 uStack_12948;
  undefined1 auStack_12800 [8];
  undefined8 uStack_127f8;
  undefined8 uStack_127f0;
  undefined8 uStack_127e8;
  undefined8 uStack_127e0;
  undefined8 uStack_127d8;
  undefined8 uStack_127d0;
  undefined8 uStack_127c8;
  undefined1 auStack_12700 [16];
  undefined8 uStack_126f0;
  undefined8 uStack_126e8;
  undefined8 uStack_126e0;
  undefined8 uStack_126d8;
  undefined8 uStack_126d0;
  undefined8 uStack_126c8;
  undefined1 auStack_12580 [8];
  undefined8 uStack_12578;
  undefined8 uStack_12570;
  undefined8 uStack_12568;
  undefined8 uStack_12560;
  undefined8 uStack_12558;
  undefined8 uStack_12550;
  undefined8 uStack_12548;
  undefined1 auStack_12480 [16];
  undefined8 uStack_12470;
  undefined8 uStack_12468;
  undefined8 uStack_12460;
  undefined8 uStack_12458;
  undefined8 uStack_12450;
  undefined8 uStack_12448;
  undefined1 auStack_12300 [8];
  undefined8 uStack_122f8;
  undefined8 uStack_122f0;
  undefined8 uStack_122e8;
  undefined8 uStack_122e0;
  undefined8 uStack_122d8;
  undefined8 uStack_122d0;
  undefined8 uStack_122c8;
  undefined1 auStack_12200 [16];
  undefined8 uStack_121f0;
  undefined8 uStack_121e8;
  undefined8 uStack_121e0;
  undefined8 uStack_121d8;
  undefined8 uStack_121d0;
  undefined8 uStack_121c8;
  undefined1 auStack_12080 [8];
  undefined8 uStack_12078;
  undefined8 uStack_12070;
  undefined8 uStack_12068;
  undefined8 uStack_12060;
  undefined8 uStack_12058;
  undefined8 uStack_12050;
  undefined8 uStack_12048;
  undefined1 auStack_11f80 [16];
  undefined8 uStack_11f70;
  undefined8 uStack_11f68;
  undefined8 uStack_11f60;
  undefined8 uStack_11f58;
  undefined8 uStack_11f50;
  undefined8 uStack_11f48;
  undefined1 auStack_11e00 [8];
  undefined8 uStack_11df8;
  undefined8 uStack_11df0;
  undefined8 uStack_11de8;
  undefined8 uStack_11de0;
  undefined8 uStack_11dd8;
  undefined8 uStack_11dd0;
  undefined8 uStack_11dc8;
  undefined1 auStack_11d00 [16];
  undefined8 uStack_11cf0;
  undefined8 uStack_11ce8;
  undefined8 uStack_11ce0;
  undefined8 uStack_11cd8;
  undefined8 uStack_11cd0;
  undefined8 uStack_11cc8;
  undefined1 auStack_11b80 [8];
  undefined8 uStack_11b78;
  undefined8 uStack_11b70;
  undefined8 uStack_11b68;
  undefined8 uStack_11b60;
  undefined8 uStack_11b58;
  undefined8 uStack_11b50;
  undefined8 uStack_11b48;
  undefined1 auStack_11a80 [16];
  undefined8 uStack_11a70;
  undefined8 uStack_11a68;
  undefined8 uStack_11a60;
  undefined8 uStack_11a58;
  undefined8 uStack_11a50;
  undefined8 uStack_11a48;
  undefined1 auStack_11900 [8];
  undefined8 uStack_118f8;
  undefined8 uStack_118f0;
  undefined8 uStack_118e8;
  undefined8 uStack_118e0;
  undefined8 uStack_118d8;
  undefined8 uStack_118d0;
  undefined8 uStack_118c8;
  undefined1 auStack_11800 [16];
  undefined8 uStack_117f0;
  undefined8 uStack_117e8;
  undefined8 uStack_117e0;
  undefined8 uStack_117d8;
  undefined8 uStack_117d0;
  undefined8 uStack_117c8;
  undefined1 auStack_11680 [8];
  undefined8 uStack_11678;
  undefined8 uStack_11670;
  undefined8 uStack_11668;
  undefined8 uStack_11660;
  undefined8 uStack_11658;
  undefined8 uStack_11650;
  undefined8 uStack_11648;
  undefined1 auStack_11580 [16];
  undefined8 uStack_11570;
  undefined8 uStack_11568;
  undefined8 uStack_11560;
  undefined8 uStack_11558;
  undefined8 uStack_11550;
  undefined8 uStack_11548;
  undefined1 auStack_11400 [8];
  undefined8 uStack_113f8;
  undefined8 uStack_113f0;
  undefined8 uStack_113e8;
  undefined8 uStack_113e0;
  undefined8 uStack_113d8;
  undefined8 uStack_113d0;
  undefined8 uStack_113c8;
  undefined1 auStack_11300 [16];
  undefined8 uStack_112f0;
  undefined8 uStack_112e8;
  undefined8 uStack_112e0;
  undefined8 uStack_112d8;
  undefined8 uStack_112d0;
  undefined8 uStack_112c8;
  undefined1 auStack_11180 [8];
  undefined8 uStack_11178;
  undefined8 uStack_11170;
  undefined8 uStack_11168;
  undefined8 uStack_11160;
  undefined8 uStack_11158;
  undefined8 uStack_11150;
  undefined8 uStack_11148;
  undefined1 auStack_11080 [16];
  undefined8 uStack_11070;
  undefined8 uStack_11068;
  undefined8 uStack_11060;
  undefined8 uStack_11058;
  undefined8 uStack_11050;
  undefined8 uStack_11048;
  undefined1 auStack_10f00 [8];
  undefined8 uStack_10ef8;
  undefined8 uStack_10ef0;
  undefined8 uStack_10ee8;
  undefined8 uStack_10ee0;
  undefined8 uStack_10ed8;
  undefined8 uStack_10ed0;
  undefined8 uStack_10ec8;
  undefined1 auStack_10e00 [16];
  undefined8 uStack_10df0;
  undefined8 uStack_10de8;
  undefined8 uStack_10de0;
  undefined8 uStack_10dd8;
  undefined8 uStack_10dd0;
  undefined8 uStack_10dc8;
  undefined1 auStack_10c80 [8];
  undefined8 uStack_10c78;
  undefined8 uStack_10c70;
  undefined8 uStack_10c68;
  undefined8 uStack_10c60;
  undefined8 uStack_10c58;
  undefined8 uStack_10c50;
  undefined8 uStack_10c48;
  undefined1 auStack_10b80 [16];
  undefined8 uStack_10b70;
  undefined8 uStack_10b68;
  undefined8 uStack_10b60;
  undefined8 uStack_10b58;
  undefined8 uStack_10b50;
  undefined8 uStack_10b48;
  undefined1 auStack_10a00 [8];
  undefined8 uStack_109f8;
  undefined8 uStack_109f0;
  undefined8 uStack_109e8;
  undefined8 uStack_109e0;
  undefined8 uStack_109d8;
  undefined8 uStack_109d0;
  undefined8 uStack_109c8;
  undefined1 auStack_10900 [16];
  undefined8 uStack_108f0;
  undefined8 uStack_108e8;
  undefined8 uStack_108e0;
  undefined8 uStack_108d8;
  undefined8 uStack_108d0;
  undefined8 uStack_108c8;
  undefined8 local_fbc0;
  undefined8 uStack_fbb8;
  undefined8 uStack_fbb0;
  undefined8 uStack_fba8;
  undefined8 uStack_fba0;
  undefined8 uStack_fb98;
  undefined8 uStack_fb90;
  undefined8 uStack_fb88;
  undefined1 (*local_fb48) [64];
  float fStack_e830;
  float fStack_e82c;
  float fStack_e828;
  float fStack_e824;
  float fStack_e810;
  float fStack_e80c;
  float fStack_e808;
  float fStack_e804;
  float local_e800;
  float fStack_e7fc;
  float local_e7e0;
  float fStack_e7dc;
  float fStack_e7d8;
  float fStack_e7d4;
  undefined8 uStack_d430;
  undefined8 uStack_d428;
  undefined8 local_d3e0;
  undefined8 uStack_d3d8;
  undefined8 local_d3d0;
  undefined8 uStack_d3c8;
  undefined4 local_d3c0;
  undefined4 uStack_d3bc;
  undefined4 uStack_d3b8;
  undefined4 uStack_d3b4;
  undefined8 local_d3b0;
  undefined8 uStack_d3a8;
  undefined8 local_d390;
  undefined8 uStack_d388;
  int local_6cc0;
  int iStack_6cbc;
  int iStack_6cb8;
  int iStack_6cb4;
  int iStack_6cb0;
  int iStack_6cac;
  int iStack_6ca8;
  int iStack_6ca4;
  int iStack_6ca0;
  int iStack_6c9c;
  int iStack_6c98;
  int iStack_6c94;
  int iStack_6c90;
  int iStack_6c8c;
  int iStack_6c88;
  int iStack_6c84;
  int local_6b40;
  int iStack_6b3c;
  int iStack_6b38;
  int iStack_6b34;
  int iStack_6b30;
  int iStack_6b2c;
  int iStack_6b28;
  int iStack_6b24;
  int iStack_6b20;
  int iStack_6b1c;
  int iStack_6b18;
  int iStack_6b14;
  int iStack_6b10;
  int iStack_6b0c;
  int iStack_6b08;
  int iStack_6b04;
  int local_69c0;
  int iStack_69bc;
  int iStack_69b8;
  int iStack_69b4;
  int iStack_69b0;
  int iStack_69ac;
  int iStack_69a8;
  int iStack_69a4;
  int iStack_69a0;
  int iStack_699c;
  int iStack_6998;
  int iStack_6994;
  int iStack_6990;
  int iStack_698c;
  int iStack_6988;
  int iStack_6984;
  int local_6840;
  int iStack_683c;
  int iStack_6838;
  int iStack_6834;
  int iStack_6830;
  int iStack_682c;
  int iStack_6828;
  int iStack_6824;
  int iStack_6820;
  int iStack_681c;
  int iStack_6818;
  int iStack_6814;
  int iStack_6810;
  int iStack_680c;
  int iStack_6808;
  int iStack_6804;
  int local_66c0;
  int iStack_66bc;
  int iStack_66b8;
  int iStack_66b4;
  int iStack_66b0;
  int iStack_66ac;
  int iStack_66a8;
  int iStack_66a4;
  int iStack_66a0;
  int iStack_669c;
  int iStack_6698;
  int iStack_6694;
  int iStack_6690;
  int iStack_668c;
  int iStack_6688;
  int iStack_6684;
  int local_6540;
  int iStack_653c;
  int iStack_6538;
  int iStack_6534;
  int iStack_6530;
  int iStack_652c;
  int iStack_6528;
  int iStack_6524;
  int iStack_6520;
  int iStack_651c;
  int iStack_6518;
  int iStack_6514;
  int iStack_6510;
  int iStack_650c;
  int iStack_6508;
  int iStack_6504;
  int local_63c0;
  int iStack_63bc;
  int iStack_63b8;
  int iStack_63b4;
  int iStack_63b0;
  int iStack_63ac;
  int iStack_63a8;
  int iStack_63a4;
  int iStack_63a0;
  int iStack_639c;
  int iStack_6398;
  int iStack_6394;
  int iStack_6390;
  int iStack_638c;
  int iStack_6388;
  int iStack_6384;
  int local_6240;
  int iStack_623c;
  int iStack_6238;
  int iStack_6234;
  int iStack_6230;
  int iStack_622c;
  int iStack_6228;
  int iStack_6224;
  int iStack_6220;
  int iStack_621c;
  int iStack_6218;
  int iStack_6214;
  int iStack_6210;
  int iStack_620c;
  int iStack_6208;
  int iStack_6204;
  int local_60c0;
  int iStack_60bc;
  int iStack_60b8;
  int iStack_60b4;
  int iStack_60b0;
  int iStack_60ac;
  int iStack_60a8;
  int iStack_60a4;
  int iStack_60a0;
  int iStack_609c;
  int iStack_6098;
  int iStack_6094;
  int iStack_6090;
  int iStack_608c;
  int iStack_6088;
  int iStack_6084;
  int local_5f40;
  int iStack_5f3c;
  int iStack_5f38;
  int iStack_5f34;
  int iStack_5f30;
  int iStack_5f2c;
  int iStack_5f28;
  int iStack_5f24;
  int iStack_5f20;
  int iStack_5f1c;
  int iStack_5f18;
  int iStack_5f14;
  int iStack_5f10;
  int iStack_5f0c;
  int iStack_5f08;
  int iStack_5f04;
  int local_5dc0;
  int iStack_5dbc;
  int iStack_5db8;
  int iStack_5db4;
  int iStack_5db0;
  int iStack_5dac;
  int iStack_5da8;
  int iStack_5da4;
  int iStack_5da0;
  int iStack_5d9c;
  int iStack_5d98;
  int iStack_5d94;
  int iStack_5d90;
  int iStack_5d8c;
  int iStack_5d88;
  int iStack_5d84;
  int local_5c40;
  int iStack_5c3c;
  int iStack_5c38;
  int iStack_5c34;
  int iStack_5c30;
  int iStack_5c2c;
  int iStack_5c28;
  int iStack_5c24;
  int iStack_5c20;
  int iStack_5c1c;
  int iStack_5c18;
  int iStack_5c14;
  int iStack_5c10;
  int iStack_5c0c;
  int iStack_5c08;
  int iStack_5c04;
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  int iStack_5aa0;
  int iStack_5a9c;
  int iStack_5a98;
  int iStack_5a94;
  int iStack_5a90;
  int iStack_5a8c;
  int iStack_5a88;
  int iStack_5a84;
  int local_5940;
  int iStack_593c;
  int iStack_5938;
  int iStack_5934;
  int iStack_5930;
  int iStack_592c;
  int iStack_5928;
  int iStack_5924;
  int iStack_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  int local_57c0;
  int iStack_57bc;
  int iStack_57b8;
  int iStack_57b4;
  int iStack_57b0;
  int iStack_57ac;
  int iStack_57a8;
  int iStack_57a4;
  int iStack_57a0;
  int iStack_579c;
  int iStack_5798;
  int iStack_5794;
  int iStack_5790;
  int iStack_578c;
  int iStack_5788;
  int iStack_5784;
  int local_5640;
  int iStack_563c;
  int iStack_5638;
  int iStack_5634;
  int iStack_5630;
  int iStack_562c;
  int iStack_5628;
  int iStack_5624;
  int iStack_5620;
  int iStack_561c;
  int iStack_5618;
  int iStack_5614;
  int iStack_5610;
  int iStack_560c;
  int iStack_5608;
  int iStack_5604;
  int local_54c0;
  int iStack_54bc;
  int iStack_54b8;
  int iStack_54b4;
  int iStack_54b0;
  int iStack_54ac;
  int iStack_54a8;
  int iStack_54a4;
  int iStack_54a0;
  int iStack_549c;
  int iStack_5498;
  int iStack_5494;
  int iStack_5490;
  int iStack_548c;
  int iStack_5488;
  int iStack_5484;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  
  pauStack_159a8 = in_R9;
  pauStack_159a0 = in_R8;
  iStack_15994 = in_ECX;
  iStack_15990 = in_EDX;
  iStack_1598c = in_ESI;
  lStack_15988 = in_RDI;
  for (iStack_159ac = 0; iStack_159ac < iStack_1598c; iStack_159ac = iStack_159ac + 1) {
    pauStack_159b8 = (undefined1 (*) [64])(lStack_15988 + (long)(iStack_159ac * iStack_15990) * 4);
    pauStack_159c0 = pauStack_159a0;
    for (iStack_159c4 = 0; iStack_159c4 + 0xf < iStack_15994; iStack_159c4 = iStack_159c4 + 0x10) {
      pauStack_14cc8 = pauStack_159b8;
      uStack_15a40 = *(undefined8 *)*pauStack_159b8;
      uStack_15a38 = *(undefined8 *)(*pauStack_159b8 + 8);
      uStack_15a30 = *(undefined8 *)(*pauStack_159b8 + 0x10);
      uStack_15a28 = *(undefined8 *)(*pauStack_159b8 + 0x18);
      uStack_15a20 = *(undefined8 *)(*pauStack_159b8 + 0x20);
      uStack_15a18 = *(undefined8 *)(*pauStack_159b8 + 0x28);
      uStack_15a10 = *(undefined8 *)(*pauStack_159b8 + 0x30);
      uStack_15a08 = *(undefined8 *)(*pauStack_159b8 + 0x38);
      pauStack_14cd0 = pauStack_159b8 + 1;
      uStack_15a80 = *(undefined8 *)*pauStack_14cd0;
      uStack_15a78 = *(undefined8 *)(pauStack_159b8[1] + 8);
      uStack_15a70 = *(undefined8 *)(pauStack_159b8[1] + 0x10);
      uStack_15a68 = *(undefined8 *)(pauStack_159b8[1] + 0x18);
      uStack_15a60 = *(undefined8 *)(pauStack_159b8[1] + 0x20);
      uStack_15a58 = *(undefined8 *)(pauStack_159b8[1] + 0x28);
      uStack_15a50 = *(undefined8 *)(pauStack_159b8[1] + 0x30);
      uStack_15a48 = *(undefined8 *)(pauStack_159b8[1] + 0x38);
      pauStack_14cd8 = pauStack_159b8 + 2;
      uStack_15ac0 = *(undefined8 *)*pauStack_14cd8;
      uStack_15ab8 = *(undefined8 *)(pauStack_159b8[2] + 8);
      uStack_15ab0 = *(undefined8 *)(pauStack_159b8[2] + 0x10);
      uStack_15aa8 = *(undefined8 *)(pauStack_159b8[2] + 0x18);
      uStack_15aa0 = *(undefined8 *)(pauStack_159b8[2] + 0x20);
      uStack_15a98 = *(undefined8 *)(pauStack_159b8[2] + 0x28);
      uStack_15a90 = *(undefined8 *)(pauStack_159b8[2] + 0x30);
      uStack_15a88 = *(undefined8 *)(pauStack_159b8[2] + 0x38);
      pauStack_14ce0 = pauStack_159b8 + 3;
      uStack_15b00 = *(undefined8 *)*pauStack_14ce0;
      uStack_15af8 = *(undefined8 *)(pauStack_159b8[3] + 8);
      uStack_15af0 = *(undefined8 *)(pauStack_159b8[3] + 0x10);
      uStack_15ae8 = *(undefined8 *)(pauStack_159b8[3] + 0x18);
      uStack_15ae0 = *(undefined8 *)(pauStack_159b8[3] + 0x20);
      uStack_15ad8 = *(undefined8 *)(pauStack_159b8[3] + 0x28);
      uStack_15ad0 = *(undefined8 *)(pauStack_159b8[3] + 0x30);
      uStack_15ac8 = *(undefined8 *)(pauStack_159b8[3] + 0x38);
      pauStack_14ce8 = pauStack_159b8 + 4;
      uStack_15b40 = *(undefined8 *)*pauStack_14ce8;
      uStack_15b38 = *(undefined8 *)(pauStack_159b8[4] + 8);
      uStack_15b30 = *(undefined8 *)(pauStack_159b8[4] + 0x10);
      uStack_15b28 = *(undefined8 *)(pauStack_159b8[4] + 0x18);
      uStack_15b20 = *(undefined8 *)(pauStack_159b8[4] + 0x20);
      uStack_15b18 = *(undefined8 *)(pauStack_159b8[4] + 0x28);
      uStack_15b10 = *(undefined8 *)(pauStack_159b8[4] + 0x30);
      uStack_15b08 = *(undefined8 *)(pauStack_159b8[4] + 0x38);
      pauStack_14cf0 = pauStack_159b8 + 5;
      uStack_15b80 = *(undefined8 *)*pauStack_14cf0;
      uStack_15b78 = *(undefined8 *)(pauStack_159b8[5] + 8);
      uStack_15b70 = *(undefined8 *)(pauStack_159b8[5] + 0x10);
      uStack_15b68 = *(undefined8 *)(pauStack_159b8[5] + 0x18);
      uStack_15b60 = *(undefined8 *)(pauStack_159b8[5] + 0x20);
      uStack_15b58 = *(undefined8 *)(pauStack_159b8[5] + 0x28);
      uStack_15b50 = *(undefined8 *)(pauStack_159b8[5] + 0x30);
      uStack_15b48 = *(undefined8 *)(pauStack_159b8[5] + 0x38);
      pauStack_14cf8 = pauStack_159b8 + 6;
      uStack_15bc0 = *(undefined8 *)*pauStack_14cf8;
      uStack_15bb8 = *(undefined8 *)(pauStack_159b8[6] + 8);
      uStack_15bb0 = *(undefined8 *)(pauStack_159b8[6] + 0x10);
      uStack_15ba8 = *(undefined8 *)(pauStack_159b8[6] + 0x18);
      uStack_15ba0 = *(undefined8 *)(pauStack_159b8[6] + 0x20);
      uStack_15b98 = *(undefined8 *)(pauStack_159b8[6] + 0x28);
      uStack_15b90 = *(undefined8 *)(pauStack_159b8[6] + 0x30);
      uStack_15b88 = *(undefined8 *)(pauStack_159b8[6] + 0x38);
      pauStack_14d00 = pauStack_159b8 + 7;
      uStack_15c00 = *(undefined8 *)*pauStack_14d00;
      uStack_15bf8 = *(undefined8 *)(pauStack_159b8[7] + 8);
      uStack_15bf0 = *(undefined8 *)(pauStack_159b8[7] + 0x10);
      uStack_15be8 = *(undefined8 *)(pauStack_159b8[7] + 0x18);
      uStack_15be0 = *(undefined8 *)(pauStack_159b8[7] + 0x20);
      uStack_15bd8 = *(undefined8 *)(pauStack_159b8[7] + 0x28);
      uStack_15bd0 = *(undefined8 *)(pauStack_159b8[7] + 0x30);
      uStack_15bc8 = *(undefined8 *)(pauStack_159b8[7] + 0x38);
      pauStack_14d08 = pauStack_159b8 + 8;
      uStack_15c40 = *(undefined8 *)*pauStack_14d08;
      uStack_15c38 = *(undefined8 *)(pauStack_159b8[8] + 8);
      uStack_15c30 = *(undefined8 *)(pauStack_159b8[8] + 0x10);
      uStack_15c28 = *(undefined8 *)(pauStack_159b8[8] + 0x18);
      uStack_15c20 = *(undefined8 *)(pauStack_159b8[8] + 0x20);
      uStack_15c18 = *(undefined8 *)(pauStack_159b8[8] + 0x28);
      uStack_15c10 = *(undefined8 *)(pauStack_159b8[8] + 0x30);
      uStack_15c08 = *(undefined8 *)(pauStack_159b8[8] + 0x38);
      pauStack_14d10 = pauStack_159b8 + 9;
      uStack_15c80 = *(undefined8 *)*pauStack_14d10;
      uStack_15c78 = *(undefined8 *)(pauStack_159b8[9] + 8);
      uStack_15c70 = *(undefined8 *)(pauStack_159b8[9] + 0x10);
      uStack_15c68 = *(undefined8 *)(pauStack_159b8[9] + 0x18);
      uStack_15c60 = *(undefined8 *)(pauStack_159b8[9] + 0x20);
      uStack_15c58 = *(undefined8 *)(pauStack_159b8[9] + 0x28);
      uStack_15c50 = *(undefined8 *)(pauStack_159b8[9] + 0x30);
      uStack_15c48 = *(undefined8 *)(pauStack_159b8[9] + 0x38);
      pauStack_14d18 = pauStack_159b8 + 10;
      uStack_15cc0 = *(undefined8 *)*pauStack_14d18;
      uStack_15cb8 = *(undefined8 *)(pauStack_159b8[10] + 8);
      uStack_15cb0 = *(undefined8 *)(pauStack_159b8[10] + 0x10);
      uStack_15ca8 = *(undefined8 *)(pauStack_159b8[10] + 0x18);
      uStack_15ca0 = *(undefined8 *)(pauStack_159b8[10] + 0x20);
      uStack_15c98 = *(undefined8 *)(pauStack_159b8[10] + 0x28);
      uStack_15c90 = *(undefined8 *)(pauStack_159b8[10] + 0x30);
      uStack_15c88 = *(undefined8 *)(pauStack_159b8[10] + 0x38);
      pauStack_14d20 = pauStack_159b8 + 0xb;
      uStack_15d00 = *(undefined8 *)*pauStack_14d20;
      uStack_15cf8 = *(undefined8 *)(pauStack_159b8[0xb] + 8);
      uStack_15cf0 = *(undefined8 *)(pauStack_159b8[0xb] + 0x10);
      uStack_15ce8 = *(undefined8 *)(pauStack_159b8[0xb] + 0x18);
      uStack_15ce0 = *(undefined8 *)(pauStack_159b8[0xb] + 0x20);
      uStack_15cd8 = *(undefined8 *)(pauStack_159b8[0xb] + 0x28);
      uStack_15cd0 = *(undefined8 *)(pauStack_159b8[0xb] + 0x30);
      uStack_15cc8 = *(undefined8 *)(pauStack_159b8[0xb] + 0x38);
      pauStack_14d28 = pauStack_159b8 + 0xc;
      uStack_15d40 = *(undefined8 *)*pauStack_14d28;
      uStack_15d38 = *(undefined8 *)(pauStack_159b8[0xc] + 8);
      uStack_15d30 = *(undefined8 *)(pauStack_159b8[0xc] + 0x10);
      uStack_15d28 = *(undefined8 *)(pauStack_159b8[0xc] + 0x18);
      uStack_15d20 = *(undefined8 *)(pauStack_159b8[0xc] + 0x20);
      uStack_15d18 = *(undefined8 *)(pauStack_159b8[0xc] + 0x28);
      uStack_15d10 = *(undefined8 *)(pauStack_159b8[0xc] + 0x30);
      uStack_15d08 = *(undefined8 *)(pauStack_159b8[0xc] + 0x38);
      pauStack_14d30 = pauStack_159b8 + 0xd;
      uStack_15d80 = *(undefined8 *)*pauStack_14d30;
      uStack_15d78 = *(undefined8 *)(pauStack_159b8[0xd] + 8);
      uStack_15d70 = *(undefined8 *)(pauStack_159b8[0xd] + 0x10);
      uStack_15d68 = *(undefined8 *)(pauStack_159b8[0xd] + 0x18);
      uStack_15d60 = *(undefined8 *)(pauStack_159b8[0xd] + 0x20);
      uStack_15d58 = *(undefined8 *)(pauStack_159b8[0xd] + 0x28);
      uStack_15d50 = *(undefined8 *)(pauStack_159b8[0xd] + 0x30);
      uStack_15d48 = *(undefined8 *)(pauStack_159b8[0xd] + 0x38);
      pauStack_14d38 = pauStack_159b8 + 0xe;
      uStack_15dc0 = *(undefined8 *)*pauStack_14d38;
      uStack_15db8 = *(undefined8 *)(pauStack_159b8[0xe] + 8);
      uStack_15db0 = *(undefined8 *)(pauStack_159b8[0xe] + 0x10);
      uStack_15da8 = *(undefined8 *)(pauStack_159b8[0xe] + 0x18);
      uStack_15da0 = *(undefined8 *)(pauStack_159b8[0xe] + 0x20);
      uStack_15d98 = *(undefined8 *)(pauStack_159b8[0xe] + 0x28);
      uStack_15d90 = *(undefined8 *)(pauStack_159b8[0xe] + 0x30);
      uStack_15d88 = *(undefined8 *)(pauStack_159b8[0xe] + 0x38);
      pauStack_14d40 = pauStack_159b8 + 0xf;
      uStack_15e00 = *(undefined8 *)*pauStack_14d40;
      uStack_15df8 = *(undefined8 *)(pauStack_159b8[0xf] + 8);
      uStack_15df0 = *(undefined8 *)(pauStack_159b8[0xf] + 0x10);
      uStack_15de8 = *(undefined8 *)(pauStack_159b8[0xf] + 0x18);
      uStack_15de0 = *(undefined8 *)(pauStack_159b8[0xf] + 0x20);
      uStack_15dd8 = *(undefined8 *)(pauStack_159b8[0xf] + 0x28);
      uStack_15dd0 = *(undefined8 *)(pauStack_159b8[0xf] + 0x30);
      uStack_15dc8 = *(undefined8 *)(pauStack_159b8[0xf] + 0x38);
      auVar298 = vunpcklps_avx512f(*pauStack_159b8,*pauStack_14cd0);
      auVar299 = vunpckhps_avx512f(*pauStack_159b8,*pauStack_14cd0);
      auVar300 = vunpcklps_avx512f(*pauStack_14cd8,*pauStack_14ce0);
      auVar301 = vunpckhps_avx512f(*pauStack_14cd8,*pauStack_14ce0);
      auVar302 = vunpcklps_avx512f(*pauStack_14ce8,*pauStack_14cf0);
      auVar303 = vunpckhps_avx512f(*pauStack_14ce8,*pauStack_14cf0);
      auVar304 = vunpcklps_avx512f(*pauStack_14cf8,*pauStack_14d00);
      auVar305 = vunpckhps_avx512f(*pauStack_14cf8,*pauStack_14d00);
      auStack_16040 = vunpcklps_avx512f(*pauStack_14d08,*pauStack_14d10);
      auStack_16080 = vunpckhps_avx512f(*pauStack_14d08,*pauStack_14d10);
      auStack_160c0 = vunpcklps_avx512f(*pauStack_14d18,*pauStack_14d20);
      auStack_16100 = vunpckhps_avx512f(*pauStack_14d18,*pauStack_14d20);
      auStack_16140 = vunpcklps_avx512f(*pauStack_14d28,*pauStack_14d30);
      auStack_16180 = vunpckhps_avx512f(*pauStack_14d28,*pauStack_14d30);
      auStack_161c0 = vunpcklps_avx512f(*pauStack_14d38,*pauStack_14d40);
      auStack_16200 = vunpckhps_avx512f(*pauStack_14d38,*pauStack_14d40);
      auStack_15e40._0_8_ = auVar298._0_8_;
      uStack_14500 = auStack_15e40._0_8_;
      auStack_15e40._8_8_ = auVar298._8_8_;
      uStack_144f8 = auStack_15e40._8_8_;
      auStack_15e40._16_8_ = auVar298._16_8_;
      uStack_144f0 = auStack_15e40._16_8_;
      auStack_15e40._24_8_ = auVar298._24_8_;
      uStack_144e8 = auStack_15e40._24_8_;
      auStack_15e40._32_8_ = auVar298._32_8_;
      uStack_144e0 = auStack_15e40._32_8_;
      auStack_15e40._40_8_ = auVar298._40_8_;
      uStack_144d8 = auStack_15e40._40_8_;
      auStack_15e40._48_8_ = auVar298._48_8_;
      uStack_144d0 = auStack_15e40._48_8_;
      auStack_15e40._56_8_ = auVar298._56_8_;
      uStack_144c8 = auStack_15e40._56_8_;
      auStack_15e80._0_8_ = auVar299._0_8_;
      uStack_14540 = auStack_15e80._0_8_;
      auStack_15e80._8_8_ = auVar299._8_8_;
      uStack_14538 = auStack_15e80._8_8_;
      auStack_15e80._16_8_ = auVar299._16_8_;
      uStack_14530 = auStack_15e80._16_8_;
      auStack_15e80._24_8_ = auVar299._24_8_;
      uStack_14528 = auStack_15e80._24_8_;
      auStack_15e80._32_8_ = auVar299._32_8_;
      uStack_14520 = auStack_15e80._32_8_;
      auStack_15e80._40_8_ = auVar299._40_8_;
      uStack_14518 = auStack_15e80._40_8_;
      auStack_15e80._48_8_ = auVar299._48_8_;
      uStack_14510 = auStack_15e80._48_8_;
      auStack_15e80._56_8_ = auVar299._56_8_;
      uStack_14508 = auStack_15e80._56_8_;
      auStack_16240 = vmaxps_avx512f(auVar298,auVar299);
      auStack_15ec0._0_8_ = auVar300._0_8_;
      uStack_14580 = auStack_15ec0._0_8_;
      auStack_15ec0._8_8_ = auVar300._8_8_;
      uStack_14578 = auStack_15ec0._8_8_;
      auStack_15ec0._16_8_ = auVar300._16_8_;
      uStack_14570 = auStack_15ec0._16_8_;
      auStack_15ec0._24_8_ = auVar300._24_8_;
      uStack_14568 = auStack_15ec0._24_8_;
      auStack_15ec0._32_8_ = auVar300._32_8_;
      uStack_14560 = auStack_15ec0._32_8_;
      auStack_15ec0._40_8_ = auVar300._40_8_;
      uStack_14558 = auStack_15ec0._40_8_;
      auStack_15ec0._48_8_ = auVar300._48_8_;
      uStack_14550 = auStack_15ec0._48_8_;
      auStack_15ec0._56_8_ = auVar300._56_8_;
      uStack_14548 = auStack_15ec0._56_8_;
      auStack_15f00._0_8_ = auVar301._0_8_;
      uStack_145c0 = auStack_15f00._0_8_;
      auStack_15f00._8_8_ = auVar301._8_8_;
      uStack_145b8 = auStack_15f00._8_8_;
      auStack_15f00._16_8_ = auVar301._16_8_;
      uStack_145b0 = auStack_15f00._16_8_;
      auStack_15f00._24_8_ = auVar301._24_8_;
      uStack_145a8 = auStack_15f00._24_8_;
      auStack_15f00._32_8_ = auVar301._32_8_;
      uStack_145a0 = auStack_15f00._32_8_;
      auStack_15f00._40_8_ = auVar301._40_8_;
      uStack_14598 = auStack_15f00._40_8_;
      auStack_15f00._48_8_ = auVar301._48_8_;
      uStack_14590 = auStack_15f00._48_8_;
      auStack_15f00._56_8_ = auVar301._56_8_;
      uStack_14588 = auStack_15f00._56_8_;
      auStack_16280 = vmaxps_avx512f(auVar300,auVar301);
      auStack_15f40._0_8_ = auVar302._0_8_;
      uStack_14600 = auStack_15f40._0_8_;
      auStack_15f40._8_8_ = auVar302._8_8_;
      uStack_145f8 = auStack_15f40._8_8_;
      auStack_15f40._16_8_ = auVar302._16_8_;
      uStack_145f0 = auStack_15f40._16_8_;
      auStack_15f40._24_8_ = auVar302._24_8_;
      uStack_145e8 = auStack_15f40._24_8_;
      auStack_15f40._32_8_ = auVar302._32_8_;
      uStack_145e0 = auStack_15f40._32_8_;
      auStack_15f40._40_8_ = auVar302._40_8_;
      uStack_145d8 = auStack_15f40._40_8_;
      auStack_15f40._48_8_ = auVar302._48_8_;
      uStack_145d0 = auStack_15f40._48_8_;
      auStack_15f40._56_8_ = auVar302._56_8_;
      uStack_145c8 = auStack_15f40._56_8_;
      auStack_15f80._0_8_ = auVar303._0_8_;
      uStack_14640 = auStack_15f80._0_8_;
      auStack_15f80._8_8_ = auVar303._8_8_;
      uStack_14638 = auStack_15f80._8_8_;
      auStack_15f80._16_8_ = auVar303._16_8_;
      uStack_14630 = auStack_15f80._16_8_;
      auStack_15f80._24_8_ = auVar303._24_8_;
      uStack_14628 = auStack_15f80._24_8_;
      auStack_15f80._32_8_ = auVar303._32_8_;
      uStack_14620 = auStack_15f80._32_8_;
      auStack_15f80._40_8_ = auVar303._40_8_;
      uStack_14618 = auStack_15f80._40_8_;
      auStack_15f80._48_8_ = auVar303._48_8_;
      uStack_14610 = auStack_15f80._48_8_;
      auStack_15f80._56_8_ = auVar303._56_8_;
      uStack_14608 = auStack_15f80._56_8_;
      auStack_162c0 = vmaxps_avx512f(auVar302,auVar303);
      auStack_15fc0._0_8_ = auVar304._0_8_;
      uStack_14680 = auStack_15fc0._0_8_;
      auStack_15fc0._8_8_ = auVar304._8_8_;
      uStack_14678 = auStack_15fc0._8_8_;
      auStack_15fc0._16_8_ = auVar304._16_8_;
      uStack_14670 = auStack_15fc0._16_8_;
      auStack_15fc0._24_8_ = auVar304._24_8_;
      uStack_14668 = auStack_15fc0._24_8_;
      auStack_15fc0._32_8_ = auVar304._32_8_;
      uStack_14660 = auStack_15fc0._32_8_;
      auStack_15fc0._40_8_ = auVar304._40_8_;
      uStack_14658 = auStack_15fc0._40_8_;
      auStack_15fc0._48_8_ = auVar304._48_8_;
      uStack_14650 = auStack_15fc0._48_8_;
      auStack_15fc0._56_8_ = auVar304._56_8_;
      uStack_14648 = auStack_15fc0._56_8_;
      auStack_16000._0_8_ = auVar305._0_8_;
      uStack_146c0 = auStack_16000._0_8_;
      auStack_16000._8_8_ = auVar305._8_8_;
      uStack_146b8 = auStack_16000._8_8_;
      auStack_16000._16_8_ = auVar305._16_8_;
      uStack_146b0 = auStack_16000._16_8_;
      auStack_16000._24_8_ = auVar305._24_8_;
      uStack_146a8 = auStack_16000._24_8_;
      auStack_16000._32_8_ = auVar305._32_8_;
      uStack_146a0 = auStack_16000._32_8_;
      auStack_16000._40_8_ = auVar305._40_8_;
      uStack_14698 = auStack_16000._40_8_;
      auStack_16000._48_8_ = auVar305._48_8_;
      uStack_14690 = auStack_16000._48_8_;
      auStack_16000._56_8_ = auVar305._56_8_;
      uStack_14688 = auStack_16000._56_8_;
      auStack_16300 = vmaxps_avx512f(auVar304,auVar305);
      uStack_14700 = auStack_16040._0_8_;
      uStack_146f8 = auStack_16040._8_8_;
      uStack_146f0 = auStack_16040._16_8_;
      uStack_146e8 = auStack_16040._24_8_;
      uStack_146e0 = auStack_16040._32_8_;
      uStack_146d8 = auStack_16040._40_8_;
      uStack_146d0 = auStack_16040._48_8_;
      uStack_146c8 = auStack_16040._56_8_;
      uStack_14740 = auStack_16080._0_8_;
      uStack_14738 = auStack_16080._8_8_;
      uStack_14730 = auStack_16080._16_8_;
      uStack_14728 = auStack_16080._24_8_;
      uStack_14720 = auStack_16080._32_8_;
      uStack_14718 = auStack_16080._40_8_;
      uStack_14710 = auStack_16080._48_8_;
      uStack_14708 = auStack_16080._56_8_;
      auStack_16340 = vmaxps_avx512f(auStack_16040,auStack_16080);
      uStack_14780 = auStack_160c0._0_8_;
      uStack_14778 = auStack_160c0._8_8_;
      uStack_14770 = auStack_160c0._16_8_;
      uStack_14768 = auStack_160c0._24_8_;
      uStack_14760 = auStack_160c0._32_8_;
      uStack_14758 = auStack_160c0._40_8_;
      uStack_14750 = auStack_160c0._48_8_;
      uStack_14748 = auStack_160c0._56_8_;
      uStack_147c0 = auStack_16100._0_8_;
      uStack_147b8 = auStack_16100._8_8_;
      uStack_147b0 = auStack_16100._16_8_;
      uStack_147a8 = auStack_16100._24_8_;
      uStack_147a0 = auStack_16100._32_8_;
      uStack_14798 = auStack_16100._40_8_;
      uStack_14790 = auStack_16100._48_8_;
      uStack_14788 = auStack_16100._56_8_;
      auStack_16380 = vmaxps_avx512f(auStack_160c0,auStack_16100);
      uStack_14800 = auStack_16140._0_8_;
      uStack_147f8 = auStack_16140._8_8_;
      uStack_147f0 = auStack_16140._16_8_;
      uStack_147e8 = auStack_16140._24_8_;
      uStack_147e0 = auStack_16140._32_8_;
      uStack_147d8 = auStack_16140._40_8_;
      uStack_147d0 = auStack_16140._48_8_;
      uStack_147c8 = auStack_16140._56_8_;
      uStack_14840 = auStack_16180._0_8_;
      uStack_14838 = auStack_16180._8_8_;
      uStack_14830 = auStack_16180._16_8_;
      uStack_14828 = auStack_16180._24_8_;
      uStack_14820 = auStack_16180._32_8_;
      uStack_14818 = auStack_16180._40_8_;
      uStack_14810 = auStack_16180._48_8_;
      uStack_14808 = auStack_16180._56_8_;
      auStack_163c0 = vmaxps_avx512f(auStack_16140,auStack_16180);
      uStack_14880 = auStack_161c0._0_8_;
      uStack_14878 = auStack_161c0._8_8_;
      uStack_14870 = auStack_161c0._16_8_;
      uStack_14868 = auStack_161c0._24_8_;
      uStack_14860 = auStack_161c0._32_8_;
      uStack_14858 = auStack_161c0._40_8_;
      uStack_14850 = auStack_161c0._48_8_;
      uStack_14848 = auStack_161c0._56_8_;
      uStack_148c0 = auStack_16200._0_8_;
      uStack_148b8 = auStack_16200._8_8_;
      uStack_148b0 = auStack_16200._16_8_;
      uStack_148a8 = auStack_16200._24_8_;
      uStack_148a0 = auStack_16200._32_8_;
      uStack_14898 = auStack_16200._40_8_;
      uStack_14890 = auStack_16200._48_8_;
      uStack_14888 = auStack_16200._56_8_;
      auStack_16400 = vmaxps_avx512f(auStack_161c0,auStack_16200);
      uStack_13cc0 = auStack_16240._0_8_;
      uStack_13cb8 = auStack_16240._8_8_;
      uStack_13cb0 = auStack_16240._16_8_;
      uStack_13ca8 = auStack_16240._24_8_;
      uStack_13ca0 = auStack_16240._32_8_;
      uStack_13c98 = auStack_16240._40_8_;
      uStack_13c90 = auStack_16240._48_8_;
      uStack_13c88 = auStack_16240._56_8_;
      uStack_13d00 = auStack_16280._0_8_;
      uStack_13cf8 = auStack_16280._8_8_;
      uStack_13cf0 = auStack_16280._16_8_;
      uStack_13ce8 = auStack_16280._24_8_;
      uStack_13ce0 = auStack_16280._32_8_;
      uStack_13cd8 = auStack_16280._40_8_;
      uStack_13cd0 = auStack_16280._48_8_;
      uStack_13cc8 = auStack_16280._56_8_;
      auVar298 = vunpcklpd_avx512f(auStack_16240,auStack_16280);
      local_8c0 = auVar298._0_8_;
      uStack_8b8 = auVar298._8_8_;
      uStack_8b0 = auVar298._16_8_;
      uStack_8a8 = auVar298._24_8_;
      uStack_8a0 = auVar298._32_8_;
      uStack_898 = auVar298._40_8_;
      uStack_890 = auVar298._48_8_;
      uStack_888 = auVar298._56_8_;
      uStack_13d40 = auStack_16240._0_8_;
      uStack_13d38 = auStack_16240._8_8_;
      uStack_13d30 = auStack_16240._16_8_;
      uStack_13d28 = auStack_16240._24_8_;
      uStack_13d20 = auStack_16240._32_8_;
      uStack_13d18 = auStack_16240._40_8_;
      uStack_13d10 = auStack_16240._48_8_;
      uStack_13d08 = auStack_16240._56_8_;
      uStack_13d80 = auStack_16280._0_8_;
      uStack_13d78 = auStack_16280._8_8_;
      uStack_13d70 = auStack_16280._16_8_;
      uStack_13d68 = auStack_16280._24_8_;
      uStack_13d60 = auStack_16280._32_8_;
      uStack_13d58 = auStack_16280._40_8_;
      uStack_13d50 = auStack_16280._48_8_;
      uStack_13d48 = auStack_16280._56_8_;
      auVar299 = vunpckhpd_avx512f(auStack_16240,auStack_16280);
      local_900 = auVar299._0_8_;
      uStack_8f8 = auVar299._8_8_;
      uStack_8f0 = auVar299._16_8_;
      uStack_8e8 = auVar299._24_8_;
      uStack_8e0 = auVar299._32_8_;
      uStack_8d8 = auVar299._40_8_;
      uStack_8d0 = auVar299._48_8_;
      uStack_8c8 = auVar299._56_8_;
      uStack_13dc0 = auStack_162c0._0_8_;
      uStack_13db8 = auStack_162c0._8_8_;
      uStack_13db0 = auStack_162c0._16_8_;
      uStack_13da8 = auStack_162c0._24_8_;
      uStack_13da0 = auStack_162c0._32_8_;
      uStack_13d98 = auStack_162c0._40_8_;
      uStack_13d90 = auStack_162c0._48_8_;
      uStack_13d88 = auStack_162c0._56_8_;
      uStack_13e00 = auStack_16300._0_8_;
      uStack_13df8 = auStack_16300._8_8_;
      uStack_13df0 = auStack_16300._16_8_;
      uStack_13de8 = auStack_16300._24_8_;
      uStack_13de0 = auStack_16300._32_8_;
      uStack_13dd8 = auStack_16300._40_8_;
      uStack_13dd0 = auStack_16300._48_8_;
      uStack_13dc8 = auStack_16300._56_8_;
      auVar300 = vunpcklpd_avx512f(auStack_162c0,auStack_16300);
      local_940 = auVar300._0_8_;
      uStack_938 = auVar300._8_8_;
      uStack_930 = auVar300._16_8_;
      uStack_928 = auVar300._24_8_;
      uStack_920 = auVar300._32_8_;
      uStack_918 = auVar300._40_8_;
      uStack_910 = auVar300._48_8_;
      uStack_908 = auVar300._56_8_;
      uStack_13e40 = auStack_162c0._0_8_;
      uStack_13e38 = auStack_162c0._8_8_;
      uStack_13e30 = auStack_162c0._16_8_;
      uStack_13e28 = auStack_162c0._24_8_;
      uStack_13e20 = auStack_162c0._32_8_;
      uStack_13e18 = auStack_162c0._40_8_;
      uStack_13e10 = auStack_162c0._48_8_;
      uStack_13e08 = auStack_162c0._56_8_;
      uStack_13e80 = auStack_16300._0_8_;
      uStack_13e78 = auStack_16300._8_8_;
      uStack_13e70 = auStack_16300._16_8_;
      uStack_13e68 = auStack_16300._24_8_;
      uStack_13e60 = auStack_16300._32_8_;
      uStack_13e58 = auStack_16300._40_8_;
      uStack_13e50 = auStack_16300._48_8_;
      uStack_13e48 = auStack_16300._56_8_;
      auVar301 = vunpckhpd_avx512f(auStack_162c0,auStack_16300);
      local_980 = auVar301._0_8_;
      uStack_978 = auVar301._8_8_;
      uStack_970 = auVar301._16_8_;
      uStack_968 = auVar301._24_8_;
      uStack_960 = auVar301._32_8_;
      uStack_958 = auVar301._40_8_;
      uStack_950 = auVar301._48_8_;
      uStack_948 = auVar301._56_8_;
      uStack_13ec0 = auStack_16340._0_8_;
      uStack_13eb8 = auStack_16340._8_8_;
      uStack_13eb0 = auStack_16340._16_8_;
      uStack_13ea8 = auStack_16340._24_8_;
      uStack_13ea0 = auStack_16340._32_8_;
      uStack_13e98 = auStack_16340._40_8_;
      uStack_13e90 = auStack_16340._48_8_;
      uStack_13e88 = auStack_16340._56_8_;
      uStack_13f00 = auStack_16380._0_8_;
      uStack_13ef8 = auStack_16380._8_8_;
      uStack_13ef0 = auStack_16380._16_8_;
      uStack_13ee8 = auStack_16380._24_8_;
      uStack_13ee0 = auStack_16380._32_8_;
      uStack_13ed8 = auStack_16380._40_8_;
      uStack_13ed0 = auStack_16380._48_8_;
      uStack_13ec8 = auStack_16380._56_8_;
      auStack_15f40 = vunpcklpd_avx512f(auStack_16340,auStack_16380);
      local_9c0 = auStack_15f40._0_8_;
      uStack_9b8 = auStack_15f40._8_8_;
      uStack_9b0 = auStack_15f40._16_8_;
      uStack_9a8 = auStack_15f40._24_8_;
      uStack_9a0 = auStack_15f40._32_8_;
      uStack_998 = auStack_15f40._40_8_;
      uStack_990 = auStack_15f40._48_8_;
      uStack_988 = auStack_15f40._56_8_;
      uStack_13f40 = auStack_16340._0_8_;
      uStack_13f38 = auStack_16340._8_8_;
      uStack_13f30 = auStack_16340._16_8_;
      uStack_13f28 = auStack_16340._24_8_;
      uStack_13f20 = auStack_16340._32_8_;
      uStack_13f18 = auStack_16340._40_8_;
      uStack_13f10 = auStack_16340._48_8_;
      uStack_13f08 = auStack_16340._56_8_;
      uStack_13f80 = auStack_16380._0_8_;
      uStack_13f78 = auStack_16380._8_8_;
      uStack_13f70 = auStack_16380._16_8_;
      uStack_13f68 = auStack_16380._24_8_;
      uStack_13f60 = auStack_16380._32_8_;
      uStack_13f58 = auStack_16380._40_8_;
      uStack_13f50 = auStack_16380._48_8_;
      uStack_13f48 = auStack_16380._56_8_;
      auStack_15f80 = vunpckhpd_avx512f(auStack_16340,auStack_16380);
      local_a00 = auStack_15f80._0_8_;
      uStack_9f8 = auStack_15f80._8_8_;
      uStack_9f0 = auStack_15f80._16_8_;
      uStack_9e8 = auStack_15f80._24_8_;
      uStack_9e0 = auStack_15f80._32_8_;
      uStack_9d8 = auStack_15f80._40_8_;
      uStack_9d0 = auStack_15f80._48_8_;
      uStack_9c8 = auStack_15f80._56_8_;
      uStack_13fc0 = auStack_163c0._0_8_;
      uStack_13fb8 = auStack_163c0._8_8_;
      uStack_13fb0 = auStack_163c0._16_8_;
      uStack_13fa8 = auStack_163c0._24_8_;
      uStack_13fa0 = auStack_163c0._32_8_;
      uStack_13f98 = auStack_163c0._40_8_;
      uStack_13f90 = auStack_163c0._48_8_;
      uStack_13f88 = auStack_163c0._56_8_;
      uStack_14000 = auStack_16400._0_8_;
      uStack_13ff8 = auStack_16400._8_8_;
      uStack_13ff0 = auStack_16400._16_8_;
      uStack_13fe8 = auStack_16400._24_8_;
      uStack_13fe0 = auStack_16400._32_8_;
      uStack_13fd8 = auStack_16400._40_8_;
      uStack_13fd0 = auStack_16400._48_8_;
      uStack_13fc8 = auStack_16400._56_8_;
      auStack_15fc0 = vunpcklpd_avx512f(auStack_163c0,auStack_16400);
      local_a40 = auStack_15fc0._0_8_;
      uStack_a38 = auStack_15fc0._8_8_;
      uStack_a30 = auStack_15fc0._16_8_;
      uStack_a28 = auStack_15fc0._24_8_;
      uStack_a20 = auStack_15fc0._32_8_;
      uStack_a18 = auStack_15fc0._40_8_;
      uStack_a10 = auStack_15fc0._48_8_;
      uStack_a08 = auStack_15fc0._56_8_;
      uStack_14040 = auStack_163c0._0_8_;
      uStack_14038 = auStack_163c0._8_8_;
      uStack_14030 = auStack_163c0._16_8_;
      uStack_14028 = auStack_163c0._24_8_;
      uStack_14020 = auStack_163c0._32_8_;
      uStack_14018 = auStack_163c0._40_8_;
      uStack_14010 = auStack_163c0._48_8_;
      uStack_14008 = auStack_163c0._56_8_;
      uStack_14080 = auStack_16400._0_8_;
      uStack_14078 = auStack_16400._8_8_;
      uStack_14070 = auStack_16400._16_8_;
      uStack_14068 = auStack_16400._24_8_;
      uStack_14060 = auStack_16400._32_8_;
      uStack_14058 = auStack_16400._40_8_;
      uStack_14050 = auStack_16400._48_8_;
      uStack_14048 = auStack_16400._56_8_;
      auStack_16000 = vunpckhpd_avx512f(auStack_163c0,auStack_16400);
      local_a80 = auStack_16000._0_8_;
      uStack_a78 = auStack_16000._8_8_;
      uStack_a70 = auStack_16000._16_8_;
      uStack_a68 = auStack_16000._24_8_;
      uStack_a60 = auStack_16000._32_8_;
      uStack_a58 = auStack_16000._40_8_;
      uStack_a50 = auStack_16000._48_8_;
      uStack_a48 = auStack_16000._56_8_;
      uStack_14900 = local_8c0;
      uStack_148f8 = uStack_8b8;
      uStack_148f0 = uStack_8b0;
      uStack_148e8 = uStack_8a8;
      uStack_148e0 = uStack_8a0;
      uStack_148d8 = uStack_898;
      uStack_148d0 = uStack_890;
      uStack_148c8 = uStack_888;
      uStack_14940 = local_900;
      uStack_14938 = uStack_8f8;
      uStack_14930 = uStack_8f0;
      uStack_14928 = uStack_8e8;
      uStack_14920 = uStack_8e0;
      uStack_14918 = uStack_8d8;
      uStack_14910 = uStack_8d0;
      uStack_14908 = uStack_8c8;
      auStack_16440 = vmaxps_avx512f(auVar298,auVar299);
      uStack_14980 = local_940;
      uStack_14978 = uStack_938;
      uStack_14970 = uStack_930;
      uStack_14968 = uStack_928;
      uStack_14960 = uStack_920;
      uStack_14958 = uStack_918;
      uStack_14950 = uStack_910;
      uStack_14948 = uStack_908;
      uStack_149c0 = local_980;
      uStack_149b8 = uStack_978;
      uStack_149b0 = uStack_970;
      uStack_149a8 = uStack_968;
      uStack_149a0 = uStack_960;
      uStack_14998 = uStack_958;
      uStack_14990 = uStack_950;
      uStack_14988 = uStack_948;
      auStack_16480 = vmaxps_avx512f(auVar300,auVar301);
      uStack_14a00 = local_9c0;
      uStack_149f8 = uStack_9b8;
      uStack_149f0 = uStack_9b0;
      uStack_149e8 = uStack_9a8;
      uStack_149e0 = uStack_9a0;
      uStack_149d8 = uStack_998;
      uStack_149d0 = uStack_990;
      uStack_149c8 = uStack_988;
      uStack_14a40 = local_a00;
      uStack_14a38 = uStack_9f8;
      uStack_14a30 = uStack_9f0;
      uStack_14a28 = uStack_9e8;
      uStack_14a20 = uStack_9e0;
      uStack_14a18 = uStack_9d8;
      uStack_14a10 = uStack_9d0;
      uStack_14a08 = uStack_9c8;
      auStack_164c0 = vmaxps_avx512f(auStack_15f40,auStack_15f80);
      uStack_14a80 = local_a40;
      uStack_14a78 = uStack_a38;
      uStack_14a70 = uStack_a30;
      uStack_14a68 = uStack_a28;
      uStack_14a60 = uStack_a20;
      uStack_14a58 = uStack_a18;
      uStack_14a50 = uStack_a10;
      uStack_14a48 = uStack_a08;
      uStack_14ac0 = local_a80;
      uStack_14ab8 = uStack_a78;
      uStack_14ab0 = uStack_a70;
      uStack_14aa8 = uStack_a68;
      uStack_14aa0 = uStack_a60;
      uStack_14a98 = uStack_a58;
      uStack_14a90 = uStack_a50;
      uStack_14a88 = uStack_a48;
      auStack_16500 = vmaxps_avx512f(auStack_15fc0,auStack_16000);
      auVar298 = vinsertf64x4_avx512f(auStack_16440,auStack_16480._0_32_,1);
      auVar299 = vshuff64x2_avx512f(auStack_16440,auStack_16480,0xee);
      auStack_15ec0 = vinsertf64x4_avx512f(auStack_164c0,auStack_16500._0_32_,1);
      auStack_15f00 = vshuff64x2_avx512f(auStack_164c0,auStack_16500,0xee);
      auStack_15e40._0_8_ = auVar298._0_8_;
      uStack_14b00 = auStack_15e40._0_8_;
      auStack_15e40._8_8_ = auVar298._8_8_;
      uStack_14af8 = auStack_15e40._8_8_;
      auStack_15e40._16_8_ = auVar298._16_8_;
      uStack_14af0 = auStack_15e40._16_8_;
      auStack_15e40._24_8_ = auVar298._24_8_;
      uStack_14ae8 = auStack_15e40._24_8_;
      auStack_15e40._32_8_ = auVar298._32_8_;
      uStack_14ae0 = auStack_15e40._32_8_;
      auStack_15e40._40_8_ = auVar298._40_8_;
      uStack_14ad8 = auStack_15e40._40_8_;
      auStack_15e40._48_8_ = auVar298._48_8_;
      uStack_14ad0 = auStack_15e40._48_8_;
      auStack_15e40._56_8_ = auVar298._56_8_;
      uStack_14ac8 = auStack_15e40._56_8_;
      auStack_15e80._0_8_ = auVar299._0_8_;
      uStack_14b40 = auStack_15e80._0_8_;
      auStack_15e80._8_8_ = auVar299._8_8_;
      uStack_14b38 = auStack_15e80._8_8_;
      auStack_15e80._16_8_ = auVar299._16_8_;
      uStack_14b30 = auStack_15e80._16_8_;
      auStack_15e80._24_8_ = auVar299._24_8_;
      uStack_14b28 = auStack_15e80._24_8_;
      auStack_15e80._32_8_ = auVar299._32_8_;
      uStack_14b20 = auStack_15e80._32_8_;
      auStack_15e80._40_8_ = auVar299._40_8_;
      uStack_14b18 = auStack_15e80._40_8_;
      auStack_15e80._48_8_ = auVar299._48_8_;
      uStack_14b10 = auStack_15e80._48_8_;
      auStack_15e80._56_8_ = auVar299._56_8_;
      uStack_14b08 = auStack_15e80._56_8_;
      auStack_16540 = vmaxps_avx512f(auVar298,auVar299);
      uStack_14b80 = auStack_15ec0._0_8_;
      uStack_14b78 = auStack_15ec0._8_8_;
      uStack_14b70 = auStack_15ec0._16_8_;
      uStack_14b68 = auStack_15ec0._24_8_;
      uStack_14b60 = auStack_15ec0._32_8_;
      uStack_14b58 = auStack_15ec0._40_8_;
      uStack_14b50 = auStack_15ec0._48_8_;
      uStack_14b48 = auStack_15ec0._56_8_;
      uStack_14bc0 = auStack_15f00._0_8_;
      uStack_14bb8 = auStack_15f00._8_8_;
      uStack_14bb0 = auStack_15f00._16_8_;
      uStack_14ba8 = auStack_15f00._24_8_;
      uStack_14ba0 = auStack_15f00._32_8_;
      uStack_14b98 = auStack_15f00._40_8_;
      uStack_14b90 = auStack_15f00._48_8_;
      uStack_14b88 = auStack_15f00._56_8_;
      auStack_16580 = vmaxps_avx512f(auStack_15ec0,auStack_15f00);
      auStack_15e40 = vshuff64x2_avx512f(auStack_16540,auStack_16580,0x88);
      auStack_15e80 = vshuff64x2_avx512f(auStack_16540,auStack_16580,0xdd);
      uStack_14c00 = auStack_15e40._0_8_;
      uStack_14bf8 = auStack_15e40._8_8_;
      uStack_14bf0 = auStack_15e40._16_8_;
      uStack_14be8 = auStack_15e40._24_8_;
      uStack_14be0 = auStack_15e40._32_8_;
      uStack_14bd8 = auStack_15e40._40_8_;
      uStack_14bd0 = auStack_15e40._48_8_;
      uStack_14bc8 = auStack_15e40._56_8_;
      uStack_14c40 = auStack_15e80._0_8_;
      uStack_14c38 = auStack_15e80._8_8_;
      uStack_14c30 = auStack_15e80._16_8_;
      uStack_14c28 = auStack_15e80._24_8_;
      uStack_14c20 = auStack_15e80._32_8_;
      uStack_14c18 = auStack_15e80._40_8_;
      uStack_14c10 = auStack_15e80._48_8_;
      uStack_14c08 = auStack_15e80._56_8_;
      auStack_165c0 = vmaxps_avx512f(auStack_15e40,auStack_15e80);
      pauStack_14d48 = pauStack_159c0;
      auVar293 = *(undefined1 (*) [56])*pauStack_159c0;
      uStack_14c48 = *(undefined8 *)(*pauStack_159c0 + 0x38);
      auStack_16600._0_8_ = auVar293._0_8_;
      uStack_14c80 = auStack_16600._0_8_;
      auStack_16600._8_8_ = auVar293._8_8_;
      uStack_14c78 = auStack_16600._8_8_;
      auStack_16600._16_8_ = auVar293._16_8_;
      uStack_14c70 = auStack_16600._16_8_;
      auStack_16600._24_8_ = auVar293._24_8_;
      uStack_14c68 = auStack_16600._24_8_;
      auStack_16600._32_8_ = auVar293._32_8_;
      uStack_14c60 = auStack_16600._32_8_;
      auStack_16600._40_8_ = auVar293._40_8_;
      uStack_14c58 = auStack_16600._40_8_;
      auStack_16600._48_8_ = auVar293._48_8_;
      uStack_14c50 = auStack_16600._48_8_;
      uStack_14cc0 = auStack_165c0._0_8_;
      uStack_14cb8 = auStack_165c0._8_8_;
      uStack_14cb0 = auStack_165c0._16_8_;
      uStack_14ca8 = auStack_165c0._24_8_;
      uStack_14ca0 = auStack_165c0._32_8_;
      uStack_14c98 = auStack_165c0._40_8_;
      uStack_14c90 = auStack_165c0._48_8_;
      uStack_14c88 = auStack_165c0._56_8_;
      auStack_16600 = vmaxps_avx512f(*pauStack_159c0,auStack_165c0);
      local_fb48 = pauStack_159c0;
      local_fbc0 = auStack_16600._0_8_;
      uStack_fbb8 = auStack_16600._8_8_;
      uStack_fbb0 = auStack_16600._16_8_;
      uStack_fba8 = auStack_16600._24_8_;
      uStack_fba0 = auStack_16600._32_8_;
      uStack_fb98 = auStack_16600._40_8_;
      uStack_fb90 = auStack_16600._48_8_;
      uStack_fb88 = auStack_16600._56_8_;
      *(undefined8 *)*pauStack_159c0 = auStack_16600._0_8_;
      *(undefined8 *)(*pauStack_159c0 + 8) = auStack_16600._8_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x10) = auStack_16600._16_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x18) = auStack_16600._24_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x20) = auStack_16600._32_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x28) = auStack_16600._40_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x30) = auStack_16600._48_8_;
      *(undefined8 *)(*pauStack_159c0 + 0x38) = auStack_16600._56_8_;
      pauStack_159b8 = pauStack_159b8 + 0x10;
      pauStack_159c0 = pauStack_159c0 + 1;
    }
    for (; iStack_159c4 < iStack_15994; iStack_159c4 = iStack_159c4 + 1) {
      pauStack_14d50 = pauStack_159b8;
      uStack_16640 = *(undefined8 *)*pauStack_159b8;
      uStack_16638 = *(undefined8 *)(*pauStack_159b8 + 8);
      uStack_16630 = *(undefined8 *)(*pauStack_159b8 + 0x10);
      uStack_16628 = *(undefined8 *)(*pauStack_159b8 + 0x18);
      uStack_16620 = *(undefined8 *)(*pauStack_159b8 + 0x20);
      uStack_16618 = *(undefined8 *)(*pauStack_159b8 + 0x28);
      uStack_16610 = *(undefined8 *)(*pauStack_159b8 + 0x30);
      uStack_16608 = *(undefined8 *)(*pauStack_159b8 + 0x38);
      auStack_13bc0 = vextractf64x4_avx512f(*pauStack_159b8,1);
      _auStack_13c20 = vmaxps_avx(*(undefined1 (*) [32])*pauStack_159b8,auStack_13bc0);
      uStack_13ae0 = auStack_13c20._0_8_;
      uStack_13ad8 = auStack_13c20._8_8_;
      uStack_13ad0 = auStack_13c20._16_8_;
      uStack_13ac8 = uStack_13c08;
      uStack_13b48 = uStack_13c08;
      uStack_13b50 = auStack_13c20._16_8_;
      auStack_13c30 = vmaxps_avx(stack0xfffffffffffec3f0,auStack_13b60);
      local_d3d0 = auStack_13c30._0_8_;
      uStack_d3c8 = auStack_13c30._8_8_;
      local_d3e0 = auStack_13c30._0_8_;
      uStack_d3d8 = auStack_13c30._8_8_;
      auStack_13b80 = vunpckhpd_avx(auStack_13c30,auStack_13c30);
      uStack_13b70 = auStack_13c30._0_8_;
      uStack_13b68 = auStack_13c30._8_8_;
      auStack_13c40 = vmaxps_avx(auStack_13c30,auStack_13b80);
      local_d3b0 = auStack_13c40._0_8_;
      uStack_d3a8 = auStack_13c40._8_8_;
      local_d3c0 = auStack_13c40._4_4_;
      uStack_d3bc = auStack_13c40._4_4_;
      uStack_d3b8 = auStack_13c40._4_4_;
      uStack_d3b4 = auStack_13c40._4_4_;
      auVar17._4_4_ = auStack_13c40._4_4_;
      auVar17._0_4_ = auStack_13c40._4_4_;
      auVar17._8_4_ = auStack_13c40._4_4_;
      auVar17._12_4_ = auStack_13c40._4_4_;
      auStack_13c50 = vmaxss_avx(auStack_13c40,auVar17);
      local_d390 = auStack_13c50._0_8_;
      uVar18 = local_d390;
      uStack_d388 = auStack_13c50._8_8_;
      local_d390._0_4_ = auStack_13c50._0_4_;
      fStack_16644 = (float)local_d390;
      uStack_13c00 = uStack_16640;
      uStack_13bf8 = uStack_16638;
      uStack_13bf0 = uStack_16630;
      uStack_13be8 = uStack_16628;
      uStack_13be0 = uStack_16620;
      uStack_13bd8 = uStack_16618;
      uStack_13bd0 = uStack_16610;
      uStack_13bc8 = uStack_16608;
      uStack_13ba0 = uStack_16640;
      uStack_13b98 = uStack_16638;
      uStack_13b90 = uStack_16630;
      uStack_13b88 = uStack_16628;
      uStack_13b40 = uStack_16640;
      uStack_13b38 = uStack_16638;
      uStack_13b30 = uStack_16630;
      uStack_13b28 = uStack_16628;
      uStack_13b20 = uStack_16620;
      uStack_13b18 = uStack_16618;
      uStack_13b10 = uStack_16610;
      uStack_13b08 = uStack_16608;
      local_d390 = uVar18;
      pfVar296 = std::max<float>((float *)pauStack_159c0,&fStack_16644);
      *(float *)*pauStack_159c0 = *pfVar296;
      pauStack_159b8 = pauStack_159b8 + 1;
      pauStack_159c0 = (undefined1 (*) [64])(*pauStack_159c0 + 4);
    }
  }
  for (iStack_16648 = 0; iStack_16648 < iStack_1598c; iStack_16648 = iStack_16648 + 1) {
    pauStack_16650 = (undefined1 (*) [64])(lStack_15988 + (long)(iStack_16648 * iStack_15990) * 4);
    pauStack_16658 = pauStack_159a0;
    pauStack_16660 = pauStack_159a8;
    for (iStack_16664 = 0; iStack_16664 + 0xf < iStack_15994; iStack_16664 = iStack_16664 + 0x10) {
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauStack_16658));
      auVar298 = vsubps_avx512f(*pauStack_16650,auVar298);
      auVar318._8_4_ = 88.37626;
      auVar318._12_4_ = 88.37626;
      auVar318._0_4_ = 88.37626;
      auVar318._4_4_ = 88.37626;
      auVar318._16_4_ = 88.37626;
      auVar318._20_4_ = 88.37626;
      auVar318._24_4_ = 88.37626;
      auVar318._28_4_ = 88.37626;
      auVar318._32_4_ = 88.37626;
      auVar318._36_4_ = 88.37626;
      auVar318._40_4_ = 88.37626;
      auVar318._44_4_ = 88.37626;
      auVar318._48_4_ = 88.37626;
      auVar318._52_4_ = 88.37626;
      auVar318._56_4_ = 88.37626;
      auVar318._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar318);
      auVar306._8_4_ = -88.37626;
      auVar306._12_4_ = -88.37626;
      auVar306._0_4_ = -88.37626;
      auVar306._4_4_ = -88.37626;
      auVar306._16_4_ = -88.37626;
      auVar306._20_4_ = -88.37626;
      auVar306._24_4_ = -88.37626;
      auVar306._28_4_ = -88.37626;
      auVar306._32_4_ = -88.37626;
      auVar306._36_4_ = -88.37626;
      auVar306._40_4_ = -88.37626;
      auVar306._44_4_ = -88.37626;
      auVar306._48_4_ = -88.37626;
      auVar306._52_4_ = -88.37626;
      auVar306._56_4_ = -88.37626;
      auVar306._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar306);
      auVar62._8_4_ = 1.442695;
      auVar62._12_4_ = 1.442695;
      auVar62._0_4_ = 1.442695;
      auVar62._4_4_ = 1.442695;
      auVar62._16_4_ = 1.442695;
      auVar62._20_4_ = 1.442695;
      auVar62._24_4_ = 1.442695;
      auVar62._28_4_ = 1.442695;
      auVar62._32_4_ = 1.442695;
      auVar62._36_4_ = 1.442695;
      auVar62._40_4_ = 1.442695;
      auVar62._44_4_ = 1.442695;
      auVar62._48_4_ = 1.442695;
      auVar62._52_4_ = 1.442695;
      auVar62._56_4_ = 1.442695;
      auVar62._60_4_ = 1.442695;
      auVar61._8_4_ = 0.5;
      auVar61._12_4_ = 0.5;
      auVar61._0_4_ = 0.5;
      auVar61._4_4_ = 0.5;
      auVar61._16_4_ = 0.5;
      auVar61._20_4_ = 0.5;
      auVar61._24_4_ = 0.5;
      auVar61._28_4_ = 0.5;
      auVar61._32_4_ = 0.5;
      auVar61._36_4_ = 0.5;
      auVar61._40_4_ = 0.5;
      auVar61._44_4_ = 0.5;
      auVar61._48_4_ = 0.5;
      auVar61._52_4_ = 0.5;
      auVar61._56_4_ = 0.5;
      auVar61._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar62,auVar299,auVar61);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar191._8_4_ = 1.0;
      auVar191._12_4_ = 1.0;
      auVar191._0_4_ = 1.0;
      auVar191._4_4_ = 1.0;
      auVar191._16_4_ = 1.0;
      auVar191._20_4_ = 1.0;
      auVar191._24_4_ = 1.0;
      auVar191._28_4_ = 1.0;
      auVar191._32_4_ = 1.0;
      auVar191._36_4_ = 1.0;
      auVar191._40_4_ = 1.0;
      auVar191._44_4_ = 1.0;
      auVar191._48_4_ = 1.0;
      auVar191._52_4_ = 1.0;
      auVar191._56_4_ = 1.0;
      auVar191._60_4_ = 1.0;
      local_6cc0 = auVar300._0_4_;
      iStack_6cbc = auVar300._4_4_;
      iStack_6cb8 = auVar300._8_4_;
      iStack_6cb4 = auVar300._12_4_;
      iStack_6cb0 = auVar300._16_4_;
      iStack_6cac = auVar300._20_4_;
      iStack_6ca8 = auVar300._24_4_;
      iStack_6ca4 = auVar300._28_4_;
      iStack_6ca0 = auVar300._32_4_;
      iStack_6c9c = auVar300._36_4_;
      iStack_6c98 = auVar300._40_4_;
      iStack_6c94 = auVar300._44_4_;
      iStack_6c90 = auVar300._48_4_;
      iStack_6c8c = auVar300._52_4_;
      iStack_6c88 = auVar300._56_4_;
      iStack_6c84 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar191);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_10900._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_6cbc;
      auStack_10900._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_6cc0;
      auStack_10900._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_6cb8;
      auStack_10900._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_6cb4;
      uStack_108f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_6cb0;
      uStack_108f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_6cac;
      uStack_108e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_6ca8;
      uStack_108e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_6ca4;
      auVar297 = _auStack_10900;
      uStack_108e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_6ca0;
      uStack_108e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_6c9c;
      auVar294 = _auStack_10900;
      uStack_108d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6c98;
      uStack_108d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6c94;
      auVar295 = _auStack_10900;
      uStack_108d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6c90;
      uStack_108d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_6c8c;
      auVar293 = _auStack_10900;
      uStack_108c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6c88;
      uStack_108c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6c84;
      auVar298 = _auStack_10900;
      uStack_108e8 = auVar297._24_8_;
      uStack_108e0 = auVar294._32_8_;
      uStack_108d8 = auVar295._40_8_;
      uStack_108d0 = auVar293._48_8_;
      uStack_108c8 = auVar298._56_8_;
      auVar211._16_8_ = uStack_108f0;
      auVar211._0_16_ = auStack_10900;
      auVar211._24_8_ = uStack_108e8;
      auVar211._32_8_ = uStack_108e0;
      auVar211._40_8_ = uStack_108d8;
      auVar211._48_8_ = uStack_108d0;
      auVar211._56_8_ = uStack_108c8;
      auVar210._8_4_ = 0.6933594;
      auVar210._12_4_ = 0.6933594;
      auVar210._0_4_ = 0.6933594;
      auVar210._4_4_ = 0.6933594;
      auVar210._16_4_ = 0.6933594;
      auVar210._20_4_ = 0.6933594;
      auVar210._24_4_ = 0.6933594;
      auVar210._28_4_ = 0.6933594;
      auVar210._32_4_ = 0.6933594;
      auVar210._36_4_ = 0.6933594;
      auVar210._40_4_ = 0.6933594;
      auVar210._44_4_ = 0.6933594;
      auVar210._48_4_ = 0.6933594;
      auVar210._52_4_ = 0.6933594;
      auVar210._56_4_ = 0.6933594;
      auVar210._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar210,auVar211,auVar299);
      auVar209._16_8_ = uStack_108f0;
      auVar209._0_16_ = auStack_10900;
      auVar209._24_8_ = uStack_108e8;
      auVar209._32_8_ = uStack_108e0;
      auVar209._40_8_ = uStack_108d8;
      auVar209._48_8_ = uStack_108d0;
      auVar209._56_8_ = uStack_108c8;
      auVar208._8_4_ = -0.00021219444;
      auVar208._12_4_ = -0.00021219444;
      auVar208._0_4_ = -0.00021219444;
      auVar208._4_4_ = -0.00021219444;
      auVar208._16_4_ = -0.00021219444;
      auVar208._20_4_ = -0.00021219444;
      auVar208._24_4_ = -0.00021219444;
      auVar208._28_4_ = -0.00021219444;
      auVar208._32_4_ = -0.00021219444;
      auVar208._36_4_ = -0.00021219444;
      auVar208._40_4_ = -0.00021219444;
      auVar208._44_4_ = -0.00021219444;
      auVar208._48_4_ = -0.00021219444;
      auVar208._52_4_ = -0.00021219444;
      auVar208._56_4_ = -0.00021219444;
      auVar208._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar208,auVar209,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_109f8._0_4_ = 0.00019875691;
      uStack_109f8._4_4_ = 0.00019875691;
      auStack_10a00._0_4_ = 0.00019875691;
      auStack_10a00._4_4_ = 0.00019875691;
      auVar60._16_4_ = 0.00019875691;
      auVar60._20_4_ = 0.00019875691;
      auVar60._0_16_ = _auStack_10a00;
      auVar60._24_4_ = 0.00019875691;
      auVar60._28_4_ = 0.00019875691;
      auVar60._32_4_ = 0.00019875691;
      auVar60._36_4_ = 0.00019875691;
      auVar60._40_4_ = 0.00019875691;
      auVar60._44_4_ = 0.00019875691;
      auVar60._48_4_ = 0.00019875691;
      auVar60._52_4_ = 0.00019875691;
      auVar60._56_4_ = 0.00019875691;
      auVar60._60_4_ = 0.00019875691;
      auVar59._8_4_ = 0.0013981999;
      auVar59._12_4_ = 0.0013981999;
      auVar59._0_4_ = 0.0013981999;
      auVar59._4_4_ = 0.0013981999;
      auVar59._16_4_ = 0.0013981999;
      auVar59._20_4_ = 0.0013981999;
      auVar59._24_4_ = 0.0013981999;
      auVar59._28_4_ = 0.0013981999;
      auVar59._32_4_ = 0.0013981999;
      auVar59._36_4_ = 0.0013981999;
      auVar59._40_4_ = 0.0013981999;
      auVar59._44_4_ = 0.0013981999;
      auVar59._48_4_ = 0.0013981999;
      auVar59._52_4_ = 0.0013981999;
      auVar59._56_4_ = 0.0013981999;
      auVar59._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar60,auVar59);
      auVar58._8_4_ = 0.008333452;
      auVar58._12_4_ = 0.008333452;
      auVar58._0_4_ = 0.008333452;
      auVar58._4_4_ = 0.008333452;
      auVar58._16_4_ = 0.008333452;
      auVar58._20_4_ = 0.008333452;
      auVar58._24_4_ = 0.008333452;
      auVar58._28_4_ = 0.008333452;
      auVar58._32_4_ = 0.008333452;
      auVar58._36_4_ = 0.008333452;
      auVar58._40_4_ = 0.008333452;
      auVar58._44_4_ = 0.008333452;
      auVar58._48_4_ = 0.008333452;
      auVar58._52_4_ = 0.008333452;
      auVar58._56_4_ = 0.008333452;
      auVar58._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar58);
      auVar57._8_4_ = 0.041665796;
      auVar57._12_4_ = 0.041665796;
      auVar57._0_4_ = 0.041665796;
      auVar57._4_4_ = 0.041665796;
      auVar57._16_4_ = 0.041665796;
      auVar57._20_4_ = 0.041665796;
      auVar57._24_4_ = 0.041665796;
      auVar57._28_4_ = 0.041665796;
      auVar57._32_4_ = 0.041665796;
      auVar57._36_4_ = 0.041665796;
      auVar57._40_4_ = 0.041665796;
      auVar57._44_4_ = 0.041665796;
      auVar57._48_4_ = 0.041665796;
      auVar57._52_4_ = 0.041665796;
      auVar57._56_4_ = 0.041665796;
      auVar57._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar57);
      auVar56._8_4_ = 0.16666666;
      auVar56._12_4_ = 0.16666666;
      auVar56._0_4_ = 0.16666666;
      auVar56._4_4_ = 0.16666666;
      auVar56._16_4_ = 0.16666666;
      auVar56._20_4_ = 0.16666666;
      auVar56._24_4_ = 0.16666666;
      auVar56._28_4_ = 0.16666666;
      auVar56._32_4_ = 0.16666666;
      auVar56._36_4_ = 0.16666666;
      auVar56._40_4_ = 0.16666666;
      auVar56._44_4_ = 0.16666666;
      auVar56._48_4_ = 0.16666666;
      auVar56._52_4_ = 0.16666666;
      auVar56._56_4_ = 0.16666666;
      auVar56._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar56);
      auVar55._8_4_ = 0.5;
      auVar55._12_4_ = 0.5;
      auVar55._0_4_ = 0.5;
      auVar55._4_4_ = 0.5;
      auVar55._16_4_ = 0.5;
      auVar55._20_4_ = 0.5;
      auVar55._24_4_ = 0.5;
      auVar55._28_4_ = 0.5;
      auVar55._32_4_ = 0.5;
      auVar55._36_4_ = 0.5;
      auVar55._40_4_ = 0.5;
      auVar55._44_4_ = 0.5;
      auVar55._48_4_ = 0.5;
      auVar55._52_4_ = 0.5;
      auVar55._56_4_ = 0.5;
      auVar55._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar55);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar314._8_4_ = 1.0;
      auVar314._12_4_ = 1.0;
      auVar314._0_4_ = 1.0;
      auVar314._4_4_ = 1.0;
      auVar314._16_4_ = 1.0;
      auVar314._20_4_ = 1.0;
      auVar314._24_4_ = 1.0;
      auVar314._28_4_ = 1.0;
      auVar314._32_4_ = 1.0;
      auVar314._36_4_ = 1.0;
      auVar314._40_4_ = 1.0;
      auVar314._44_4_ = 1.0;
      auVar314._48_4_ = 1.0;
      auVar314._52_4_ = 1.0;
      auVar314._56_4_ = 1.0;
      auVar314._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar314);
      auVar318 = ZEXT1664((undefined1  [16])0x0);
      auVar276._16_8_ = uStack_108f0;
      auVar276._0_16_ = auStack_10900;
      auVar276._24_8_ = uStack_108e8;
      auVar276._32_8_ = uStack_108e0;
      auVar276._40_8_ = uStack_108d8;
      auVar276._48_8_ = uStack_108d0;
      auVar276._56_8_ = uStack_108c8;
      auVar298 = vcvttps2dq_avx512f(auVar276);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar306 = vmulps_avx512f(auVar300,auVar298);
      auStack_10a00 = auVar306._0_8_;
      uStack_109f8 = auVar306._8_8_;
      uStack_109f0 = auVar306._16_8_;
      uStack_109e8 = auVar306._24_8_;
      uStack_109e0 = auVar306._32_8_;
      uStack_109d8 = auVar306._40_8_;
      uStack_109d0 = auVar306._48_8_;
      uStack_109c8 = auVar306._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 4)));
      auVar298 = vsubps_avx512f(pauStack_16650[1],auVar298);
      auVar39._8_4_ = 88.37626;
      auVar39._12_4_ = 88.37626;
      auVar39._0_4_ = 88.37626;
      auVar39._4_4_ = 88.37626;
      auVar39._16_4_ = 88.37626;
      auVar39._20_4_ = 88.37626;
      auVar39._24_4_ = 88.37626;
      auVar39._28_4_ = 88.37626;
      auVar39._32_4_ = 88.37626;
      auVar39._36_4_ = 88.37626;
      auVar39._40_4_ = 88.37626;
      auVar39._44_4_ = 88.37626;
      auVar39._48_4_ = 88.37626;
      auVar39._52_4_ = 88.37626;
      auVar39._56_4_ = 88.37626;
      auVar39._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar39);
      auVar307._8_4_ = -88.37626;
      auVar307._12_4_ = -88.37626;
      auVar307._0_4_ = -88.37626;
      auVar307._4_4_ = -88.37626;
      auVar307._16_4_ = -88.37626;
      auVar307._20_4_ = -88.37626;
      auVar307._24_4_ = -88.37626;
      auVar307._28_4_ = -88.37626;
      auVar307._32_4_ = -88.37626;
      auVar307._36_4_ = -88.37626;
      auVar307._40_4_ = -88.37626;
      auVar307._44_4_ = -88.37626;
      auVar307._48_4_ = -88.37626;
      auVar307._52_4_ = -88.37626;
      auVar307._56_4_ = -88.37626;
      auVar307._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar307);
      auVar70._8_4_ = 1.442695;
      auVar70._12_4_ = 1.442695;
      auVar70._0_4_ = 1.442695;
      auVar70._4_4_ = 1.442695;
      auVar70._16_4_ = 1.442695;
      auVar70._20_4_ = 1.442695;
      auVar70._24_4_ = 1.442695;
      auVar70._28_4_ = 1.442695;
      auVar70._32_4_ = 1.442695;
      auVar70._36_4_ = 1.442695;
      auVar70._40_4_ = 1.442695;
      auVar70._44_4_ = 1.442695;
      auVar70._48_4_ = 1.442695;
      auVar70._52_4_ = 1.442695;
      auVar70._56_4_ = 1.442695;
      auVar70._60_4_ = 1.442695;
      auVar69._8_4_ = 0.5;
      auVar69._12_4_ = 0.5;
      auVar69._0_4_ = 0.5;
      auVar69._4_4_ = 0.5;
      auVar69._16_4_ = 0.5;
      auVar69._20_4_ = 0.5;
      auVar69._24_4_ = 0.5;
      auVar69._28_4_ = 0.5;
      auVar69._32_4_ = 0.5;
      auVar69._36_4_ = 0.5;
      auVar69._40_4_ = 0.5;
      auVar69._44_4_ = 0.5;
      auVar69._48_4_ = 0.5;
      auVar69._52_4_ = 0.5;
      auVar69._56_4_ = 0.5;
      auVar69._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar70,auVar299,auVar69);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar192._8_4_ = 1.0;
      auVar192._12_4_ = 1.0;
      auVar192._0_4_ = 1.0;
      auVar192._4_4_ = 1.0;
      auVar192._16_4_ = 1.0;
      auVar192._20_4_ = 1.0;
      auVar192._24_4_ = 1.0;
      auVar192._28_4_ = 1.0;
      auVar192._32_4_ = 1.0;
      auVar192._36_4_ = 1.0;
      auVar192._40_4_ = 1.0;
      auVar192._44_4_ = 1.0;
      auVar192._48_4_ = 1.0;
      auVar192._52_4_ = 1.0;
      auVar192._56_4_ = 1.0;
      auVar192._60_4_ = 1.0;
      local_6b40 = auVar300._0_4_;
      iStack_6b3c = auVar300._4_4_;
      iStack_6b38 = auVar300._8_4_;
      iStack_6b34 = auVar300._12_4_;
      iStack_6b30 = auVar300._16_4_;
      iStack_6b2c = auVar300._20_4_;
      iStack_6b28 = auVar300._24_4_;
      iStack_6b24 = auVar300._28_4_;
      iStack_6b20 = auVar300._32_4_;
      iStack_6b1c = auVar300._36_4_;
      iStack_6b18 = auVar300._40_4_;
      iStack_6b14 = auVar300._44_4_;
      iStack_6b10 = auVar300._48_4_;
      iStack_6b0c = auVar300._52_4_;
      iStack_6b08 = auVar300._56_4_;
      iStack_6b04 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar192);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_10b80._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_6b3c;
      auStack_10b80._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_6b40;
      auStack_10b80._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_6b38;
      auStack_10b80._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_6b34;
      uStack_10b70._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_6b30;
      uStack_10b70._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_6b2c;
      uStack_10b68._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_6b28;
      uStack_10b68._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_6b24;
      auVar297 = _auStack_10b80;
      uStack_10b60._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_6b20;
      uStack_10b60._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_6b1c;
      auVar294 = _auStack_10b80;
      uStack_10b58._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6b18;
      uStack_10b58._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6b14;
      auVar295 = _auStack_10b80;
      uStack_10b50._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6b10;
      uStack_10b50._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_6b0c;
      auVar293 = _auStack_10b80;
      uStack_10b48._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6b08;
      uStack_10b48._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6b04;
      auVar298 = _auStack_10b80;
      uStack_10b68 = auVar297._24_8_;
      uStack_10b60 = auVar294._32_8_;
      uStack_10b58 = auVar295._40_8_;
      uStack_10b50 = auVar293._48_8_;
      uStack_10b48 = auVar298._56_8_;
      auVar215._16_8_ = uStack_10b70;
      auVar215._0_16_ = auStack_10b80;
      auVar215._24_8_ = uStack_10b68;
      auVar215._32_8_ = uStack_10b60;
      auVar215._40_8_ = uStack_10b58;
      auVar215._48_8_ = uStack_10b50;
      auVar215._56_8_ = uStack_10b48;
      auVar214._8_4_ = 0.6933594;
      auVar214._12_4_ = 0.6933594;
      auVar214._0_4_ = 0.6933594;
      auVar214._4_4_ = 0.6933594;
      auVar214._16_4_ = 0.6933594;
      auVar214._20_4_ = 0.6933594;
      auVar214._24_4_ = 0.6933594;
      auVar214._28_4_ = 0.6933594;
      auVar214._32_4_ = 0.6933594;
      auVar214._36_4_ = 0.6933594;
      auVar214._40_4_ = 0.6933594;
      auVar214._44_4_ = 0.6933594;
      auVar214._48_4_ = 0.6933594;
      auVar214._52_4_ = 0.6933594;
      auVar214._56_4_ = 0.6933594;
      auVar214._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar214,auVar215,auVar299);
      auVar213._16_8_ = uStack_10b70;
      auVar213._0_16_ = auStack_10b80;
      auVar213._24_8_ = uStack_10b68;
      auVar213._32_8_ = uStack_10b60;
      auVar213._40_8_ = uStack_10b58;
      auVar213._48_8_ = uStack_10b50;
      auVar213._56_8_ = uStack_10b48;
      auVar212._8_4_ = -0.00021219444;
      auVar212._12_4_ = -0.00021219444;
      auVar212._0_4_ = -0.00021219444;
      auVar212._4_4_ = -0.00021219444;
      auVar212._16_4_ = -0.00021219444;
      auVar212._20_4_ = -0.00021219444;
      auVar212._24_4_ = -0.00021219444;
      auVar212._28_4_ = -0.00021219444;
      auVar212._32_4_ = -0.00021219444;
      auVar212._36_4_ = -0.00021219444;
      auVar212._40_4_ = -0.00021219444;
      auVar212._44_4_ = -0.00021219444;
      auVar212._48_4_ = -0.00021219444;
      auVar212._52_4_ = -0.00021219444;
      auVar212._56_4_ = -0.00021219444;
      auVar212._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar212,auVar213,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_10c78._0_4_ = 0.00019875691;
      uStack_10c78._4_4_ = 0.00019875691;
      auStack_10c80._0_4_ = 0.00019875691;
      auStack_10c80._4_4_ = 0.00019875691;
      auVar68._16_4_ = 0.00019875691;
      auVar68._20_4_ = 0.00019875691;
      auVar68._0_16_ = _auStack_10c80;
      auVar68._24_4_ = 0.00019875691;
      auVar68._28_4_ = 0.00019875691;
      auVar68._32_4_ = 0.00019875691;
      auVar68._36_4_ = 0.00019875691;
      auVar68._40_4_ = 0.00019875691;
      auVar68._44_4_ = 0.00019875691;
      auVar68._48_4_ = 0.00019875691;
      auVar68._52_4_ = 0.00019875691;
      auVar68._56_4_ = 0.00019875691;
      auVar68._60_4_ = 0.00019875691;
      auVar67._8_4_ = 0.0013981999;
      auVar67._12_4_ = 0.0013981999;
      auVar67._0_4_ = 0.0013981999;
      auVar67._4_4_ = 0.0013981999;
      auVar67._16_4_ = 0.0013981999;
      auVar67._20_4_ = 0.0013981999;
      auVar67._24_4_ = 0.0013981999;
      auVar67._28_4_ = 0.0013981999;
      auVar67._32_4_ = 0.0013981999;
      auVar67._36_4_ = 0.0013981999;
      auVar67._40_4_ = 0.0013981999;
      auVar67._44_4_ = 0.0013981999;
      auVar67._48_4_ = 0.0013981999;
      auVar67._52_4_ = 0.0013981999;
      auVar67._56_4_ = 0.0013981999;
      auVar67._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar68,auVar67);
      auVar66._8_4_ = 0.008333452;
      auVar66._12_4_ = 0.008333452;
      auVar66._0_4_ = 0.008333452;
      auVar66._4_4_ = 0.008333452;
      auVar66._16_4_ = 0.008333452;
      auVar66._20_4_ = 0.008333452;
      auVar66._24_4_ = 0.008333452;
      auVar66._28_4_ = 0.008333452;
      auVar66._32_4_ = 0.008333452;
      auVar66._36_4_ = 0.008333452;
      auVar66._40_4_ = 0.008333452;
      auVar66._44_4_ = 0.008333452;
      auVar66._48_4_ = 0.008333452;
      auVar66._52_4_ = 0.008333452;
      auVar66._56_4_ = 0.008333452;
      auVar66._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar66);
      auVar65._8_4_ = 0.041665796;
      auVar65._12_4_ = 0.041665796;
      auVar65._0_4_ = 0.041665796;
      auVar65._4_4_ = 0.041665796;
      auVar65._16_4_ = 0.041665796;
      auVar65._20_4_ = 0.041665796;
      auVar65._24_4_ = 0.041665796;
      auVar65._28_4_ = 0.041665796;
      auVar65._32_4_ = 0.041665796;
      auVar65._36_4_ = 0.041665796;
      auVar65._40_4_ = 0.041665796;
      auVar65._44_4_ = 0.041665796;
      auVar65._48_4_ = 0.041665796;
      auVar65._52_4_ = 0.041665796;
      auVar65._56_4_ = 0.041665796;
      auVar65._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar65);
      auVar64._8_4_ = 0.16666666;
      auVar64._12_4_ = 0.16666666;
      auVar64._0_4_ = 0.16666666;
      auVar64._4_4_ = 0.16666666;
      auVar64._16_4_ = 0.16666666;
      auVar64._20_4_ = 0.16666666;
      auVar64._24_4_ = 0.16666666;
      auVar64._28_4_ = 0.16666666;
      auVar64._32_4_ = 0.16666666;
      auVar64._36_4_ = 0.16666666;
      auVar64._40_4_ = 0.16666666;
      auVar64._44_4_ = 0.16666666;
      auVar64._48_4_ = 0.16666666;
      auVar64._52_4_ = 0.16666666;
      auVar64._56_4_ = 0.16666666;
      auVar64._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar64);
      auVar63._8_4_ = 0.5;
      auVar63._12_4_ = 0.5;
      auVar63._0_4_ = 0.5;
      auVar63._4_4_ = 0.5;
      auVar63._16_4_ = 0.5;
      auVar63._20_4_ = 0.5;
      auVar63._24_4_ = 0.5;
      auVar63._28_4_ = 0.5;
      auVar63._32_4_ = 0.5;
      auVar63._36_4_ = 0.5;
      auVar63._40_4_ = 0.5;
      auVar63._44_4_ = 0.5;
      auVar63._48_4_ = 0.5;
      auVar63._52_4_ = 0.5;
      auVar63._56_4_ = 0.5;
      auVar63._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar63);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar315._8_4_ = 1.0;
      auVar315._12_4_ = 1.0;
      auVar315._0_4_ = 1.0;
      auVar315._4_4_ = 1.0;
      auVar315._16_4_ = 1.0;
      auVar315._20_4_ = 1.0;
      auVar315._24_4_ = 1.0;
      auVar315._28_4_ = 1.0;
      auVar315._32_4_ = 1.0;
      auVar315._36_4_ = 1.0;
      auVar315._40_4_ = 1.0;
      auVar315._44_4_ = 1.0;
      auVar315._48_4_ = 1.0;
      auVar315._52_4_ = 1.0;
      auVar315._56_4_ = 1.0;
      auVar315._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar315);
      auVar277._16_8_ = uStack_10b70;
      auVar277._0_16_ = auStack_10b80;
      auVar277._24_8_ = uStack_10b68;
      auVar277._32_8_ = uStack_10b60;
      auVar277._40_8_ = uStack_10b58;
      auVar277._48_8_ = uStack_10b50;
      auVar277._56_8_ = uStack_10b48;
      auVar298 = vcvttps2dq_avx512f(auVar277);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar307 = vmulps_avx512f(auVar300,auVar298);
      auStack_10c80 = auVar307._0_8_;
      uStack_10c78 = auVar307._8_8_;
      uStack_10c70 = auVar307._16_8_;
      uStack_10c68 = auVar307._24_8_;
      uStack_10c60 = auVar307._32_8_;
      uStack_10c58 = auVar307._40_8_;
      uStack_10c50 = auVar307._48_8_;
      uStack_10c48 = auVar307._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 8)));
      auVar298 = vsubps_avx512f(pauStack_16650[2],auVar298);
      auVar40._8_4_ = 88.37626;
      auVar40._12_4_ = 88.37626;
      auVar40._0_4_ = 88.37626;
      auVar40._4_4_ = 88.37626;
      auVar40._16_4_ = 88.37626;
      auVar40._20_4_ = 88.37626;
      auVar40._24_4_ = 88.37626;
      auVar40._28_4_ = 88.37626;
      auVar40._32_4_ = 88.37626;
      auVar40._36_4_ = 88.37626;
      auVar40._40_4_ = 88.37626;
      auVar40._44_4_ = 88.37626;
      auVar40._48_4_ = 88.37626;
      auVar40._52_4_ = 88.37626;
      auVar40._56_4_ = 88.37626;
      auVar40._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar40);
      auVar308._8_4_ = -88.37626;
      auVar308._12_4_ = -88.37626;
      auVar308._0_4_ = -88.37626;
      auVar308._4_4_ = -88.37626;
      auVar308._16_4_ = -88.37626;
      auVar308._20_4_ = -88.37626;
      auVar308._24_4_ = -88.37626;
      auVar308._28_4_ = -88.37626;
      auVar308._32_4_ = -88.37626;
      auVar308._36_4_ = -88.37626;
      auVar308._40_4_ = -88.37626;
      auVar308._44_4_ = -88.37626;
      auVar308._48_4_ = -88.37626;
      auVar308._52_4_ = -88.37626;
      auVar308._56_4_ = -88.37626;
      auVar308._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar308);
      auVar78._8_4_ = 1.442695;
      auVar78._12_4_ = 1.442695;
      auVar78._0_4_ = 1.442695;
      auVar78._4_4_ = 1.442695;
      auVar78._16_4_ = 1.442695;
      auVar78._20_4_ = 1.442695;
      auVar78._24_4_ = 1.442695;
      auVar78._28_4_ = 1.442695;
      auVar78._32_4_ = 1.442695;
      auVar78._36_4_ = 1.442695;
      auVar78._40_4_ = 1.442695;
      auVar78._44_4_ = 1.442695;
      auVar78._48_4_ = 1.442695;
      auVar78._52_4_ = 1.442695;
      auVar78._56_4_ = 1.442695;
      auVar78._60_4_ = 1.442695;
      auVar77._8_4_ = 0.5;
      auVar77._12_4_ = 0.5;
      auVar77._0_4_ = 0.5;
      auVar77._4_4_ = 0.5;
      auVar77._16_4_ = 0.5;
      auVar77._20_4_ = 0.5;
      auVar77._24_4_ = 0.5;
      auVar77._28_4_ = 0.5;
      auVar77._32_4_ = 0.5;
      auVar77._36_4_ = 0.5;
      auVar77._40_4_ = 0.5;
      auVar77._44_4_ = 0.5;
      auVar77._48_4_ = 0.5;
      auVar77._52_4_ = 0.5;
      auVar77._56_4_ = 0.5;
      auVar77._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar78,auVar299,auVar77);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar193._8_4_ = 1.0;
      auVar193._12_4_ = 1.0;
      auVar193._0_4_ = 1.0;
      auVar193._4_4_ = 1.0;
      auVar193._16_4_ = 1.0;
      auVar193._20_4_ = 1.0;
      auVar193._24_4_ = 1.0;
      auVar193._28_4_ = 1.0;
      auVar193._32_4_ = 1.0;
      auVar193._36_4_ = 1.0;
      auVar193._40_4_ = 1.0;
      auVar193._44_4_ = 1.0;
      auVar193._48_4_ = 1.0;
      auVar193._52_4_ = 1.0;
      auVar193._56_4_ = 1.0;
      auVar193._60_4_ = 1.0;
      local_69c0 = auVar300._0_4_;
      iStack_69bc = auVar300._4_4_;
      iStack_69b8 = auVar300._8_4_;
      iStack_69b4 = auVar300._12_4_;
      iStack_69b0 = auVar300._16_4_;
      iStack_69ac = auVar300._20_4_;
      iStack_69a8 = auVar300._24_4_;
      iStack_69a4 = auVar300._28_4_;
      iStack_69a0 = auVar300._32_4_;
      iStack_699c = auVar300._36_4_;
      iStack_6998 = auVar300._40_4_;
      iStack_6994 = auVar300._44_4_;
      iStack_6990 = auVar300._48_4_;
      iStack_698c = auVar300._52_4_;
      iStack_6988 = auVar300._56_4_;
      iStack_6984 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar193);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_10e00._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_69bc;
      auStack_10e00._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_69c0;
      auStack_10e00._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_69b8;
      auStack_10e00._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_69b4;
      uStack_10df0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_69b0;
      uStack_10df0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_69ac;
      uStack_10de8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_69a8;
      uStack_10de8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_69a4;
      auVar297 = _auStack_10e00;
      uStack_10de0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_69a0;
      uStack_10de0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_699c;
      auVar294 = _auStack_10e00;
      uStack_10dd8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6998;
      uStack_10dd8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6994;
      auVar295 = _auStack_10e00;
      uStack_10dd0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6990;
      uStack_10dd0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_698c;
      auVar293 = _auStack_10e00;
      uStack_10dc8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6988;
      uStack_10dc8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6984;
      auVar298 = _auStack_10e00;
      uStack_10de8 = auVar297._24_8_;
      uStack_10de0 = auVar294._32_8_;
      uStack_10dd8 = auVar295._40_8_;
      uStack_10dd0 = auVar293._48_8_;
      uStack_10dc8 = auVar298._56_8_;
      auVar219._16_8_ = uStack_10df0;
      auVar219._0_16_ = auStack_10e00;
      auVar219._24_8_ = uStack_10de8;
      auVar219._32_8_ = uStack_10de0;
      auVar219._40_8_ = uStack_10dd8;
      auVar219._48_8_ = uStack_10dd0;
      auVar219._56_8_ = uStack_10dc8;
      auVar218._8_4_ = 0.6933594;
      auVar218._12_4_ = 0.6933594;
      auVar218._0_4_ = 0.6933594;
      auVar218._4_4_ = 0.6933594;
      auVar218._16_4_ = 0.6933594;
      auVar218._20_4_ = 0.6933594;
      auVar218._24_4_ = 0.6933594;
      auVar218._28_4_ = 0.6933594;
      auVar218._32_4_ = 0.6933594;
      auVar218._36_4_ = 0.6933594;
      auVar218._40_4_ = 0.6933594;
      auVar218._44_4_ = 0.6933594;
      auVar218._48_4_ = 0.6933594;
      auVar218._52_4_ = 0.6933594;
      auVar218._56_4_ = 0.6933594;
      auVar218._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar218,auVar219,auVar299);
      auVar217._16_8_ = uStack_10df0;
      auVar217._0_16_ = auStack_10e00;
      auVar217._24_8_ = uStack_10de8;
      auVar217._32_8_ = uStack_10de0;
      auVar217._40_8_ = uStack_10dd8;
      auVar217._48_8_ = uStack_10dd0;
      auVar217._56_8_ = uStack_10dc8;
      auVar216._8_4_ = -0.00021219444;
      auVar216._12_4_ = -0.00021219444;
      auVar216._0_4_ = -0.00021219444;
      auVar216._4_4_ = -0.00021219444;
      auVar216._16_4_ = -0.00021219444;
      auVar216._20_4_ = -0.00021219444;
      auVar216._24_4_ = -0.00021219444;
      auVar216._28_4_ = -0.00021219444;
      auVar216._32_4_ = -0.00021219444;
      auVar216._36_4_ = -0.00021219444;
      auVar216._40_4_ = -0.00021219444;
      auVar216._44_4_ = -0.00021219444;
      auVar216._48_4_ = -0.00021219444;
      auVar216._52_4_ = -0.00021219444;
      auVar216._56_4_ = -0.00021219444;
      auVar216._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar216,auVar217,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_10ef8._0_4_ = 0.00019875691;
      uStack_10ef8._4_4_ = 0.00019875691;
      auStack_10f00._0_4_ = 0.00019875691;
      auStack_10f00._4_4_ = 0.00019875691;
      auVar76._16_4_ = 0.00019875691;
      auVar76._20_4_ = 0.00019875691;
      auVar76._0_16_ = _auStack_10f00;
      auVar76._24_4_ = 0.00019875691;
      auVar76._28_4_ = 0.00019875691;
      auVar76._32_4_ = 0.00019875691;
      auVar76._36_4_ = 0.00019875691;
      auVar76._40_4_ = 0.00019875691;
      auVar76._44_4_ = 0.00019875691;
      auVar76._48_4_ = 0.00019875691;
      auVar76._52_4_ = 0.00019875691;
      auVar76._56_4_ = 0.00019875691;
      auVar76._60_4_ = 0.00019875691;
      auVar75._8_4_ = 0.0013981999;
      auVar75._12_4_ = 0.0013981999;
      auVar75._0_4_ = 0.0013981999;
      auVar75._4_4_ = 0.0013981999;
      auVar75._16_4_ = 0.0013981999;
      auVar75._20_4_ = 0.0013981999;
      auVar75._24_4_ = 0.0013981999;
      auVar75._28_4_ = 0.0013981999;
      auVar75._32_4_ = 0.0013981999;
      auVar75._36_4_ = 0.0013981999;
      auVar75._40_4_ = 0.0013981999;
      auVar75._44_4_ = 0.0013981999;
      auVar75._48_4_ = 0.0013981999;
      auVar75._52_4_ = 0.0013981999;
      auVar75._56_4_ = 0.0013981999;
      auVar75._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar76,auVar75);
      auVar74._8_4_ = 0.008333452;
      auVar74._12_4_ = 0.008333452;
      auVar74._0_4_ = 0.008333452;
      auVar74._4_4_ = 0.008333452;
      auVar74._16_4_ = 0.008333452;
      auVar74._20_4_ = 0.008333452;
      auVar74._24_4_ = 0.008333452;
      auVar74._28_4_ = 0.008333452;
      auVar74._32_4_ = 0.008333452;
      auVar74._36_4_ = 0.008333452;
      auVar74._40_4_ = 0.008333452;
      auVar74._44_4_ = 0.008333452;
      auVar74._48_4_ = 0.008333452;
      auVar74._52_4_ = 0.008333452;
      auVar74._56_4_ = 0.008333452;
      auVar74._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar74);
      auVar73._8_4_ = 0.041665796;
      auVar73._12_4_ = 0.041665796;
      auVar73._0_4_ = 0.041665796;
      auVar73._4_4_ = 0.041665796;
      auVar73._16_4_ = 0.041665796;
      auVar73._20_4_ = 0.041665796;
      auVar73._24_4_ = 0.041665796;
      auVar73._28_4_ = 0.041665796;
      auVar73._32_4_ = 0.041665796;
      auVar73._36_4_ = 0.041665796;
      auVar73._40_4_ = 0.041665796;
      auVar73._44_4_ = 0.041665796;
      auVar73._48_4_ = 0.041665796;
      auVar73._52_4_ = 0.041665796;
      auVar73._56_4_ = 0.041665796;
      auVar73._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar73);
      auVar72._8_4_ = 0.16666666;
      auVar72._12_4_ = 0.16666666;
      auVar72._0_4_ = 0.16666666;
      auVar72._4_4_ = 0.16666666;
      auVar72._16_4_ = 0.16666666;
      auVar72._20_4_ = 0.16666666;
      auVar72._24_4_ = 0.16666666;
      auVar72._28_4_ = 0.16666666;
      auVar72._32_4_ = 0.16666666;
      auVar72._36_4_ = 0.16666666;
      auVar72._40_4_ = 0.16666666;
      auVar72._44_4_ = 0.16666666;
      auVar72._48_4_ = 0.16666666;
      auVar72._52_4_ = 0.16666666;
      auVar72._56_4_ = 0.16666666;
      auVar72._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar72);
      auVar71._8_4_ = 0.5;
      auVar71._12_4_ = 0.5;
      auVar71._0_4_ = 0.5;
      auVar71._4_4_ = 0.5;
      auVar71._16_4_ = 0.5;
      auVar71._20_4_ = 0.5;
      auVar71._24_4_ = 0.5;
      auVar71._28_4_ = 0.5;
      auVar71._32_4_ = 0.5;
      auVar71._36_4_ = 0.5;
      auVar71._40_4_ = 0.5;
      auVar71._44_4_ = 0.5;
      auVar71._48_4_ = 0.5;
      auVar71._52_4_ = 0.5;
      auVar71._56_4_ = 0.5;
      auVar71._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar71);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar21._8_4_ = 1.0;
      auVar21._12_4_ = 1.0;
      auVar21._0_4_ = 1.0;
      auVar21._4_4_ = 1.0;
      auVar21._16_4_ = 1.0;
      auVar21._20_4_ = 1.0;
      auVar21._24_4_ = 1.0;
      auVar21._28_4_ = 1.0;
      auVar21._32_4_ = 1.0;
      auVar21._36_4_ = 1.0;
      auVar21._40_4_ = 1.0;
      auVar21._44_4_ = 1.0;
      auVar21._48_4_ = 1.0;
      auVar21._52_4_ = 1.0;
      auVar21._56_4_ = 1.0;
      auVar21._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar21);
      auVar278._16_8_ = uStack_10df0;
      auVar278._0_16_ = auStack_10e00;
      auVar278._24_8_ = uStack_10de8;
      auVar278._32_8_ = uStack_10de0;
      auVar278._40_8_ = uStack_10dd8;
      auVar278._48_8_ = uStack_10dd0;
      auVar278._56_8_ = uStack_10dc8;
      auVar298 = vcvttps2dq_avx512f(auVar278);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar308 = vmulps_avx512f(auVar300,auVar298);
      auStack_10f00 = auVar308._0_8_;
      uStack_10ef8 = auVar308._8_8_;
      uStack_10ef0 = auVar308._16_8_;
      uStack_10ee8 = auVar308._24_8_;
      uStack_10ee0 = auVar308._32_8_;
      uStack_10ed8 = auVar308._40_8_;
      uStack_10ed0 = auVar308._48_8_;
      uStack_10ec8 = auVar308._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0xc)));
      auVar298 = vsubps_avx512f(pauStack_16650[3],auVar298);
      auVar41._8_4_ = 88.37626;
      auVar41._12_4_ = 88.37626;
      auVar41._0_4_ = 88.37626;
      auVar41._4_4_ = 88.37626;
      auVar41._16_4_ = 88.37626;
      auVar41._20_4_ = 88.37626;
      auVar41._24_4_ = 88.37626;
      auVar41._28_4_ = 88.37626;
      auVar41._32_4_ = 88.37626;
      auVar41._36_4_ = 88.37626;
      auVar41._40_4_ = 88.37626;
      auVar41._44_4_ = 88.37626;
      auVar41._48_4_ = 88.37626;
      auVar41._52_4_ = 88.37626;
      auVar41._56_4_ = 88.37626;
      auVar41._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar41);
      auVar309._8_4_ = -88.37626;
      auVar309._12_4_ = -88.37626;
      auVar309._0_4_ = -88.37626;
      auVar309._4_4_ = -88.37626;
      auVar309._16_4_ = -88.37626;
      auVar309._20_4_ = -88.37626;
      auVar309._24_4_ = -88.37626;
      auVar309._28_4_ = -88.37626;
      auVar309._32_4_ = -88.37626;
      auVar309._36_4_ = -88.37626;
      auVar309._40_4_ = -88.37626;
      auVar309._44_4_ = -88.37626;
      auVar309._48_4_ = -88.37626;
      auVar309._52_4_ = -88.37626;
      auVar309._56_4_ = -88.37626;
      auVar309._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar309);
      auVar86._8_4_ = 1.442695;
      auVar86._12_4_ = 1.442695;
      auVar86._0_4_ = 1.442695;
      auVar86._4_4_ = 1.442695;
      auVar86._16_4_ = 1.442695;
      auVar86._20_4_ = 1.442695;
      auVar86._24_4_ = 1.442695;
      auVar86._28_4_ = 1.442695;
      auVar86._32_4_ = 1.442695;
      auVar86._36_4_ = 1.442695;
      auVar86._40_4_ = 1.442695;
      auVar86._44_4_ = 1.442695;
      auVar86._48_4_ = 1.442695;
      auVar86._52_4_ = 1.442695;
      auVar86._56_4_ = 1.442695;
      auVar86._60_4_ = 1.442695;
      auVar85._8_4_ = 0.5;
      auVar85._12_4_ = 0.5;
      auVar85._0_4_ = 0.5;
      auVar85._4_4_ = 0.5;
      auVar85._16_4_ = 0.5;
      auVar85._20_4_ = 0.5;
      auVar85._24_4_ = 0.5;
      auVar85._28_4_ = 0.5;
      auVar85._32_4_ = 0.5;
      auVar85._36_4_ = 0.5;
      auVar85._40_4_ = 0.5;
      auVar85._44_4_ = 0.5;
      auVar85._48_4_ = 0.5;
      auVar85._52_4_ = 0.5;
      auVar85._56_4_ = 0.5;
      auVar85._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar86,auVar299,auVar85);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar194._8_4_ = 1.0;
      auVar194._12_4_ = 1.0;
      auVar194._0_4_ = 1.0;
      auVar194._4_4_ = 1.0;
      auVar194._16_4_ = 1.0;
      auVar194._20_4_ = 1.0;
      auVar194._24_4_ = 1.0;
      auVar194._28_4_ = 1.0;
      auVar194._32_4_ = 1.0;
      auVar194._36_4_ = 1.0;
      auVar194._40_4_ = 1.0;
      auVar194._44_4_ = 1.0;
      auVar194._48_4_ = 1.0;
      auVar194._52_4_ = 1.0;
      auVar194._56_4_ = 1.0;
      auVar194._60_4_ = 1.0;
      local_6840 = auVar300._0_4_;
      iStack_683c = auVar300._4_4_;
      iStack_6838 = auVar300._8_4_;
      iStack_6834 = auVar300._12_4_;
      iStack_6830 = auVar300._16_4_;
      iStack_682c = auVar300._20_4_;
      iStack_6828 = auVar300._24_4_;
      iStack_6824 = auVar300._28_4_;
      iStack_6820 = auVar300._32_4_;
      iStack_681c = auVar300._36_4_;
      iStack_6818 = auVar300._40_4_;
      iStack_6814 = auVar300._44_4_;
      iStack_6810 = auVar300._48_4_;
      iStack_680c = auVar300._52_4_;
      iStack_6808 = auVar300._56_4_;
      iStack_6804 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar194);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11080._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_683c;
      auStack_11080._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_6840;
      auStack_11080._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_6838;
      auStack_11080._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_6834;
      uStack_11070._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_6830;
      uStack_11070._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_682c;
      uStack_11068._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_6828;
      uStack_11068._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_6824;
      auVar297 = _auStack_11080;
      uStack_11060._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_6820;
      uStack_11060._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_681c;
      auVar294 = _auStack_11080;
      uStack_11058._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6818;
      uStack_11058._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6814;
      auVar295 = _auStack_11080;
      uStack_11050._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6810;
      uStack_11050._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_680c;
      auVar293 = _auStack_11080;
      uStack_11048._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6808;
      uStack_11048._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6804;
      auVar298 = _auStack_11080;
      uStack_11068 = auVar297._24_8_;
      uStack_11060 = auVar294._32_8_;
      uStack_11058 = auVar295._40_8_;
      uStack_11050 = auVar293._48_8_;
      uStack_11048 = auVar298._56_8_;
      auVar223._16_8_ = uStack_11070;
      auVar223._0_16_ = auStack_11080;
      auVar223._24_8_ = uStack_11068;
      auVar223._32_8_ = uStack_11060;
      auVar223._40_8_ = uStack_11058;
      auVar223._48_8_ = uStack_11050;
      auVar223._56_8_ = uStack_11048;
      auVar222._8_4_ = 0.6933594;
      auVar222._12_4_ = 0.6933594;
      auVar222._0_4_ = 0.6933594;
      auVar222._4_4_ = 0.6933594;
      auVar222._16_4_ = 0.6933594;
      auVar222._20_4_ = 0.6933594;
      auVar222._24_4_ = 0.6933594;
      auVar222._28_4_ = 0.6933594;
      auVar222._32_4_ = 0.6933594;
      auVar222._36_4_ = 0.6933594;
      auVar222._40_4_ = 0.6933594;
      auVar222._44_4_ = 0.6933594;
      auVar222._48_4_ = 0.6933594;
      auVar222._52_4_ = 0.6933594;
      auVar222._56_4_ = 0.6933594;
      auVar222._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar222,auVar223,auVar299);
      auVar221._16_8_ = uStack_11070;
      auVar221._0_16_ = auStack_11080;
      auVar221._24_8_ = uStack_11068;
      auVar221._32_8_ = uStack_11060;
      auVar221._40_8_ = uStack_11058;
      auVar221._48_8_ = uStack_11050;
      auVar221._56_8_ = uStack_11048;
      auVar220._8_4_ = -0.00021219444;
      auVar220._12_4_ = -0.00021219444;
      auVar220._0_4_ = -0.00021219444;
      auVar220._4_4_ = -0.00021219444;
      auVar220._16_4_ = -0.00021219444;
      auVar220._20_4_ = -0.00021219444;
      auVar220._24_4_ = -0.00021219444;
      auVar220._28_4_ = -0.00021219444;
      auVar220._32_4_ = -0.00021219444;
      auVar220._36_4_ = -0.00021219444;
      auVar220._40_4_ = -0.00021219444;
      auVar220._44_4_ = -0.00021219444;
      auVar220._48_4_ = -0.00021219444;
      auVar220._52_4_ = -0.00021219444;
      auVar220._56_4_ = -0.00021219444;
      auVar220._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar220,auVar221,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_11178._0_4_ = 0.00019875691;
      uStack_11178._4_4_ = 0.00019875691;
      auStack_11180._0_4_ = 0.00019875691;
      auStack_11180._4_4_ = 0.00019875691;
      auVar84._16_4_ = 0.00019875691;
      auVar84._20_4_ = 0.00019875691;
      auVar84._0_16_ = _auStack_11180;
      auVar84._24_4_ = 0.00019875691;
      auVar84._28_4_ = 0.00019875691;
      auVar84._32_4_ = 0.00019875691;
      auVar84._36_4_ = 0.00019875691;
      auVar84._40_4_ = 0.00019875691;
      auVar84._44_4_ = 0.00019875691;
      auVar84._48_4_ = 0.00019875691;
      auVar84._52_4_ = 0.00019875691;
      auVar84._56_4_ = 0.00019875691;
      auVar84._60_4_ = 0.00019875691;
      auVar83._8_4_ = 0.0013981999;
      auVar83._12_4_ = 0.0013981999;
      auVar83._0_4_ = 0.0013981999;
      auVar83._4_4_ = 0.0013981999;
      auVar83._16_4_ = 0.0013981999;
      auVar83._20_4_ = 0.0013981999;
      auVar83._24_4_ = 0.0013981999;
      auVar83._28_4_ = 0.0013981999;
      auVar83._32_4_ = 0.0013981999;
      auVar83._36_4_ = 0.0013981999;
      auVar83._40_4_ = 0.0013981999;
      auVar83._44_4_ = 0.0013981999;
      auVar83._48_4_ = 0.0013981999;
      auVar83._52_4_ = 0.0013981999;
      auVar83._56_4_ = 0.0013981999;
      auVar83._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar84,auVar83);
      auVar82._8_4_ = 0.008333452;
      auVar82._12_4_ = 0.008333452;
      auVar82._0_4_ = 0.008333452;
      auVar82._4_4_ = 0.008333452;
      auVar82._16_4_ = 0.008333452;
      auVar82._20_4_ = 0.008333452;
      auVar82._24_4_ = 0.008333452;
      auVar82._28_4_ = 0.008333452;
      auVar82._32_4_ = 0.008333452;
      auVar82._36_4_ = 0.008333452;
      auVar82._40_4_ = 0.008333452;
      auVar82._44_4_ = 0.008333452;
      auVar82._48_4_ = 0.008333452;
      auVar82._52_4_ = 0.008333452;
      auVar82._56_4_ = 0.008333452;
      auVar82._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar82);
      auVar81._8_4_ = 0.041665796;
      auVar81._12_4_ = 0.041665796;
      auVar81._0_4_ = 0.041665796;
      auVar81._4_4_ = 0.041665796;
      auVar81._16_4_ = 0.041665796;
      auVar81._20_4_ = 0.041665796;
      auVar81._24_4_ = 0.041665796;
      auVar81._28_4_ = 0.041665796;
      auVar81._32_4_ = 0.041665796;
      auVar81._36_4_ = 0.041665796;
      auVar81._40_4_ = 0.041665796;
      auVar81._44_4_ = 0.041665796;
      auVar81._48_4_ = 0.041665796;
      auVar81._52_4_ = 0.041665796;
      auVar81._56_4_ = 0.041665796;
      auVar81._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar81);
      auVar80._8_4_ = 0.16666666;
      auVar80._12_4_ = 0.16666666;
      auVar80._0_4_ = 0.16666666;
      auVar80._4_4_ = 0.16666666;
      auVar80._16_4_ = 0.16666666;
      auVar80._20_4_ = 0.16666666;
      auVar80._24_4_ = 0.16666666;
      auVar80._28_4_ = 0.16666666;
      auVar80._32_4_ = 0.16666666;
      auVar80._36_4_ = 0.16666666;
      auVar80._40_4_ = 0.16666666;
      auVar80._44_4_ = 0.16666666;
      auVar80._48_4_ = 0.16666666;
      auVar80._52_4_ = 0.16666666;
      auVar80._56_4_ = 0.16666666;
      auVar80._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar80);
      auVar79._8_4_ = 0.5;
      auVar79._12_4_ = 0.5;
      auVar79._0_4_ = 0.5;
      auVar79._4_4_ = 0.5;
      auVar79._16_4_ = 0.5;
      auVar79._20_4_ = 0.5;
      auVar79._24_4_ = 0.5;
      auVar79._28_4_ = 0.5;
      auVar79._32_4_ = 0.5;
      auVar79._36_4_ = 0.5;
      auVar79._40_4_ = 0.5;
      auVar79._44_4_ = 0.5;
      auVar79._48_4_ = 0.5;
      auVar79._52_4_ = 0.5;
      auVar79._56_4_ = 0.5;
      auVar79._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar79);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar22._8_4_ = 1.0;
      auVar22._12_4_ = 1.0;
      auVar22._0_4_ = 1.0;
      auVar22._4_4_ = 1.0;
      auVar22._16_4_ = 1.0;
      auVar22._20_4_ = 1.0;
      auVar22._24_4_ = 1.0;
      auVar22._28_4_ = 1.0;
      auVar22._32_4_ = 1.0;
      auVar22._36_4_ = 1.0;
      auVar22._40_4_ = 1.0;
      auVar22._44_4_ = 1.0;
      auVar22._48_4_ = 1.0;
      auVar22._52_4_ = 1.0;
      auVar22._56_4_ = 1.0;
      auVar22._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar22);
      auVar279._16_8_ = uStack_11070;
      auVar279._0_16_ = auStack_11080;
      auVar279._24_8_ = uStack_11068;
      auVar279._32_8_ = uStack_11060;
      auVar279._40_8_ = uStack_11058;
      auVar279._48_8_ = uStack_11050;
      auVar279._56_8_ = uStack_11048;
      auVar298 = vcvttps2dq_avx512f(auVar279);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar309 = vmulps_avx512f(auVar300,auVar298);
      auStack_11180 = auVar309._0_8_;
      uStack_11178 = auVar309._8_8_;
      uStack_11170 = auVar309._16_8_;
      uStack_11168 = auVar309._24_8_;
      uStack_11160 = auVar309._32_8_;
      uStack_11158 = auVar309._40_8_;
      uStack_11150 = auVar309._48_8_;
      uStack_11148 = auVar309._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x10)));
      auVar298 = vsubps_avx512f(pauStack_16650[4],auVar298);
      auVar42._8_4_ = 88.37626;
      auVar42._12_4_ = 88.37626;
      auVar42._0_4_ = 88.37626;
      auVar42._4_4_ = 88.37626;
      auVar42._16_4_ = 88.37626;
      auVar42._20_4_ = 88.37626;
      auVar42._24_4_ = 88.37626;
      auVar42._28_4_ = 88.37626;
      auVar42._32_4_ = 88.37626;
      auVar42._36_4_ = 88.37626;
      auVar42._40_4_ = 88.37626;
      auVar42._44_4_ = 88.37626;
      auVar42._48_4_ = 88.37626;
      auVar42._52_4_ = 88.37626;
      auVar42._56_4_ = 88.37626;
      auVar42._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar42);
      auVar310._8_4_ = -88.37626;
      auVar310._12_4_ = -88.37626;
      auVar310._0_4_ = -88.37626;
      auVar310._4_4_ = -88.37626;
      auVar310._16_4_ = -88.37626;
      auVar310._20_4_ = -88.37626;
      auVar310._24_4_ = -88.37626;
      auVar310._28_4_ = -88.37626;
      auVar310._32_4_ = -88.37626;
      auVar310._36_4_ = -88.37626;
      auVar310._40_4_ = -88.37626;
      auVar310._44_4_ = -88.37626;
      auVar310._48_4_ = -88.37626;
      auVar310._52_4_ = -88.37626;
      auVar310._56_4_ = -88.37626;
      auVar310._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar310);
      auVar94._8_4_ = 1.442695;
      auVar94._12_4_ = 1.442695;
      auVar94._0_4_ = 1.442695;
      auVar94._4_4_ = 1.442695;
      auVar94._16_4_ = 1.442695;
      auVar94._20_4_ = 1.442695;
      auVar94._24_4_ = 1.442695;
      auVar94._28_4_ = 1.442695;
      auVar94._32_4_ = 1.442695;
      auVar94._36_4_ = 1.442695;
      auVar94._40_4_ = 1.442695;
      auVar94._44_4_ = 1.442695;
      auVar94._48_4_ = 1.442695;
      auVar94._52_4_ = 1.442695;
      auVar94._56_4_ = 1.442695;
      auVar94._60_4_ = 1.442695;
      auVar93._8_4_ = 0.5;
      auVar93._12_4_ = 0.5;
      auVar93._0_4_ = 0.5;
      auVar93._4_4_ = 0.5;
      auVar93._16_4_ = 0.5;
      auVar93._20_4_ = 0.5;
      auVar93._24_4_ = 0.5;
      auVar93._28_4_ = 0.5;
      auVar93._32_4_ = 0.5;
      auVar93._36_4_ = 0.5;
      auVar93._40_4_ = 0.5;
      auVar93._44_4_ = 0.5;
      auVar93._48_4_ = 0.5;
      auVar93._52_4_ = 0.5;
      auVar93._56_4_ = 0.5;
      auVar93._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar94,auVar299,auVar93);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar195._8_4_ = 1.0;
      auVar195._12_4_ = 1.0;
      auVar195._0_4_ = 1.0;
      auVar195._4_4_ = 1.0;
      auVar195._16_4_ = 1.0;
      auVar195._20_4_ = 1.0;
      auVar195._24_4_ = 1.0;
      auVar195._28_4_ = 1.0;
      auVar195._32_4_ = 1.0;
      auVar195._36_4_ = 1.0;
      auVar195._40_4_ = 1.0;
      auVar195._44_4_ = 1.0;
      auVar195._48_4_ = 1.0;
      auVar195._52_4_ = 1.0;
      auVar195._56_4_ = 1.0;
      auVar195._60_4_ = 1.0;
      local_66c0 = auVar300._0_4_;
      iStack_66bc = auVar300._4_4_;
      iStack_66b8 = auVar300._8_4_;
      iStack_66b4 = auVar300._12_4_;
      iStack_66b0 = auVar300._16_4_;
      iStack_66ac = auVar300._20_4_;
      iStack_66a8 = auVar300._24_4_;
      iStack_66a4 = auVar300._28_4_;
      iStack_66a0 = auVar300._32_4_;
      iStack_669c = auVar300._36_4_;
      iStack_6698 = auVar300._40_4_;
      iStack_6694 = auVar300._44_4_;
      iStack_6690 = auVar300._48_4_;
      iStack_668c = auVar300._52_4_;
      iStack_6688 = auVar300._56_4_;
      iStack_6684 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar195);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11300._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_66bc;
      auStack_11300._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_66c0;
      auStack_11300._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_66b8;
      auStack_11300._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_66b4;
      uStack_112f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_66b0;
      uStack_112f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_66ac;
      uStack_112e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_66a8;
      uStack_112e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_66a4;
      auVar297 = _auStack_11300;
      uStack_112e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_66a0;
      uStack_112e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_669c;
      auVar294 = _auStack_11300;
      uStack_112d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6698;
      uStack_112d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6694;
      auVar295 = _auStack_11300;
      uStack_112d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6690;
      uStack_112d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_668c;
      auVar293 = _auStack_11300;
      uStack_112c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6688;
      uStack_112c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6684;
      auVar298 = _auStack_11300;
      uStack_112e8 = auVar297._24_8_;
      uStack_112e0 = auVar294._32_8_;
      uStack_112d8 = auVar295._40_8_;
      uStack_112d0 = auVar293._48_8_;
      uStack_112c8 = auVar298._56_8_;
      auVar227._16_8_ = uStack_112f0;
      auVar227._0_16_ = auStack_11300;
      auVar227._24_8_ = uStack_112e8;
      auVar227._32_8_ = uStack_112e0;
      auVar227._40_8_ = uStack_112d8;
      auVar227._48_8_ = uStack_112d0;
      auVar227._56_8_ = uStack_112c8;
      auVar226._8_4_ = 0.6933594;
      auVar226._12_4_ = 0.6933594;
      auVar226._0_4_ = 0.6933594;
      auVar226._4_4_ = 0.6933594;
      auVar226._16_4_ = 0.6933594;
      auVar226._20_4_ = 0.6933594;
      auVar226._24_4_ = 0.6933594;
      auVar226._28_4_ = 0.6933594;
      auVar226._32_4_ = 0.6933594;
      auVar226._36_4_ = 0.6933594;
      auVar226._40_4_ = 0.6933594;
      auVar226._44_4_ = 0.6933594;
      auVar226._48_4_ = 0.6933594;
      auVar226._52_4_ = 0.6933594;
      auVar226._56_4_ = 0.6933594;
      auVar226._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar226,auVar227,auVar299);
      auVar225._16_8_ = uStack_112f0;
      auVar225._0_16_ = auStack_11300;
      auVar225._24_8_ = uStack_112e8;
      auVar225._32_8_ = uStack_112e0;
      auVar225._40_8_ = uStack_112d8;
      auVar225._48_8_ = uStack_112d0;
      auVar225._56_8_ = uStack_112c8;
      auVar224._8_4_ = -0.00021219444;
      auVar224._12_4_ = -0.00021219444;
      auVar224._0_4_ = -0.00021219444;
      auVar224._4_4_ = -0.00021219444;
      auVar224._16_4_ = -0.00021219444;
      auVar224._20_4_ = -0.00021219444;
      auVar224._24_4_ = -0.00021219444;
      auVar224._28_4_ = -0.00021219444;
      auVar224._32_4_ = -0.00021219444;
      auVar224._36_4_ = -0.00021219444;
      auVar224._40_4_ = -0.00021219444;
      auVar224._44_4_ = -0.00021219444;
      auVar224._48_4_ = -0.00021219444;
      auVar224._52_4_ = -0.00021219444;
      auVar224._56_4_ = -0.00021219444;
      auVar224._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar224,auVar225,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_113f8._0_4_ = 0.00019875691;
      uStack_113f8._4_4_ = 0.00019875691;
      auStack_11400._0_4_ = 0.00019875691;
      auStack_11400._4_4_ = 0.00019875691;
      auVar92._16_4_ = 0.00019875691;
      auVar92._20_4_ = 0.00019875691;
      auVar92._0_16_ = _auStack_11400;
      auVar92._24_4_ = 0.00019875691;
      auVar92._28_4_ = 0.00019875691;
      auVar92._32_4_ = 0.00019875691;
      auVar92._36_4_ = 0.00019875691;
      auVar92._40_4_ = 0.00019875691;
      auVar92._44_4_ = 0.00019875691;
      auVar92._48_4_ = 0.00019875691;
      auVar92._52_4_ = 0.00019875691;
      auVar92._56_4_ = 0.00019875691;
      auVar92._60_4_ = 0.00019875691;
      auVar91._8_4_ = 0.0013981999;
      auVar91._12_4_ = 0.0013981999;
      auVar91._0_4_ = 0.0013981999;
      auVar91._4_4_ = 0.0013981999;
      auVar91._16_4_ = 0.0013981999;
      auVar91._20_4_ = 0.0013981999;
      auVar91._24_4_ = 0.0013981999;
      auVar91._28_4_ = 0.0013981999;
      auVar91._32_4_ = 0.0013981999;
      auVar91._36_4_ = 0.0013981999;
      auVar91._40_4_ = 0.0013981999;
      auVar91._44_4_ = 0.0013981999;
      auVar91._48_4_ = 0.0013981999;
      auVar91._52_4_ = 0.0013981999;
      auVar91._56_4_ = 0.0013981999;
      auVar91._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar92,auVar91);
      auVar90._8_4_ = 0.008333452;
      auVar90._12_4_ = 0.008333452;
      auVar90._0_4_ = 0.008333452;
      auVar90._4_4_ = 0.008333452;
      auVar90._16_4_ = 0.008333452;
      auVar90._20_4_ = 0.008333452;
      auVar90._24_4_ = 0.008333452;
      auVar90._28_4_ = 0.008333452;
      auVar90._32_4_ = 0.008333452;
      auVar90._36_4_ = 0.008333452;
      auVar90._40_4_ = 0.008333452;
      auVar90._44_4_ = 0.008333452;
      auVar90._48_4_ = 0.008333452;
      auVar90._52_4_ = 0.008333452;
      auVar90._56_4_ = 0.008333452;
      auVar90._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar90);
      auVar89._8_4_ = 0.041665796;
      auVar89._12_4_ = 0.041665796;
      auVar89._0_4_ = 0.041665796;
      auVar89._4_4_ = 0.041665796;
      auVar89._16_4_ = 0.041665796;
      auVar89._20_4_ = 0.041665796;
      auVar89._24_4_ = 0.041665796;
      auVar89._28_4_ = 0.041665796;
      auVar89._32_4_ = 0.041665796;
      auVar89._36_4_ = 0.041665796;
      auVar89._40_4_ = 0.041665796;
      auVar89._44_4_ = 0.041665796;
      auVar89._48_4_ = 0.041665796;
      auVar89._52_4_ = 0.041665796;
      auVar89._56_4_ = 0.041665796;
      auVar89._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar89);
      auVar88._8_4_ = 0.16666666;
      auVar88._12_4_ = 0.16666666;
      auVar88._0_4_ = 0.16666666;
      auVar88._4_4_ = 0.16666666;
      auVar88._16_4_ = 0.16666666;
      auVar88._20_4_ = 0.16666666;
      auVar88._24_4_ = 0.16666666;
      auVar88._28_4_ = 0.16666666;
      auVar88._32_4_ = 0.16666666;
      auVar88._36_4_ = 0.16666666;
      auVar88._40_4_ = 0.16666666;
      auVar88._44_4_ = 0.16666666;
      auVar88._48_4_ = 0.16666666;
      auVar88._52_4_ = 0.16666666;
      auVar88._56_4_ = 0.16666666;
      auVar88._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar88);
      auVar87._8_4_ = 0.5;
      auVar87._12_4_ = 0.5;
      auVar87._0_4_ = 0.5;
      auVar87._4_4_ = 0.5;
      auVar87._16_4_ = 0.5;
      auVar87._20_4_ = 0.5;
      auVar87._24_4_ = 0.5;
      auVar87._28_4_ = 0.5;
      auVar87._32_4_ = 0.5;
      auVar87._36_4_ = 0.5;
      auVar87._40_4_ = 0.5;
      auVar87._44_4_ = 0.5;
      auVar87._48_4_ = 0.5;
      auVar87._52_4_ = 0.5;
      auVar87._56_4_ = 0.5;
      auVar87._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar87);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar23._8_4_ = 1.0;
      auVar23._12_4_ = 1.0;
      auVar23._0_4_ = 1.0;
      auVar23._4_4_ = 1.0;
      auVar23._16_4_ = 1.0;
      auVar23._20_4_ = 1.0;
      auVar23._24_4_ = 1.0;
      auVar23._28_4_ = 1.0;
      auVar23._32_4_ = 1.0;
      auVar23._36_4_ = 1.0;
      auVar23._40_4_ = 1.0;
      auVar23._44_4_ = 1.0;
      auVar23._48_4_ = 1.0;
      auVar23._52_4_ = 1.0;
      auVar23._56_4_ = 1.0;
      auVar23._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar23);
      auVar280._16_8_ = uStack_112f0;
      auVar280._0_16_ = auStack_11300;
      auVar280._24_8_ = uStack_112e8;
      auVar280._32_8_ = uStack_112e0;
      auVar280._40_8_ = uStack_112d8;
      auVar280._48_8_ = uStack_112d0;
      auVar280._56_8_ = uStack_112c8;
      auVar298 = vcvttps2dq_avx512f(auVar280);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar310 = vmulps_avx512f(auVar300,auVar298);
      auStack_11400 = auVar310._0_8_;
      uStack_113f8 = auVar310._8_8_;
      uStack_113f0 = auVar310._16_8_;
      uStack_113e8 = auVar310._24_8_;
      uStack_113e0 = auVar310._32_8_;
      uStack_113d8 = auVar310._40_8_;
      uStack_113d0 = auVar310._48_8_;
      uStack_113c8 = auVar310._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x14)));
      auVar298 = vsubps_avx512f(pauStack_16650[5],auVar298);
      auVar43._8_4_ = 88.37626;
      auVar43._12_4_ = 88.37626;
      auVar43._0_4_ = 88.37626;
      auVar43._4_4_ = 88.37626;
      auVar43._16_4_ = 88.37626;
      auVar43._20_4_ = 88.37626;
      auVar43._24_4_ = 88.37626;
      auVar43._28_4_ = 88.37626;
      auVar43._32_4_ = 88.37626;
      auVar43._36_4_ = 88.37626;
      auVar43._40_4_ = 88.37626;
      auVar43._44_4_ = 88.37626;
      auVar43._48_4_ = 88.37626;
      auVar43._52_4_ = 88.37626;
      auVar43._56_4_ = 88.37626;
      auVar43._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar43);
      auVar311._8_4_ = -88.37626;
      auVar311._12_4_ = -88.37626;
      auVar311._0_4_ = -88.37626;
      auVar311._4_4_ = -88.37626;
      auVar311._16_4_ = -88.37626;
      auVar311._20_4_ = -88.37626;
      auVar311._24_4_ = -88.37626;
      auVar311._28_4_ = -88.37626;
      auVar311._32_4_ = -88.37626;
      auVar311._36_4_ = -88.37626;
      auVar311._40_4_ = -88.37626;
      auVar311._44_4_ = -88.37626;
      auVar311._48_4_ = -88.37626;
      auVar311._52_4_ = -88.37626;
      auVar311._56_4_ = -88.37626;
      auVar311._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar311);
      auVar102._8_4_ = 1.442695;
      auVar102._12_4_ = 1.442695;
      auVar102._0_4_ = 1.442695;
      auVar102._4_4_ = 1.442695;
      auVar102._16_4_ = 1.442695;
      auVar102._20_4_ = 1.442695;
      auVar102._24_4_ = 1.442695;
      auVar102._28_4_ = 1.442695;
      auVar102._32_4_ = 1.442695;
      auVar102._36_4_ = 1.442695;
      auVar102._40_4_ = 1.442695;
      auVar102._44_4_ = 1.442695;
      auVar102._48_4_ = 1.442695;
      auVar102._52_4_ = 1.442695;
      auVar102._56_4_ = 1.442695;
      auVar102._60_4_ = 1.442695;
      auVar101._8_4_ = 0.5;
      auVar101._12_4_ = 0.5;
      auVar101._0_4_ = 0.5;
      auVar101._4_4_ = 0.5;
      auVar101._16_4_ = 0.5;
      auVar101._20_4_ = 0.5;
      auVar101._24_4_ = 0.5;
      auVar101._28_4_ = 0.5;
      auVar101._32_4_ = 0.5;
      auVar101._36_4_ = 0.5;
      auVar101._40_4_ = 0.5;
      auVar101._44_4_ = 0.5;
      auVar101._48_4_ = 0.5;
      auVar101._52_4_ = 0.5;
      auVar101._56_4_ = 0.5;
      auVar101._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar102,auVar299,auVar101);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar196._8_4_ = 1.0;
      auVar196._12_4_ = 1.0;
      auVar196._0_4_ = 1.0;
      auVar196._4_4_ = 1.0;
      auVar196._16_4_ = 1.0;
      auVar196._20_4_ = 1.0;
      auVar196._24_4_ = 1.0;
      auVar196._28_4_ = 1.0;
      auVar196._32_4_ = 1.0;
      auVar196._36_4_ = 1.0;
      auVar196._40_4_ = 1.0;
      auVar196._44_4_ = 1.0;
      auVar196._48_4_ = 1.0;
      auVar196._52_4_ = 1.0;
      auVar196._56_4_ = 1.0;
      auVar196._60_4_ = 1.0;
      local_6540 = auVar300._0_4_;
      iStack_653c = auVar300._4_4_;
      iStack_6538 = auVar300._8_4_;
      iStack_6534 = auVar300._12_4_;
      iStack_6530 = auVar300._16_4_;
      iStack_652c = auVar300._20_4_;
      iStack_6528 = auVar300._24_4_;
      iStack_6524 = auVar300._28_4_;
      iStack_6520 = auVar300._32_4_;
      iStack_651c = auVar300._36_4_;
      iStack_6518 = auVar300._40_4_;
      iStack_6514 = auVar300._44_4_;
      iStack_6510 = auVar300._48_4_;
      iStack_650c = auVar300._52_4_;
      iStack_6508 = auVar300._56_4_;
      iStack_6504 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar196);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11580._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_653c;
      auStack_11580._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_6540;
      auStack_11580._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_6538;
      auStack_11580._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_6534;
      uStack_11570._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_6530;
      uStack_11570._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_652c;
      uStack_11568._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_6528;
      uStack_11568._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_6524;
      auVar297 = _auStack_11580;
      uStack_11560._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_6520;
      uStack_11560._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_651c;
      auVar294 = _auStack_11580;
      uStack_11558._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6518;
      uStack_11558._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6514;
      auVar295 = _auStack_11580;
      uStack_11550._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6510;
      uStack_11550._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_650c;
      auVar293 = _auStack_11580;
      uStack_11548._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6508;
      uStack_11548._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6504;
      auVar298 = _auStack_11580;
      uStack_11568 = auVar297._24_8_;
      uStack_11560 = auVar294._32_8_;
      uStack_11558 = auVar295._40_8_;
      uStack_11550 = auVar293._48_8_;
      uStack_11548 = auVar298._56_8_;
      auVar231._16_8_ = uStack_11570;
      auVar231._0_16_ = auStack_11580;
      auVar231._24_8_ = uStack_11568;
      auVar231._32_8_ = uStack_11560;
      auVar231._40_8_ = uStack_11558;
      auVar231._48_8_ = uStack_11550;
      auVar231._56_8_ = uStack_11548;
      auVar230._8_4_ = 0.6933594;
      auVar230._12_4_ = 0.6933594;
      auVar230._0_4_ = 0.6933594;
      auVar230._4_4_ = 0.6933594;
      auVar230._16_4_ = 0.6933594;
      auVar230._20_4_ = 0.6933594;
      auVar230._24_4_ = 0.6933594;
      auVar230._28_4_ = 0.6933594;
      auVar230._32_4_ = 0.6933594;
      auVar230._36_4_ = 0.6933594;
      auVar230._40_4_ = 0.6933594;
      auVar230._44_4_ = 0.6933594;
      auVar230._48_4_ = 0.6933594;
      auVar230._52_4_ = 0.6933594;
      auVar230._56_4_ = 0.6933594;
      auVar230._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar230,auVar231,auVar299);
      auVar229._16_8_ = uStack_11570;
      auVar229._0_16_ = auStack_11580;
      auVar229._24_8_ = uStack_11568;
      auVar229._32_8_ = uStack_11560;
      auVar229._40_8_ = uStack_11558;
      auVar229._48_8_ = uStack_11550;
      auVar229._56_8_ = uStack_11548;
      auVar228._8_4_ = -0.00021219444;
      auVar228._12_4_ = -0.00021219444;
      auVar228._0_4_ = -0.00021219444;
      auVar228._4_4_ = -0.00021219444;
      auVar228._16_4_ = -0.00021219444;
      auVar228._20_4_ = -0.00021219444;
      auVar228._24_4_ = -0.00021219444;
      auVar228._28_4_ = -0.00021219444;
      auVar228._32_4_ = -0.00021219444;
      auVar228._36_4_ = -0.00021219444;
      auVar228._40_4_ = -0.00021219444;
      auVar228._44_4_ = -0.00021219444;
      auVar228._48_4_ = -0.00021219444;
      auVar228._52_4_ = -0.00021219444;
      auVar228._56_4_ = -0.00021219444;
      auVar228._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar228,auVar229,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_11678._0_4_ = 0.00019875691;
      uStack_11678._4_4_ = 0.00019875691;
      auStack_11680._0_4_ = 0.00019875691;
      auStack_11680._4_4_ = 0.00019875691;
      auVar100._16_4_ = 0.00019875691;
      auVar100._20_4_ = 0.00019875691;
      auVar100._0_16_ = _auStack_11680;
      auVar100._24_4_ = 0.00019875691;
      auVar100._28_4_ = 0.00019875691;
      auVar100._32_4_ = 0.00019875691;
      auVar100._36_4_ = 0.00019875691;
      auVar100._40_4_ = 0.00019875691;
      auVar100._44_4_ = 0.00019875691;
      auVar100._48_4_ = 0.00019875691;
      auVar100._52_4_ = 0.00019875691;
      auVar100._56_4_ = 0.00019875691;
      auVar100._60_4_ = 0.00019875691;
      auVar99._8_4_ = 0.0013981999;
      auVar99._12_4_ = 0.0013981999;
      auVar99._0_4_ = 0.0013981999;
      auVar99._4_4_ = 0.0013981999;
      auVar99._16_4_ = 0.0013981999;
      auVar99._20_4_ = 0.0013981999;
      auVar99._24_4_ = 0.0013981999;
      auVar99._28_4_ = 0.0013981999;
      auVar99._32_4_ = 0.0013981999;
      auVar99._36_4_ = 0.0013981999;
      auVar99._40_4_ = 0.0013981999;
      auVar99._44_4_ = 0.0013981999;
      auVar99._48_4_ = 0.0013981999;
      auVar99._52_4_ = 0.0013981999;
      auVar99._56_4_ = 0.0013981999;
      auVar99._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar100,auVar99);
      auVar98._8_4_ = 0.008333452;
      auVar98._12_4_ = 0.008333452;
      auVar98._0_4_ = 0.008333452;
      auVar98._4_4_ = 0.008333452;
      auVar98._16_4_ = 0.008333452;
      auVar98._20_4_ = 0.008333452;
      auVar98._24_4_ = 0.008333452;
      auVar98._28_4_ = 0.008333452;
      auVar98._32_4_ = 0.008333452;
      auVar98._36_4_ = 0.008333452;
      auVar98._40_4_ = 0.008333452;
      auVar98._44_4_ = 0.008333452;
      auVar98._48_4_ = 0.008333452;
      auVar98._52_4_ = 0.008333452;
      auVar98._56_4_ = 0.008333452;
      auVar98._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar98);
      auVar97._8_4_ = 0.041665796;
      auVar97._12_4_ = 0.041665796;
      auVar97._0_4_ = 0.041665796;
      auVar97._4_4_ = 0.041665796;
      auVar97._16_4_ = 0.041665796;
      auVar97._20_4_ = 0.041665796;
      auVar97._24_4_ = 0.041665796;
      auVar97._28_4_ = 0.041665796;
      auVar97._32_4_ = 0.041665796;
      auVar97._36_4_ = 0.041665796;
      auVar97._40_4_ = 0.041665796;
      auVar97._44_4_ = 0.041665796;
      auVar97._48_4_ = 0.041665796;
      auVar97._52_4_ = 0.041665796;
      auVar97._56_4_ = 0.041665796;
      auVar97._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar97);
      auVar96._8_4_ = 0.16666666;
      auVar96._12_4_ = 0.16666666;
      auVar96._0_4_ = 0.16666666;
      auVar96._4_4_ = 0.16666666;
      auVar96._16_4_ = 0.16666666;
      auVar96._20_4_ = 0.16666666;
      auVar96._24_4_ = 0.16666666;
      auVar96._28_4_ = 0.16666666;
      auVar96._32_4_ = 0.16666666;
      auVar96._36_4_ = 0.16666666;
      auVar96._40_4_ = 0.16666666;
      auVar96._44_4_ = 0.16666666;
      auVar96._48_4_ = 0.16666666;
      auVar96._52_4_ = 0.16666666;
      auVar96._56_4_ = 0.16666666;
      auVar96._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar96);
      auVar95._8_4_ = 0.5;
      auVar95._12_4_ = 0.5;
      auVar95._0_4_ = 0.5;
      auVar95._4_4_ = 0.5;
      auVar95._16_4_ = 0.5;
      auVar95._20_4_ = 0.5;
      auVar95._24_4_ = 0.5;
      auVar95._28_4_ = 0.5;
      auVar95._32_4_ = 0.5;
      auVar95._36_4_ = 0.5;
      auVar95._40_4_ = 0.5;
      auVar95._44_4_ = 0.5;
      auVar95._48_4_ = 0.5;
      auVar95._52_4_ = 0.5;
      auVar95._56_4_ = 0.5;
      auVar95._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar95);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar24._8_4_ = 1.0;
      auVar24._12_4_ = 1.0;
      auVar24._0_4_ = 1.0;
      auVar24._4_4_ = 1.0;
      auVar24._16_4_ = 1.0;
      auVar24._20_4_ = 1.0;
      auVar24._24_4_ = 1.0;
      auVar24._28_4_ = 1.0;
      auVar24._32_4_ = 1.0;
      auVar24._36_4_ = 1.0;
      auVar24._40_4_ = 1.0;
      auVar24._44_4_ = 1.0;
      auVar24._48_4_ = 1.0;
      auVar24._52_4_ = 1.0;
      auVar24._56_4_ = 1.0;
      auVar24._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar24);
      auVar281._16_8_ = uStack_11570;
      auVar281._0_16_ = auStack_11580;
      auVar281._24_8_ = uStack_11568;
      auVar281._32_8_ = uStack_11560;
      auVar281._40_8_ = uStack_11558;
      auVar281._48_8_ = uStack_11550;
      auVar281._56_8_ = uStack_11548;
      auVar298 = vcvttps2dq_avx512f(auVar281);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar311 = vmulps_avx512f(auVar300,auVar298);
      auStack_11680 = auVar311._0_8_;
      uStack_11678 = auVar311._8_8_;
      uStack_11670 = auVar311._16_8_;
      uStack_11668 = auVar311._24_8_;
      uStack_11660 = auVar311._32_8_;
      uStack_11658 = auVar311._40_8_;
      uStack_11650 = auVar311._48_8_;
      uStack_11648 = auVar311._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x18)));
      auVar298 = vsubps_avx512f(pauStack_16650[6],auVar298);
      auVar44._8_4_ = 88.37626;
      auVar44._12_4_ = 88.37626;
      auVar44._0_4_ = 88.37626;
      auVar44._4_4_ = 88.37626;
      auVar44._16_4_ = 88.37626;
      auVar44._20_4_ = 88.37626;
      auVar44._24_4_ = 88.37626;
      auVar44._28_4_ = 88.37626;
      auVar44._32_4_ = 88.37626;
      auVar44._36_4_ = 88.37626;
      auVar44._40_4_ = 88.37626;
      auVar44._44_4_ = 88.37626;
      auVar44._48_4_ = 88.37626;
      auVar44._52_4_ = 88.37626;
      auVar44._56_4_ = 88.37626;
      auVar44._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar44);
      auVar312._8_4_ = -88.37626;
      auVar312._12_4_ = -88.37626;
      auVar312._0_4_ = -88.37626;
      auVar312._4_4_ = -88.37626;
      auVar312._16_4_ = -88.37626;
      auVar312._20_4_ = -88.37626;
      auVar312._24_4_ = -88.37626;
      auVar312._28_4_ = -88.37626;
      auVar312._32_4_ = -88.37626;
      auVar312._36_4_ = -88.37626;
      auVar312._40_4_ = -88.37626;
      auVar312._44_4_ = -88.37626;
      auVar312._48_4_ = -88.37626;
      auVar312._52_4_ = -88.37626;
      auVar312._56_4_ = -88.37626;
      auVar312._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar312);
      auVar110._8_4_ = 1.442695;
      auVar110._12_4_ = 1.442695;
      auVar110._0_4_ = 1.442695;
      auVar110._4_4_ = 1.442695;
      auVar110._16_4_ = 1.442695;
      auVar110._20_4_ = 1.442695;
      auVar110._24_4_ = 1.442695;
      auVar110._28_4_ = 1.442695;
      auVar110._32_4_ = 1.442695;
      auVar110._36_4_ = 1.442695;
      auVar110._40_4_ = 1.442695;
      auVar110._44_4_ = 1.442695;
      auVar110._48_4_ = 1.442695;
      auVar110._52_4_ = 1.442695;
      auVar110._56_4_ = 1.442695;
      auVar110._60_4_ = 1.442695;
      auVar109._8_4_ = 0.5;
      auVar109._12_4_ = 0.5;
      auVar109._0_4_ = 0.5;
      auVar109._4_4_ = 0.5;
      auVar109._16_4_ = 0.5;
      auVar109._20_4_ = 0.5;
      auVar109._24_4_ = 0.5;
      auVar109._28_4_ = 0.5;
      auVar109._32_4_ = 0.5;
      auVar109._36_4_ = 0.5;
      auVar109._40_4_ = 0.5;
      auVar109._44_4_ = 0.5;
      auVar109._48_4_ = 0.5;
      auVar109._52_4_ = 0.5;
      auVar109._56_4_ = 0.5;
      auVar109._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar110,auVar299,auVar109);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar197._8_4_ = 1.0;
      auVar197._12_4_ = 1.0;
      auVar197._0_4_ = 1.0;
      auVar197._4_4_ = 1.0;
      auVar197._16_4_ = 1.0;
      auVar197._20_4_ = 1.0;
      auVar197._24_4_ = 1.0;
      auVar197._28_4_ = 1.0;
      auVar197._32_4_ = 1.0;
      auVar197._36_4_ = 1.0;
      auVar197._40_4_ = 1.0;
      auVar197._44_4_ = 1.0;
      auVar197._48_4_ = 1.0;
      auVar197._52_4_ = 1.0;
      auVar197._56_4_ = 1.0;
      auVar197._60_4_ = 1.0;
      local_63c0 = auVar300._0_4_;
      iStack_63bc = auVar300._4_4_;
      iStack_63b8 = auVar300._8_4_;
      iStack_63b4 = auVar300._12_4_;
      iStack_63b0 = auVar300._16_4_;
      iStack_63ac = auVar300._20_4_;
      iStack_63a8 = auVar300._24_4_;
      iStack_63a4 = auVar300._28_4_;
      iStack_63a0 = auVar300._32_4_;
      iStack_639c = auVar300._36_4_;
      iStack_6398 = auVar300._40_4_;
      iStack_6394 = auVar300._44_4_;
      iStack_6390 = auVar300._48_4_;
      iStack_638c = auVar300._52_4_;
      iStack_6388 = auVar300._56_4_;
      iStack_6384 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar197);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11800._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_63bc;
      auStack_11800._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_63c0;
      auStack_11800._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_63b8;
      auStack_11800._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_63b4;
      uStack_117f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_63b0;
      uStack_117f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_63ac;
      uStack_117e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_63a8;
      uStack_117e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_63a4;
      auVar297 = _auStack_11800;
      uStack_117e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_63a0;
      uStack_117e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_639c;
      auVar294 = _auStack_11800;
      uStack_117d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6398;
      uStack_117d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6394;
      auVar295 = _auStack_11800;
      uStack_117d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6390;
      uStack_117d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_638c;
      auVar293 = _auStack_11800;
      uStack_117c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6388;
      uStack_117c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6384;
      auVar298 = _auStack_11800;
      uStack_117e8 = auVar297._24_8_;
      uStack_117e0 = auVar294._32_8_;
      uStack_117d8 = auVar295._40_8_;
      uStack_117d0 = auVar293._48_8_;
      uStack_117c8 = auVar298._56_8_;
      auVar235._16_8_ = uStack_117f0;
      auVar235._0_16_ = auStack_11800;
      auVar235._24_8_ = uStack_117e8;
      auVar235._32_8_ = uStack_117e0;
      auVar235._40_8_ = uStack_117d8;
      auVar235._48_8_ = uStack_117d0;
      auVar235._56_8_ = uStack_117c8;
      auVar234._8_4_ = 0.6933594;
      auVar234._12_4_ = 0.6933594;
      auVar234._0_4_ = 0.6933594;
      auVar234._4_4_ = 0.6933594;
      auVar234._16_4_ = 0.6933594;
      auVar234._20_4_ = 0.6933594;
      auVar234._24_4_ = 0.6933594;
      auVar234._28_4_ = 0.6933594;
      auVar234._32_4_ = 0.6933594;
      auVar234._36_4_ = 0.6933594;
      auVar234._40_4_ = 0.6933594;
      auVar234._44_4_ = 0.6933594;
      auVar234._48_4_ = 0.6933594;
      auVar234._52_4_ = 0.6933594;
      auVar234._56_4_ = 0.6933594;
      auVar234._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar234,auVar235,auVar299);
      auVar233._16_8_ = uStack_117f0;
      auVar233._0_16_ = auStack_11800;
      auVar233._24_8_ = uStack_117e8;
      auVar233._32_8_ = uStack_117e0;
      auVar233._40_8_ = uStack_117d8;
      auVar233._48_8_ = uStack_117d0;
      auVar233._56_8_ = uStack_117c8;
      auVar232._8_4_ = -0.00021219444;
      auVar232._12_4_ = -0.00021219444;
      auVar232._0_4_ = -0.00021219444;
      auVar232._4_4_ = -0.00021219444;
      auVar232._16_4_ = -0.00021219444;
      auVar232._20_4_ = -0.00021219444;
      auVar232._24_4_ = -0.00021219444;
      auVar232._28_4_ = -0.00021219444;
      auVar232._32_4_ = -0.00021219444;
      auVar232._36_4_ = -0.00021219444;
      auVar232._40_4_ = -0.00021219444;
      auVar232._44_4_ = -0.00021219444;
      auVar232._48_4_ = -0.00021219444;
      auVar232._52_4_ = -0.00021219444;
      auVar232._56_4_ = -0.00021219444;
      auVar232._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar232,auVar233,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_118f8._0_4_ = 0.00019875691;
      uStack_118f8._4_4_ = 0.00019875691;
      auStack_11900._0_4_ = 0.00019875691;
      auStack_11900._4_4_ = 0.00019875691;
      auVar108._16_4_ = 0.00019875691;
      auVar108._20_4_ = 0.00019875691;
      auVar108._0_16_ = _auStack_11900;
      auVar108._24_4_ = 0.00019875691;
      auVar108._28_4_ = 0.00019875691;
      auVar108._32_4_ = 0.00019875691;
      auVar108._36_4_ = 0.00019875691;
      auVar108._40_4_ = 0.00019875691;
      auVar108._44_4_ = 0.00019875691;
      auVar108._48_4_ = 0.00019875691;
      auVar108._52_4_ = 0.00019875691;
      auVar108._56_4_ = 0.00019875691;
      auVar108._60_4_ = 0.00019875691;
      auVar107._8_4_ = 0.0013981999;
      auVar107._12_4_ = 0.0013981999;
      auVar107._0_4_ = 0.0013981999;
      auVar107._4_4_ = 0.0013981999;
      auVar107._16_4_ = 0.0013981999;
      auVar107._20_4_ = 0.0013981999;
      auVar107._24_4_ = 0.0013981999;
      auVar107._28_4_ = 0.0013981999;
      auVar107._32_4_ = 0.0013981999;
      auVar107._36_4_ = 0.0013981999;
      auVar107._40_4_ = 0.0013981999;
      auVar107._44_4_ = 0.0013981999;
      auVar107._48_4_ = 0.0013981999;
      auVar107._52_4_ = 0.0013981999;
      auVar107._56_4_ = 0.0013981999;
      auVar107._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar108,auVar107);
      auVar106._8_4_ = 0.008333452;
      auVar106._12_4_ = 0.008333452;
      auVar106._0_4_ = 0.008333452;
      auVar106._4_4_ = 0.008333452;
      auVar106._16_4_ = 0.008333452;
      auVar106._20_4_ = 0.008333452;
      auVar106._24_4_ = 0.008333452;
      auVar106._28_4_ = 0.008333452;
      auVar106._32_4_ = 0.008333452;
      auVar106._36_4_ = 0.008333452;
      auVar106._40_4_ = 0.008333452;
      auVar106._44_4_ = 0.008333452;
      auVar106._48_4_ = 0.008333452;
      auVar106._52_4_ = 0.008333452;
      auVar106._56_4_ = 0.008333452;
      auVar106._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar106);
      auVar105._8_4_ = 0.041665796;
      auVar105._12_4_ = 0.041665796;
      auVar105._0_4_ = 0.041665796;
      auVar105._4_4_ = 0.041665796;
      auVar105._16_4_ = 0.041665796;
      auVar105._20_4_ = 0.041665796;
      auVar105._24_4_ = 0.041665796;
      auVar105._28_4_ = 0.041665796;
      auVar105._32_4_ = 0.041665796;
      auVar105._36_4_ = 0.041665796;
      auVar105._40_4_ = 0.041665796;
      auVar105._44_4_ = 0.041665796;
      auVar105._48_4_ = 0.041665796;
      auVar105._52_4_ = 0.041665796;
      auVar105._56_4_ = 0.041665796;
      auVar105._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar105);
      auVar104._8_4_ = 0.16666666;
      auVar104._12_4_ = 0.16666666;
      auVar104._0_4_ = 0.16666666;
      auVar104._4_4_ = 0.16666666;
      auVar104._16_4_ = 0.16666666;
      auVar104._20_4_ = 0.16666666;
      auVar104._24_4_ = 0.16666666;
      auVar104._28_4_ = 0.16666666;
      auVar104._32_4_ = 0.16666666;
      auVar104._36_4_ = 0.16666666;
      auVar104._40_4_ = 0.16666666;
      auVar104._44_4_ = 0.16666666;
      auVar104._48_4_ = 0.16666666;
      auVar104._52_4_ = 0.16666666;
      auVar104._56_4_ = 0.16666666;
      auVar104._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar104);
      auVar103._8_4_ = 0.5;
      auVar103._12_4_ = 0.5;
      auVar103._0_4_ = 0.5;
      auVar103._4_4_ = 0.5;
      auVar103._16_4_ = 0.5;
      auVar103._20_4_ = 0.5;
      auVar103._24_4_ = 0.5;
      auVar103._28_4_ = 0.5;
      auVar103._32_4_ = 0.5;
      auVar103._36_4_ = 0.5;
      auVar103._40_4_ = 0.5;
      auVar103._44_4_ = 0.5;
      auVar103._48_4_ = 0.5;
      auVar103._52_4_ = 0.5;
      auVar103._56_4_ = 0.5;
      auVar103._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar103);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar25._8_4_ = 1.0;
      auVar25._12_4_ = 1.0;
      auVar25._0_4_ = 1.0;
      auVar25._4_4_ = 1.0;
      auVar25._16_4_ = 1.0;
      auVar25._20_4_ = 1.0;
      auVar25._24_4_ = 1.0;
      auVar25._28_4_ = 1.0;
      auVar25._32_4_ = 1.0;
      auVar25._36_4_ = 1.0;
      auVar25._40_4_ = 1.0;
      auVar25._44_4_ = 1.0;
      auVar25._48_4_ = 1.0;
      auVar25._52_4_ = 1.0;
      auVar25._56_4_ = 1.0;
      auVar25._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar25);
      auVar282._16_8_ = uStack_117f0;
      auVar282._0_16_ = auStack_11800;
      auVar282._24_8_ = uStack_117e8;
      auVar282._32_8_ = uStack_117e0;
      auVar282._40_8_ = uStack_117d8;
      auVar282._48_8_ = uStack_117d0;
      auVar282._56_8_ = uStack_117c8;
      auVar298 = vcvttps2dq_avx512f(auVar282);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar312 = vmulps_avx512f(auVar300,auVar298);
      auStack_11900 = auVar312._0_8_;
      uStack_118f8 = auVar312._8_8_;
      uStack_118f0 = auVar312._16_8_;
      uStack_118e8 = auVar312._24_8_;
      uStack_118e0 = auVar312._32_8_;
      uStack_118d8 = auVar312._40_8_;
      uStack_118d0 = auVar312._48_8_;
      uStack_118c8 = auVar312._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x1c)));
      auVar298 = vsubps_avx512f(pauStack_16650[7],auVar298);
      auVar45._8_4_ = 88.37626;
      auVar45._12_4_ = 88.37626;
      auVar45._0_4_ = 88.37626;
      auVar45._4_4_ = 88.37626;
      auVar45._16_4_ = 88.37626;
      auVar45._20_4_ = 88.37626;
      auVar45._24_4_ = 88.37626;
      auVar45._28_4_ = 88.37626;
      auVar45._32_4_ = 88.37626;
      auVar45._36_4_ = 88.37626;
      auVar45._40_4_ = 88.37626;
      auVar45._44_4_ = 88.37626;
      auVar45._48_4_ = 88.37626;
      auVar45._52_4_ = 88.37626;
      auVar45._56_4_ = 88.37626;
      auVar45._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar45);
      auVar313._8_4_ = -88.37626;
      auVar313._12_4_ = -88.37626;
      auVar313._0_4_ = -88.37626;
      auVar313._4_4_ = -88.37626;
      auVar313._16_4_ = -88.37626;
      auVar313._20_4_ = -88.37626;
      auVar313._24_4_ = -88.37626;
      auVar313._28_4_ = -88.37626;
      auVar313._32_4_ = -88.37626;
      auVar313._36_4_ = -88.37626;
      auVar313._40_4_ = -88.37626;
      auVar313._44_4_ = -88.37626;
      auVar313._48_4_ = -88.37626;
      auVar313._52_4_ = -88.37626;
      auVar313._56_4_ = -88.37626;
      auVar313._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar313);
      auVar118._8_4_ = 1.442695;
      auVar118._12_4_ = 1.442695;
      auVar118._0_4_ = 1.442695;
      auVar118._4_4_ = 1.442695;
      auVar118._16_4_ = 1.442695;
      auVar118._20_4_ = 1.442695;
      auVar118._24_4_ = 1.442695;
      auVar118._28_4_ = 1.442695;
      auVar118._32_4_ = 1.442695;
      auVar118._36_4_ = 1.442695;
      auVar118._40_4_ = 1.442695;
      auVar118._44_4_ = 1.442695;
      auVar118._48_4_ = 1.442695;
      auVar118._52_4_ = 1.442695;
      auVar118._56_4_ = 1.442695;
      auVar118._60_4_ = 1.442695;
      auVar117._8_4_ = 0.5;
      auVar117._12_4_ = 0.5;
      auVar117._0_4_ = 0.5;
      auVar117._4_4_ = 0.5;
      auVar117._16_4_ = 0.5;
      auVar117._20_4_ = 0.5;
      auVar117._24_4_ = 0.5;
      auVar117._28_4_ = 0.5;
      auVar117._32_4_ = 0.5;
      auVar117._36_4_ = 0.5;
      auVar117._40_4_ = 0.5;
      auVar117._44_4_ = 0.5;
      auVar117._48_4_ = 0.5;
      auVar117._52_4_ = 0.5;
      auVar117._56_4_ = 0.5;
      auVar117._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar118,auVar299,auVar117);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar198._8_4_ = 1.0;
      auVar198._12_4_ = 1.0;
      auVar198._0_4_ = 1.0;
      auVar198._4_4_ = 1.0;
      auVar198._16_4_ = 1.0;
      auVar198._20_4_ = 1.0;
      auVar198._24_4_ = 1.0;
      auVar198._28_4_ = 1.0;
      auVar198._32_4_ = 1.0;
      auVar198._36_4_ = 1.0;
      auVar198._40_4_ = 1.0;
      auVar198._44_4_ = 1.0;
      auVar198._48_4_ = 1.0;
      auVar198._52_4_ = 1.0;
      auVar198._56_4_ = 1.0;
      auVar198._60_4_ = 1.0;
      local_6240 = auVar300._0_4_;
      iStack_623c = auVar300._4_4_;
      iStack_6238 = auVar300._8_4_;
      iStack_6234 = auVar300._12_4_;
      iStack_6230 = auVar300._16_4_;
      iStack_622c = auVar300._20_4_;
      iStack_6228 = auVar300._24_4_;
      iStack_6224 = auVar300._28_4_;
      iStack_6220 = auVar300._32_4_;
      iStack_621c = auVar300._36_4_;
      iStack_6218 = auVar300._40_4_;
      iStack_6214 = auVar300._44_4_;
      iStack_6210 = auVar300._48_4_;
      iStack_620c = auVar300._52_4_;
      iStack_6208 = auVar300._56_4_;
      iStack_6204 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar198);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11a80._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_623c;
      auStack_11a80._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_6240;
      auStack_11a80._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_6238;
      auStack_11a80._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_6234;
      uStack_11a70._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_6230;
      uStack_11a70._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_622c;
      uStack_11a68._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_6228;
      uStack_11a68._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_6224;
      auVar297 = _auStack_11a80;
      uStack_11a60._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_6220;
      uStack_11a60._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_621c;
      auVar294 = _auStack_11a80;
      uStack_11a58._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6218;
      uStack_11a58._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6214;
      auVar295 = _auStack_11a80;
      uStack_11a50._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6210;
      uStack_11a50._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_620c;
      auVar293 = _auStack_11a80;
      uStack_11a48._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6208;
      uStack_11a48._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6204;
      auVar298 = _auStack_11a80;
      uStack_11a68 = auVar297._24_8_;
      uStack_11a60 = auVar294._32_8_;
      uStack_11a58 = auVar295._40_8_;
      uStack_11a50 = auVar293._48_8_;
      uStack_11a48 = auVar298._56_8_;
      auVar239._16_8_ = uStack_11a70;
      auVar239._0_16_ = auStack_11a80;
      auVar239._24_8_ = uStack_11a68;
      auVar239._32_8_ = uStack_11a60;
      auVar239._40_8_ = uStack_11a58;
      auVar239._48_8_ = uStack_11a50;
      auVar239._56_8_ = uStack_11a48;
      auVar238._8_4_ = 0.6933594;
      auVar238._12_4_ = 0.6933594;
      auVar238._0_4_ = 0.6933594;
      auVar238._4_4_ = 0.6933594;
      auVar238._16_4_ = 0.6933594;
      auVar238._20_4_ = 0.6933594;
      auVar238._24_4_ = 0.6933594;
      auVar238._28_4_ = 0.6933594;
      auVar238._32_4_ = 0.6933594;
      auVar238._36_4_ = 0.6933594;
      auVar238._40_4_ = 0.6933594;
      auVar238._44_4_ = 0.6933594;
      auVar238._48_4_ = 0.6933594;
      auVar238._52_4_ = 0.6933594;
      auVar238._56_4_ = 0.6933594;
      auVar238._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar238,auVar239,auVar299);
      auVar237._16_8_ = uStack_11a70;
      auVar237._0_16_ = auStack_11a80;
      auVar237._24_8_ = uStack_11a68;
      auVar237._32_8_ = uStack_11a60;
      auVar237._40_8_ = uStack_11a58;
      auVar237._48_8_ = uStack_11a50;
      auVar237._56_8_ = uStack_11a48;
      auVar236._8_4_ = -0.00021219444;
      auVar236._12_4_ = -0.00021219444;
      auVar236._0_4_ = -0.00021219444;
      auVar236._4_4_ = -0.00021219444;
      auVar236._16_4_ = -0.00021219444;
      auVar236._20_4_ = -0.00021219444;
      auVar236._24_4_ = -0.00021219444;
      auVar236._28_4_ = -0.00021219444;
      auVar236._32_4_ = -0.00021219444;
      auVar236._36_4_ = -0.00021219444;
      auVar236._40_4_ = -0.00021219444;
      auVar236._44_4_ = -0.00021219444;
      auVar236._48_4_ = -0.00021219444;
      auVar236._52_4_ = -0.00021219444;
      auVar236._56_4_ = -0.00021219444;
      auVar236._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar236,auVar237,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_11b78._0_4_ = 0.00019875691;
      uStack_11b78._4_4_ = 0.00019875691;
      auStack_11b80._0_4_ = 0.00019875691;
      auStack_11b80._4_4_ = 0.00019875691;
      auVar116._16_4_ = 0.00019875691;
      auVar116._20_4_ = 0.00019875691;
      auVar116._0_16_ = _auStack_11b80;
      auVar116._24_4_ = 0.00019875691;
      auVar116._28_4_ = 0.00019875691;
      auVar116._32_4_ = 0.00019875691;
      auVar116._36_4_ = 0.00019875691;
      auVar116._40_4_ = 0.00019875691;
      auVar116._44_4_ = 0.00019875691;
      auVar116._48_4_ = 0.00019875691;
      auVar116._52_4_ = 0.00019875691;
      auVar116._56_4_ = 0.00019875691;
      auVar116._60_4_ = 0.00019875691;
      auVar115._8_4_ = 0.0013981999;
      auVar115._12_4_ = 0.0013981999;
      auVar115._0_4_ = 0.0013981999;
      auVar115._4_4_ = 0.0013981999;
      auVar115._16_4_ = 0.0013981999;
      auVar115._20_4_ = 0.0013981999;
      auVar115._24_4_ = 0.0013981999;
      auVar115._28_4_ = 0.0013981999;
      auVar115._32_4_ = 0.0013981999;
      auVar115._36_4_ = 0.0013981999;
      auVar115._40_4_ = 0.0013981999;
      auVar115._44_4_ = 0.0013981999;
      auVar115._48_4_ = 0.0013981999;
      auVar115._52_4_ = 0.0013981999;
      auVar115._56_4_ = 0.0013981999;
      auVar115._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar116,auVar115);
      auVar114._8_4_ = 0.008333452;
      auVar114._12_4_ = 0.008333452;
      auVar114._0_4_ = 0.008333452;
      auVar114._4_4_ = 0.008333452;
      auVar114._16_4_ = 0.008333452;
      auVar114._20_4_ = 0.008333452;
      auVar114._24_4_ = 0.008333452;
      auVar114._28_4_ = 0.008333452;
      auVar114._32_4_ = 0.008333452;
      auVar114._36_4_ = 0.008333452;
      auVar114._40_4_ = 0.008333452;
      auVar114._44_4_ = 0.008333452;
      auVar114._48_4_ = 0.008333452;
      auVar114._52_4_ = 0.008333452;
      auVar114._56_4_ = 0.008333452;
      auVar114._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar114);
      auVar113._8_4_ = 0.041665796;
      auVar113._12_4_ = 0.041665796;
      auVar113._0_4_ = 0.041665796;
      auVar113._4_4_ = 0.041665796;
      auVar113._16_4_ = 0.041665796;
      auVar113._20_4_ = 0.041665796;
      auVar113._24_4_ = 0.041665796;
      auVar113._28_4_ = 0.041665796;
      auVar113._32_4_ = 0.041665796;
      auVar113._36_4_ = 0.041665796;
      auVar113._40_4_ = 0.041665796;
      auVar113._44_4_ = 0.041665796;
      auVar113._48_4_ = 0.041665796;
      auVar113._52_4_ = 0.041665796;
      auVar113._56_4_ = 0.041665796;
      auVar113._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar113);
      auVar112._8_4_ = 0.16666666;
      auVar112._12_4_ = 0.16666666;
      auVar112._0_4_ = 0.16666666;
      auVar112._4_4_ = 0.16666666;
      auVar112._16_4_ = 0.16666666;
      auVar112._20_4_ = 0.16666666;
      auVar112._24_4_ = 0.16666666;
      auVar112._28_4_ = 0.16666666;
      auVar112._32_4_ = 0.16666666;
      auVar112._36_4_ = 0.16666666;
      auVar112._40_4_ = 0.16666666;
      auVar112._44_4_ = 0.16666666;
      auVar112._48_4_ = 0.16666666;
      auVar112._52_4_ = 0.16666666;
      auVar112._56_4_ = 0.16666666;
      auVar112._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar112);
      auVar111._8_4_ = 0.5;
      auVar111._12_4_ = 0.5;
      auVar111._0_4_ = 0.5;
      auVar111._4_4_ = 0.5;
      auVar111._16_4_ = 0.5;
      auVar111._20_4_ = 0.5;
      auVar111._24_4_ = 0.5;
      auVar111._28_4_ = 0.5;
      auVar111._32_4_ = 0.5;
      auVar111._36_4_ = 0.5;
      auVar111._40_4_ = 0.5;
      auVar111._44_4_ = 0.5;
      auVar111._48_4_ = 0.5;
      auVar111._52_4_ = 0.5;
      auVar111._56_4_ = 0.5;
      auVar111._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar111);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar26._8_4_ = 1.0;
      auVar26._12_4_ = 1.0;
      auVar26._0_4_ = 1.0;
      auVar26._4_4_ = 1.0;
      auVar26._16_4_ = 1.0;
      auVar26._20_4_ = 1.0;
      auVar26._24_4_ = 1.0;
      auVar26._28_4_ = 1.0;
      auVar26._32_4_ = 1.0;
      auVar26._36_4_ = 1.0;
      auVar26._40_4_ = 1.0;
      auVar26._44_4_ = 1.0;
      auVar26._48_4_ = 1.0;
      auVar26._52_4_ = 1.0;
      auVar26._56_4_ = 1.0;
      auVar26._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar26);
      auVar283._16_8_ = uStack_11a70;
      auVar283._0_16_ = auStack_11a80;
      auVar283._24_8_ = uStack_11a68;
      auVar283._32_8_ = uStack_11a60;
      auVar283._40_8_ = uStack_11a58;
      auVar283._48_8_ = uStack_11a50;
      auVar283._56_8_ = uStack_11a48;
      auVar298 = vcvttps2dq_avx512f(auVar283);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar313 = vmulps_avx512f(auVar300,auVar298);
      auStack_11b80 = auVar313._0_8_;
      uStack_11b78 = auVar313._8_8_;
      uStack_11b70 = auVar313._16_8_;
      uStack_11b68 = auVar313._24_8_;
      uStack_11b60 = auVar313._32_8_;
      uStack_11b58 = auVar313._40_8_;
      uStack_11b50 = auVar313._48_8_;
      uStack_11b48 = auVar313._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x20)));
      auVar298 = vsubps_avx512f(pauStack_16650[8],auVar298);
      auVar46._8_4_ = 88.37626;
      auVar46._12_4_ = 88.37626;
      auVar46._0_4_ = 88.37626;
      auVar46._4_4_ = 88.37626;
      auVar46._16_4_ = 88.37626;
      auVar46._20_4_ = 88.37626;
      auVar46._24_4_ = 88.37626;
      auVar46._28_4_ = 88.37626;
      auVar46._32_4_ = 88.37626;
      auVar46._36_4_ = 88.37626;
      auVar46._40_4_ = 88.37626;
      auVar46._44_4_ = 88.37626;
      auVar46._48_4_ = 88.37626;
      auVar46._52_4_ = 88.37626;
      auVar46._56_4_ = 88.37626;
      auVar46._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar46);
      auVar305._8_4_ = -88.37626;
      auVar305._12_4_ = -88.37626;
      auVar305._0_4_ = -88.37626;
      auVar305._4_4_ = -88.37626;
      auVar305._16_4_ = -88.37626;
      auVar305._20_4_ = -88.37626;
      auVar305._24_4_ = -88.37626;
      auVar305._28_4_ = -88.37626;
      auVar305._32_4_ = -88.37626;
      auVar305._36_4_ = -88.37626;
      auVar305._40_4_ = -88.37626;
      auVar305._44_4_ = -88.37626;
      auVar305._48_4_ = -88.37626;
      auVar305._52_4_ = -88.37626;
      auVar305._56_4_ = -88.37626;
      auVar305._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar305);
      auVar126._8_4_ = 1.442695;
      auVar126._12_4_ = 1.442695;
      auVar126._0_4_ = 1.442695;
      auVar126._4_4_ = 1.442695;
      auVar126._16_4_ = 1.442695;
      auVar126._20_4_ = 1.442695;
      auVar126._24_4_ = 1.442695;
      auVar126._28_4_ = 1.442695;
      auVar126._32_4_ = 1.442695;
      auVar126._36_4_ = 1.442695;
      auVar126._40_4_ = 1.442695;
      auVar126._44_4_ = 1.442695;
      auVar126._48_4_ = 1.442695;
      auVar126._52_4_ = 1.442695;
      auVar126._56_4_ = 1.442695;
      auVar126._60_4_ = 1.442695;
      auVar125._8_4_ = 0.5;
      auVar125._12_4_ = 0.5;
      auVar125._0_4_ = 0.5;
      auVar125._4_4_ = 0.5;
      auVar125._16_4_ = 0.5;
      auVar125._20_4_ = 0.5;
      auVar125._24_4_ = 0.5;
      auVar125._28_4_ = 0.5;
      auVar125._32_4_ = 0.5;
      auVar125._36_4_ = 0.5;
      auVar125._40_4_ = 0.5;
      auVar125._44_4_ = 0.5;
      auVar125._48_4_ = 0.5;
      auVar125._52_4_ = 0.5;
      auVar125._56_4_ = 0.5;
      auVar125._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar126,auVar299,auVar125);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar199._8_4_ = 1.0;
      auVar199._12_4_ = 1.0;
      auVar199._0_4_ = 1.0;
      auVar199._4_4_ = 1.0;
      auVar199._16_4_ = 1.0;
      auVar199._20_4_ = 1.0;
      auVar199._24_4_ = 1.0;
      auVar199._28_4_ = 1.0;
      auVar199._32_4_ = 1.0;
      auVar199._36_4_ = 1.0;
      auVar199._40_4_ = 1.0;
      auVar199._44_4_ = 1.0;
      auVar199._48_4_ = 1.0;
      auVar199._52_4_ = 1.0;
      auVar199._56_4_ = 1.0;
      auVar199._60_4_ = 1.0;
      local_60c0 = auVar300._0_4_;
      iStack_60bc = auVar300._4_4_;
      iStack_60b8 = auVar300._8_4_;
      iStack_60b4 = auVar300._12_4_;
      iStack_60b0 = auVar300._16_4_;
      iStack_60ac = auVar300._20_4_;
      iStack_60a8 = auVar300._24_4_;
      iStack_60a4 = auVar300._28_4_;
      iStack_60a0 = auVar300._32_4_;
      iStack_609c = auVar300._36_4_;
      iStack_6098 = auVar300._40_4_;
      iStack_6094 = auVar300._44_4_;
      iStack_6090 = auVar300._48_4_;
      iStack_608c = auVar300._52_4_;
      iStack_6088 = auVar300._56_4_;
      iStack_6084 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar199);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11d00._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_60bc;
      auStack_11d00._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_60c0;
      auStack_11d00._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_60b8;
      auStack_11d00._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_60b4;
      uStack_11cf0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_60b0;
      uStack_11cf0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_60ac;
      uStack_11ce8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_60a8;
      uStack_11ce8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_60a4;
      auVar297 = _auStack_11d00;
      uStack_11ce0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_60a0;
      uStack_11ce0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_609c;
      auVar294 = _auStack_11d00;
      uStack_11cd8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_6098;
      uStack_11cd8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_6094;
      auVar295 = _auStack_11d00;
      uStack_11cd0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_6090;
      uStack_11cd0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_608c;
      auVar293 = _auStack_11d00;
      uStack_11cc8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_6088;
      uStack_11cc8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_6084;
      auVar298 = _auStack_11d00;
      uStack_11ce8 = auVar297._24_8_;
      uStack_11ce0 = auVar294._32_8_;
      uStack_11cd8 = auVar295._40_8_;
      uStack_11cd0 = auVar293._48_8_;
      uStack_11cc8 = auVar298._56_8_;
      auVar243._16_8_ = uStack_11cf0;
      auVar243._0_16_ = auStack_11d00;
      auVar243._24_8_ = uStack_11ce8;
      auVar243._32_8_ = uStack_11ce0;
      auVar243._40_8_ = uStack_11cd8;
      auVar243._48_8_ = uStack_11cd0;
      auVar243._56_8_ = uStack_11cc8;
      auVar242._8_4_ = 0.6933594;
      auVar242._12_4_ = 0.6933594;
      auVar242._0_4_ = 0.6933594;
      auVar242._4_4_ = 0.6933594;
      auVar242._16_4_ = 0.6933594;
      auVar242._20_4_ = 0.6933594;
      auVar242._24_4_ = 0.6933594;
      auVar242._28_4_ = 0.6933594;
      auVar242._32_4_ = 0.6933594;
      auVar242._36_4_ = 0.6933594;
      auVar242._40_4_ = 0.6933594;
      auVar242._44_4_ = 0.6933594;
      auVar242._48_4_ = 0.6933594;
      auVar242._52_4_ = 0.6933594;
      auVar242._56_4_ = 0.6933594;
      auVar242._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar242,auVar243,auVar299);
      auVar241._16_8_ = uStack_11cf0;
      auVar241._0_16_ = auStack_11d00;
      auVar241._24_8_ = uStack_11ce8;
      auVar241._32_8_ = uStack_11ce0;
      auVar241._40_8_ = uStack_11cd8;
      auVar241._48_8_ = uStack_11cd0;
      auVar241._56_8_ = uStack_11cc8;
      auVar240._8_4_ = -0.00021219444;
      auVar240._12_4_ = -0.00021219444;
      auVar240._0_4_ = -0.00021219444;
      auVar240._4_4_ = -0.00021219444;
      auVar240._16_4_ = -0.00021219444;
      auVar240._20_4_ = -0.00021219444;
      auVar240._24_4_ = -0.00021219444;
      auVar240._28_4_ = -0.00021219444;
      auVar240._32_4_ = -0.00021219444;
      auVar240._36_4_ = -0.00021219444;
      auVar240._40_4_ = -0.00021219444;
      auVar240._44_4_ = -0.00021219444;
      auVar240._48_4_ = -0.00021219444;
      auVar240._52_4_ = -0.00021219444;
      auVar240._56_4_ = -0.00021219444;
      auVar240._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar240,auVar241,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_11df8._0_4_ = 0.00019875691;
      uStack_11df8._4_4_ = 0.00019875691;
      auStack_11e00._0_4_ = 0.00019875691;
      auStack_11e00._4_4_ = 0.00019875691;
      auVar124._16_4_ = 0.00019875691;
      auVar124._20_4_ = 0.00019875691;
      auVar124._0_16_ = _auStack_11e00;
      auVar124._24_4_ = 0.00019875691;
      auVar124._28_4_ = 0.00019875691;
      auVar124._32_4_ = 0.00019875691;
      auVar124._36_4_ = 0.00019875691;
      auVar124._40_4_ = 0.00019875691;
      auVar124._44_4_ = 0.00019875691;
      auVar124._48_4_ = 0.00019875691;
      auVar124._52_4_ = 0.00019875691;
      auVar124._56_4_ = 0.00019875691;
      auVar124._60_4_ = 0.00019875691;
      auVar123._8_4_ = 0.0013981999;
      auVar123._12_4_ = 0.0013981999;
      auVar123._0_4_ = 0.0013981999;
      auVar123._4_4_ = 0.0013981999;
      auVar123._16_4_ = 0.0013981999;
      auVar123._20_4_ = 0.0013981999;
      auVar123._24_4_ = 0.0013981999;
      auVar123._28_4_ = 0.0013981999;
      auVar123._32_4_ = 0.0013981999;
      auVar123._36_4_ = 0.0013981999;
      auVar123._40_4_ = 0.0013981999;
      auVar123._44_4_ = 0.0013981999;
      auVar123._48_4_ = 0.0013981999;
      auVar123._52_4_ = 0.0013981999;
      auVar123._56_4_ = 0.0013981999;
      auVar123._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar124,auVar123);
      auVar122._8_4_ = 0.008333452;
      auVar122._12_4_ = 0.008333452;
      auVar122._0_4_ = 0.008333452;
      auVar122._4_4_ = 0.008333452;
      auVar122._16_4_ = 0.008333452;
      auVar122._20_4_ = 0.008333452;
      auVar122._24_4_ = 0.008333452;
      auVar122._28_4_ = 0.008333452;
      auVar122._32_4_ = 0.008333452;
      auVar122._36_4_ = 0.008333452;
      auVar122._40_4_ = 0.008333452;
      auVar122._44_4_ = 0.008333452;
      auVar122._48_4_ = 0.008333452;
      auVar122._52_4_ = 0.008333452;
      auVar122._56_4_ = 0.008333452;
      auVar122._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar122);
      auVar121._8_4_ = 0.041665796;
      auVar121._12_4_ = 0.041665796;
      auVar121._0_4_ = 0.041665796;
      auVar121._4_4_ = 0.041665796;
      auVar121._16_4_ = 0.041665796;
      auVar121._20_4_ = 0.041665796;
      auVar121._24_4_ = 0.041665796;
      auVar121._28_4_ = 0.041665796;
      auVar121._32_4_ = 0.041665796;
      auVar121._36_4_ = 0.041665796;
      auVar121._40_4_ = 0.041665796;
      auVar121._44_4_ = 0.041665796;
      auVar121._48_4_ = 0.041665796;
      auVar121._52_4_ = 0.041665796;
      auVar121._56_4_ = 0.041665796;
      auVar121._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar121);
      auVar120._8_4_ = 0.16666666;
      auVar120._12_4_ = 0.16666666;
      auVar120._0_4_ = 0.16666666;
      auVar120._4_4_ = 0.16666666;
      auVar120._16_4_ = 0.16666666;
      auVar120._20_4_ = 0.16666666;
      auVar120._24_4_ = 0.16666666;
      auVar120._28_4_ = 0.16666666;
      auVar120._32_4_ = 0.16666666;
      auVar120._36_4_ = 0.16666666;
      auVar120._40_4_ = 0.16666666;
      auVar120._44_4_ = 0.16666666;
      auVar120._48_4_ = 0.16666666;
      auVar120._52_4_ = 0.16666666;
      auVar120._56_4_ = 0.16666666;
      auVar120._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar120);
      auVar119._8_4_ = 0.5;
      auVar119._12_4_ = 0.5;
      auVar119._0_4_ = 0.5;
      auVar119._4_4_ = 0.5;
      auVar119._16_4_ = 0.5;
      auVar119._20_4_ = 0.5;
      auVar119._24_4_ = 0.5;
      auVar119._28_4_ = 0.5;
      auVar119._32_4_ = 0.5;
      auVar119._36_4_ = 0.5;
      auVar119._40_4_ = 0.5;
      auVar119._44_4_ = 0.5;
      auVar119._48_4_ = 0.5;
      auVar119._52_4_ = 0.5;
      auVar119._56_4_ = 0.5;
      auVar119._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar119);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar27._8_4_ = 1.0;
      auVar27._12_4_ = 1.0;
      auVar27._0_4_ = 1.0;
      auVar27._4_4_ = 1.0;
      auVar27._16_4_ = 1.0;
      auVar27._20_4_ = 1.0;
      auVar27._24_4_ = 1.0;
      auVar27._28_4_ = 1.0;
      auVar27._32_4_ = 1.0;
      auVar27._36_4_ = 1.0;
      auVar27._40_4_ = 1.0;
      auVar27._44_4_ = 1.0;
      auVar27._48_4_ = 1.0;
      auVar27._52_4_ = 1.0;
      auVar27._56_4_ = 1.0;
      auVar27._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar27);
      auVar284._16_8_ = uStack_11cf0;
      auVar284._0_16_ = auStack_11d00;
      auVar284._24_8_ = uStack_11ce8;
      auVar284._32_8_ = uStack_11ce0;
      auVar284._40_8_ = uStack_11cd8;
      auVar284._48_8_ = uStack_11cd0;
      auVar284._56_8_ = uStack_11cc8;
      auVar298 = vcvttps2dq_avx512f(auVar284);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar305 = vmulps_avx512f(auVar300,auVar298);
      auStack_11e00 = auVar305._0_8_;
      uStack_11df8 = auVar305._8_8_;
      uStack_11df0 = auVar305._16_8_;
      uStack_11de8 = auVar305._24_8_;
      uStack_11de0 = auVar305._32_8_;
      uStack_11dd8 = auVar305._40_8_;
      uStack_11dd0 = auVar305._48_8_;
      uStack_11dc8 = auVar305._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x24)));
      auVar298 = vsubps_avx512f(pauStack_16650[9],auVar298);
      auVar47._8_4_ = 88.37626;
      auVar47._12_4_ = 88.37626;
      auVar47._0_4_ = 88.37626;
      auVar47._4_4_ = 88.37626;
      auVar47._16_4_ = 88.37626;
      auVar47._20_4_ = 88.37626;
      auVar47._24_4_ = 88.37626;
      auVar47._28_4_ = 88.37626;
      auVar47._32_4_ = 88.37626;
      auVar47._36_4_ = 88.37626;
      auVar47._40_4_ = 88.37626;
      auVar47._44_4_ = 88.37626;
      auVar47._48_4_ = 88.37626;
      auVar47._52_4_ = 88.37626;
      auVar47._56_4_ = 88.37626;
      auVar47._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar47);
      auVar304._8_4_ = -88.37626;
      auVar304._12_4_ = -88.37626;
      auVar304._0_4_ = -88.37626;
      auVar304._4_4_ = -88.37626;
      auVar304._16_4_ = -88.37626;
      auVar304._20_4_ = -88.37626;
      auVar304._24_4_ = -88.37626;
      auVar304._28_4_ = -88.37626;
      auVar304._32_4_ = -88.37626;
      auVar304._36_4_ = -88.37626;
      auVar304._40_4_ = -88.37626;
      auVar304._44_4_ = -88.37626;
      auVar304._48_4_ = -88.37626;
      auVar304._52_4_ = -88.37626;
      auVar304._56_4_ = -88.37626;
      auVar304._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar304);
      auVar134._8_4_ = 1.442695;
      auVar134._12_4_ = 1.442695;
      auVar134._0_4_ = 1.442695;
      auVar134._4_4_ = 1.442695;
      auVar134._16_4_ = 1.442695;
      auVar134._20_4_ = 1.442695;
      auVar134._24_4_ = 1.442695;
      auVar134._28_4_ = 1.442695;
      auVar134._32_4_ = 1.442695;
      auVar134._36_4_ = 1.442695;
      auVar134._40_4_ = 1.442695;
      auVar134._44_4_ = 1.442695;
      auVar134._48_4_ = 1.442695;
      auVar134._52_4_ = 1.442695;
      auVar134._56_4_ = 1.442695;
      auVar134._60_4_ = 1.442695;
      auVar133._8_4_ = 0.5;
      auVar133._12_4_ = 0.5;
      auVar133._0_4_ = 0.5;
      auVar133._4_4_ = 0.5;
      auVar133._16_4_ = 0.5;
      auVar133._20_4_ = 0.5;
      auVar133._24_4_ = 0.5;
      auVar133._28_4_ = 0.5;
      auVar133._32_4_ = 0.5;
      auVar133._36_4_ = 0.5;
      auVar133._40_4_ = 0.5;
      auVar133._44_4_ = 0.5;
      auVar133._48_4_ = 0.5;
      auVar133._52_4_ = 0.5;
      auVar133._56_4_ = 0.5;
      auVar133._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar134,auVar299,auVar133);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar200._8_4_ = 1.0;
      auVar200._12_4_ = 1.0;
      auVar200._0_4_ = 1.0;
      auVar200._4_4_ = 1.0;
      auVar200._16_4_ = 1.0;
      auVar200._20_4_ = 1.0;
      auVar200._24_4_ = 1.0;
      auVar200._28_4_ = 1.0;
      auVar200._32_4_ = 1.0;
      auVar200._36_4_ = 1.0;
      auVar200._40_4_ = 1.0;
      auVar200._44_4_ = 1.0;
      auVar200._48_4_ = 1.0;
      auVar200._52_4_ = 1.0;
      auVar200._56_4_ = 1.0;
      auVar200._60_4_ = 1.0;
      local_5f40 = auVar300._0_4_;
      iStack_5f3c = auVar300._4_4_;
      iStack_5f38 = auVar300._8_4_;
      iStack_5f34 = auVar300._12_4_;
      iStack_5f30 = auVar300._16_4_;
      iStack_5f2c = auVar300._20_4_;
      iStack_5f28 = auVar300._24_4_;
      iStack_5f24 = auVar300._28_4_;
      iStack_5f20 = auVar300._32_4_;
      iStack_5f1c = auVar300._36_4_;
      iStack_5f18 = auVar300._40_4_;
      iStack_5f14 = auVar300._44_4_;
      iStack_5f10 = auVar300._48_4_;
      iStack_5f0c = auVar300._52_4_;
      iStack_5f08 = auVar300._56_4_;
      iStack_5f04 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar200);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_11f80._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_5f3c;
      auStack_11f80._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5f40;
      auStack_11f80._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5f38;
      auStack_11f80._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5f34;
      uStack_11f70._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5f30;
      uStack_11f70._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_5f2c;
      uStack_11f68._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5f28;
      uStack_11f68._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5f24;
      auVar297 = _auStack_11f80;
      uStack_11f60._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5f20;
      uStack_11f60._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_5f1c;
      auVar294 = _auStack_11f80;
      uStack_11f58._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5f18;
      uStack_11f58._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5f14;
      auVar295 = _auStack_11f80;
      uStack_11f50._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5f10;
      uStack_11f50._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_5f0c;
      auVar293 = _auStack_11f80;
      uStack_11f48._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5f08;
      uStack_11f48._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5f04;
      auVar298 = _auStack_11f80;
      uStack_11f68 = auVar297._24_8_;
      uStack_11f60 = auVar294._32_8_;
      uStack_11f58 = auVar295._40_8_;
      uStack_11f50 = auVar293._48_8_;
      uStack_11f48 = auVar298._56_8_;
      auVar247._16_8_ = uStack_11f70;
      auVar247._0_16_ = auStack_11f80;
      auVar247._24_8_ = uStack_11f68;
      auVar247._32_8_ = uStack_11f60;
      auVar247._40_8_ = uStack_11f58;
      auVar247._48_8_ = uStack_11f50;
      auVar247._56_8_ = uStack_11f48;
      auVar246._8_4_ = 0.6933594;
      auVar246._12_4_ = 0.6933594;
      auVar246._0_4_ = 0.6933594;
      auVar246._4_4_ = 0.6933594;
      auVar246._16_4_ = 0.6933594;
      auVar246._20_4_ = 0.6933594;
      auVar246._24_4_ = 0.6933594;
      auVar246._28_4_ = 0.6933594;
      auVar246._32_4_ = 0.6933594;
      auVar246._36_4_ = 0.6933594;
      auVar246._40_4_ = 0.6933594;
      auVar246._44_4_ = 0.6933594;
      auVar246._48_4_ = 0.6933594;
      auVar246._52_4_ = 0.6933594;
      auVar246._56_4_ = 0.6933594;
      auVar246._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar246,auVar247,auVar299);
      auVar245._16_8_ = uStack_11f70;
      auVar245._0_16_ = auStack_11f80;
      auVar245._24_8_ = uStack_11f68;
      auVar245._32_8_ = uStack_11f60;
      auVar245._40_8_ = uStack_11f58;
      auVar245._48_8_ = uStack_11f50;
      auVar245._56_8_ = uStack_11f48;
      auVar244._8_4_ = -0.00021219444;
      auVar244._12_4_ = -0.00021219444;
      auVar244._0_4_ = -0.00021219444;
      auVar244._4_4_ = -0.00021219444;
      auVar244._16_4_ = -0.00021219444;
      auVar244._20_4_ = -0.00021219444;
      auVar244._24_4_ = -0.00021219444;
      auVar244._28_4_ = -0.00021219444;
      auVar244._32_4_ = -0.00021219444;
      auVar244._36_4_ = -0.00021219444;
      auVar244._40_4_ = -0.00021219444;
      auVar244._44_4_ = -0.00021219444;
      auVar244._48_4_ = -0.00021219444;
      auVar244._52_4_ = -0.00021219444;
      auVar244._56_4_ = -0.00021219444;
      auVar244._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar244,auVar245,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_12078._0_4_ = 0.00019875691;
      uStack_12078._4_4_ = 0.00019875691;
      auStack_12080._0_4_ = 0.00019875691;
      auStack_12080._4_4_ = 0.00019875691;
      auVar132._16_4_ = 0.00019875691;
      auVar132._20_4_ = 0.00019875691;
      auVar132._0_16_ = _auStack_12080;
      auVar132._24_4_ = 0.00019875691;
      auVar132._28_4_ = 0.00019875691;
      auVar132._32_4_ = 0.00019875691;
      auVar132._36_4_ = 0.00019875691;
      auVar132._40_4_ = 0.00019875691;
      auVar132._44_4_ = 0.00019875691;
      auVar132._48_4_ = 0.00019875691;
      auVar132._52_4_ = 0.00019875691;
      auVar132._56_4_ = 0.00019875691;
      auVar132._60_4_ = 0.00019875691;
      auVar131._8_4_ = 0.0013981999;
      auVar131._12_4_ = 0.0013981999;
      auVar131._0_4_ = 0.0013981999;
      auVar131._4_4_ = 0.0013981999;
      auVar131._16_4_ = 0.0013981999;
      auVar131._20_4_ = 0.0013981999;
      auVar131._24_4_ = 0.0013981999;
      auVar131._28_4_ = 0.0013981999;
      auVar131._32_4_ = 0.0013981999;
      auVar131._36_4_ = 0.0013981999;
      auVar131._40_4_ = 0.0013981999;
      auVar131._44_4_ = 0.0013981999;
      auVar131._48_4_ = 0.0013981999;
      auVar131._52_4_ = 0.0013981999;
      auVar131._56_4_ = 0.0013981999;
      auVar131._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar132,auVar131);
      auVar130._8_4_ = 0.008333452;
      auVar130._12_4_ = 0.008333452;
      auVar130._0_4_ = 0.008333452;
      auVar130._4_4_ = 0.008333452;
      auVar130._16_4_ = 0.008333452;
      auVar130._20_4_ = 0.008333452;
      auVar130._24_4_ = 0.008333452;
      auVar130._28_4_ = 0.008333452;
      auVar130._32_4_ = 0.008333452;
      auVar130._36_4_ = 0.008333452;
      auVar130._40_4_ = 0.008333452;
      auVar130._44_4_ = 0.008333452;
      auVar130._48_4_ = 0.008333452;
      auVar130._52_4_ = 0.008333452;
      auVar130._56_4_ = 0.008333452;
      auVar130._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar130);
      auVar129._8_4_ = 0.041665796;
      auVar129._12_4_ = 0.041665796;
      auVar129._0_4_ = 0.041665796;
      auVar129._4_4_ = 0.041665796;
      auVar129._16_4_ = 0.041665796;
      auVar129._20_4_ = 0.041665796;
      auVar129._24_4_ = 0.041665796;
      auVar129._28_4_ = 0.041665796;
      auVar129._32_4_ = 0.041665796;
      auVar129._36_4_ = 0.041665796;
      auVar129._40_4_ = 0.041665796;
      auVar129._44_4_ = 0.041665796;
      auVar129._48_4_ = 0.041665796;
      auVar129._52_4_ = 0.041665796;
      auVar129._56_4_ = 0.041665796;
      auVar129._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar129);
      auVar128._8_4_ = 0.16666666;
      auVar128._12_4_ = 0.16666666;
      auVar128._0_4_ = 0.16666666;
      auVar128._4_4_ = 0.16666666;
      auVar128._16_4_ = 0.16666666;
      auVar128._20_4_ = 0.16666666;
      auVar128._24_4_ = 0.16666666;
      auVar128._28_4_ = 0.16666666;
      auVar128._32_4_ = 0.16666666;
      auVar128._36_4_ = 0.16666666;
      auVar128._40_4_ = 0.16666666;
      auVar128._44_4_ = 0.16666666;
      auVar128._48_4_ = 0.16666666;
      auVar128._52_4_ = 0.16666666;
      auVar128._56_4_ = 0.16666666;
      auVar128._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar128);
      auVar127._8_4_ = 0.5;
      auVar127._12_4_ = 0.5;
      auVar127._0_4_ = 0.5;
      auVar127._4_4_ = 0.5;
      auVar127._16_4_ = 0.5;
      auVar127._20_4_ = 0.5;
      auVar127._24_4_ = 0.5;
      auVar127._28_4_ = 0.5;
      auVar127._32_4_ = 0.5;
      auVar127._36_4_ = 0.5;
      auVar127._40_4_ = 0.5;
      auVar127._44_4_ = 0.5;
      auVar127._48_4_ = 0.5;
      auVar127._52_4_ = 0.5;
      auVar127._56_4_ = 0.5;
      auVar127._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar127);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar28._8_4_ = 1.0;
      auVar28._12_4_ = 1.0;
      auVar28._0_4_ = 1.0;
      auVar28._4_4_ = 1.0;
      auVar28._16_4_ = 1.0;
      auVar28._20_4_ = 1.0;
      auVar28._24_4_ = 1.0;
      auVar28._28_4_ = 1.0;
      auVar28._32_4_ = 1.0;
      auVar28._36_4_ = 1.0;
      auVar28._40_4_ = 1.0;
      auVar28._44_4_ = 1.0;
      auVar28._48_4_ = 1.0;
      auVar28._52_4_ = 1.0;
      auVar28._56_4_ = 1.0;
      auVar28._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar28);
      auVar285._16_8_ = uStack_11f70;
      auVar285._0_16_ = auStack_11f80;
      auVar285._24_8_ = uStack_11f68;
      auVar285._32_8_ = uStack_11f60;
      auVar285._40_8_ = uStack_11f58;
      auVar285._48_8_ = uStack_11f50;
      auVar285._56_8_ = uStack_11f48;
      auVar298 = vcvttps2dq_avx512f(auVar285);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar304 = vmulps_avx512f(auVar300,auVar298);
      auStack_12080 = auVar304._0_8_;
      uStack_12078 = auVar304._8_8_;
      uStack_12070 = auVar304._16_8_;
      uStack_12068 = auVar304._24_8_;
      uStack_12060 = auVar304._32_8_;
      uStack_12058 = auVar304._40_8_;
      uStack_12050 = auVar304._48_8_;
      uStack_12048 = auVar304._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x28)));
      auVar298 = vsubps_avx512f(pauStack_16650[10],auVar298);
      auVar48._8_4_ = 88.37626;
      auVar48._12_4_ = 88.37626;
      auVar48._0_4_ = 88.37626;
      auVar48._4_4_ = 88.37626;
      auVar48._16_4_ = 88.37626;
      auVar48._20_4_ = 88.37626;
      auVar48._24_4_ = 88.37626;
      auVar48._28_4_ = 88.37626;
      auVar48._32_4_ = 88.37626;
      auVar48._36_4_ = 88.37626;
      auVar48._40_4_ = 88.37626;
      auVar48._44_4_ = 88.37626;
      auVar48._48_4_ = 88.37626;
      auVar48._52_4_ = 88.37626;
      auVar48._56_4_ = 88.37626;
      auVar48._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar48);
      auVar303._8_4_ = -88.37626;
      auVar303._12_4_ = -88.37626;
      auVar303._0_4_ = -88.37626;
      auVar303._4_4_ = -88.37626;
      auVar303._16_4_ = -88.37626;
      auVar303._20_4_ = -88.37626;
      auVar303._24_4_ = -88.37626;
      auVar303._28_4_ = -88.37626;
      auVar303._32_4_ = -88.37626;
      auVar303._36_4_ = -88.37626;
      auVar303._40_4_ = -88.37626;
      auVar303._44_4_ = -88.37626;
      auVar303._48_4_ = -88.37626;
      auVar303._52_4_ = -88.37626;
      auVar303._56_4_ = -88.37626;
      auVar303._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar303);
      auVar142._8_4_ = 1.442695;
      auVar142._12_4_ = 1.442695;
      auVar142._0_4_ = 1.442695;
      auVar142._4_4_ = 1.442695;
      auVar142._16_4_ = 1.442695;
      auVar142._20_4_ = 1.442695;
      auVar142._24_4_ = 1.442695;
      auVar142._28_4_ = 1.442695;
      auVar142._32_4_ = 1.442695;
      auVar142._36_4_ = 1.442695;
      auVar142._40_4_ = 1.442695;
      auVar142._44_4_ = 1.442695;
      auVar142._48_4_ = 1.442695;
      auVar142._52_4_ = 1.442695;
      auVar142._56_4_ = 1.442695;
      auVar142._60_4_ = 1.442695;
      auVar141._8_4_ = 0.5;
      auVar141._12_4_ = 0.5;
      auVar141._0_4_ = 0.5;
      auVar141._4_4_ = 0.5;
      auVar141._16_4_ = 0.5;
      auVar141._20_4_ = 0.5;
      auVar141._24_4_ = 0.5;
      auVar141._28_4_ = 0.5;
      auVar141._32_4_ = 0.5;
      auVar141._36_4_ = 0.5;
      auVar141._40_4_ = 0.5;
      auVar141._44_4_ = 0.5;
      auVar141._48_4_ = 0.5;
      auVar141._52_4_ = 0.5;
      auVar141._56_4_ = 0.5;
      auVar141._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar142,auVar299,auVar141);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar201._8_4_ = 1.0;
      auVar201._12_4_ = 1.0;
      auVar201._0_4_ = 1.0;
      auVar201._4_4_ = 1.0;
      auVar201._16_4_ = 1.0;
      auVar201._20_4_ = 1.0;
      auVar201._24_4_ = 1.0;
      auVar201._28_4_ = 1.0;
      auVar201._32_4_ = 1.0;
      auVar201._36_4_ = 1.0;
      auVar201._40_4_ = 1.0;
      auVar201._44_4_ = 1.0;
      auVar201._48_4_ = 1.0;
      auVar201._52_4_ = 1.0;
      auVar201._56_4_ = 1.0;
      auVar201._60_4_ = 1.0;
      local_5dc0 = auVar300._0_4_;
      iStack_5dbc = auVar300._4_4_;
      iStack_5db8 = auVar300._8_4_;
      iStack_5db4 = auVar300._12_4_;
      iStack_5db0 = auVar300._16_4_;
      iStack_5dac = auVar300._20_4_;
      iStack_5da8 = auVar300._24_4_;
      iStack_5da4 = auVar300._28_4_;
      iStack_5da0 = auVar300._32_4_;
      iStack_5d9c = auVar300._36_4_;
      iStack_5d98 = auVar300._40_4_;
      iStack_5d94 = auVar300._44_4_;
      iStack_5d90 = auVar300._48_4_;
      iStack_5d8c = auVar300._52_4_;
      iStack_5d88 = auVar300._56_4_;
      iStack_5d84 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar201);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12200._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_5dbc;
      auStack_12200._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5dc0;
      auStack_12200._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5db8;
      auStack_12200._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5db4;
      uStack_121f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5db0;
      uStack_121f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_5dac;
      uStack_121e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5da8;
      uStack_121e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5da4;
      auVar297 = _auStack_12200;
      uStack_121e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5da0;
      uStack_121e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_5d9c;
      auVar294 = _auStack_12200;
      uStack_121d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5d98;
      uStack_121d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5d94;
      auVar295 = _auStack_12200;
      uStack_121d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5d90;
      uStack_121d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_5d8c;
      auVar293 = _auStack_12200;
      uStack_121c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5d88;
      uStack_121c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5d84;
      auVar298 = _auStack_12200;
      uStack_121e8 = auVar297._24_8_;
      uStack_121e0 = auVar294._32_8_;
      uStack_121d8 = auVar295._40_8_;
      uStack_121d0 = auVar293._48_8_;
      uStack_121c8 = auVar298._56_8_;
      auVar251._16_8_ = uStack_121f0;
      auVar251._0_16_ = auStack_12200;
      auVar251._24_8_ = uStack_121e8;
      auVar251._32_8_ = uStack_121e0;
      auVar251._40_8_ = uStack_121d8;
      auVar251._48_8_ = uStack_121d0;
      auVar251._56_8_ = uStack_121c8;
      auVar250._8_4_ = 0.6933594;
      auVar250._12_4_ = 0.6933594;
      auVar250._0_4_ = 0.6933594;
      auVar250._4_4_ = 0.6933594;
      auVar250._16_4_ = 0.6933594;
      auVar250._20_4_ = 0.6933594;
      auVar250._24_4_ = 0.6933594;
      auVar250._28_4_ = 0.6933594;
      auVar250._32_4_ = 0.6933594;
      auVar250._36_4_ = 0.6933594;
      auVar250._40_4_ = 0.6933594;
      auVar250._44_4_ = 0.6933594;
      auVar250._48_4_ = 0.6933594;
      auVar250._52_4_ = 0.6933594;
      auVar250._56_4_ = 0.6933594;
      auVar250._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar250,auVar251,auVar299);
      auVar249._16_8_ = uStack_121f0;
      auVar249._0_16_ = auStack_12200;
      auVar249._24_8_ = uStack_121e8;
      auVar249._32_8_ = uStack_121e0;
      auVar249._40_8_ = uStack_121d8;
      auVar249._48_8_ = uStack_121d0;
      auVar249._56_8_ = uStack_121c8;
      auVar248._8_4_ = -0.00021219444;
      auVar248._12_4_ = -0.00021219444;
      auVar248._0_4_ = -0.00021219444;
      auVar248._4_4_ = -0.00021219444;
      auVar248._16_4_ = -0.00021219444;
      auVar248._20_4_ = -0.00021219444;
      auVar248._24_4_ = -0.00021219444;
      auVar248._28_4_ = -0.00021219444;
      auVar248._32_4_ = -0.00021219444;
      auVar248._36_4_ = -0.00021219444;
      auVar248._40_4_ = -0.00021219444;
      auVar248._44_4_ = -0.00021219444;
      auVar248._48_4_ = -0.00021219444;
      auVar248._52_4_ = -0.00021219444;
      auVar248._56_4_ = -0.00021219444;
      auVar248._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar248,auVar249,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_122f8._0_4_ = 0.00019875691;
      uStack_122f8._4_4_ = 0.00019875691;
      auStack_12300._0_4_ = 0.00019875691;
      auStack_12300._4_4_ = 0.00019875691;
      auVar140._16_4_ = 0.00019875691;
      auVar140._20_4_ = 0.00019875691;
      auVar140._0_16_ = _auStack_12300;
      auVar140._24_4_ = 0.00019875691;
      auVar140._28_4_ = 0.00019875691;
      auVar140._32_4_ = 0.00019875691;
      auVar140._36_4_ = 0.00019875691;
      auVar140._40_4_ = 0.00019875691;
      auVar140._44_4_ = 0.00019875691;
      auVar140._48_4_ = 0.00019875691;
      auVar140._52_4_ = 0.00019875691;
      auVar140._56_4_ = 0.00019875691;
      auVar140._60_4_ = 0.00019875691;
      auVar139._8_4_ = 0.0013981999;
      auVar139._12_4_ = 0.0013981999;
      auVar139._0_4_ = 0.0013981999;
      auVar139._4_4_ = 0.0013981999;
      auVar139._16_4_ = 0.0013981999;
      auVar139._20_4_ = 0.0013981999;
      auVar139._24_4_ = 0.0013981999;
      auVar139._28_4_ = 0.0013981999;
      auVar139._32_4_ = 0.0013981999;
      auVar139._36_4_ = 0.0013981999;
      auVar139._40_4_ = 0.0013981999;
      auVar139._44_4_ = 0.0013981999;
      auVar139._48_4_ = 0.0013981999;
      auVar139._52_4_ = 0.0013981999;
      auVar139._56_4_ = 0.0013981999;
      auVar139._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar140,auVar139);
      auVar138._8_4_ = 0.008333452;
      auVar138._12_4_ = 0.008333452;
      auVar138._0_4_ = 0.008333452;
      auVar138._4_4_ = 0.008333452;
      auVar138._16_4_ = 0.008333452;
      auVar138._20_4_ = 0.008333452;
      auVar138._24_4_ = 0.008333452;
      auVar138._28_4_ = 0.008333452;
      auVar138._32_4_ = 0.008333452;
      auVar138._36_4_ = 0.008333452;
      auVar138._40_4_ = 0.008333452;
      auVar138._44_4_ = 0.008333452;
      auVar138._48_4_ = 0.008333452;
      auVar138._52_4_ = 0.008333452;
      auVar138._56_4_ = 0.008333452;
      auVar138._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar138);
      auVar137._8_4_ = 0.041665796;
      auVar137._12_4_ = 0.041665796;
      auVar137._0_4_ = 0.041665796;
      auVar137._4_4_ = 0.041665796;
      auVar137._16_4_ = 0.041665796;
      auVar137._20_4_ = 0.041665796;
      auVar137._24_4_ = 0.041665796;
      auVar137._28_4_ = 0.041665796;
      auVar137._32_4_ = 0.041665796;
      auVar137._36_4_ = 0.041665796;
      auVar137._40_4_ = 0.041665796;
      auVar137._44_4_ = 0.041665796;
      auVar137._48_4_ = 0.041665796;
      auVar137._52_4_ = 0.041665796;
      auVar137._56_4_ = 0.041665796;
      auVar137._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar137);
      auVar136._8_4_ = 0.16666666;
      auVar136._12_4_ = 0.16666666;
      auVar136._0_4_ = 0.16666666;
      auVar136._4_4_ = 0.16666666;
      auVar136._16_4_ = 0.16666666;
      auVar136._20_4_ = 0.16666666;
      auVar136._24_4_ = 0.16666666;
      auVar136._28_4_ = 0.16666666;
      auVar136._32_4_ = 0.16666666;
      auVar136._36_4_ = 0.16666666;
      auVar136._40_4_ = 0.16666666;
      auVar136._44_4_ = 0.16666666;
      auVar136._48_4_ = 0.16666666;
      auVar136._52_4_ = 0.16666666;
      auVar136._56_4_ = 0.16666666;
      auVar136._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar136);
      auVar135._8_4_ = 0.5;
      auVar135._12_4_ = 0.5;
      auVar135._0_4_ = 0.5;
      auVar135._4_4_ = 0.5;
      auVar135._16_4_ = 0.5;
      auVar135._20_4_ = 0.5;
      auVar135._24_4_ = 0.5;
      auVar135._28_4_ = 0.5;
      auVar135._32_4_ = 0.5;
      auVar135._36_4_ = 0.5;
      auVar135._40_4_ = 0.5;
      auVar135._44_4_ = 0.5;
      auVar135._48_4_ = 0.5;
      auVar135._52_4_ = 0.5;
      auVar135._56_4_ = 0.5;
      auVar135._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar135);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar29._8_4_ = 1.0;
      auVar29._12_4_ = 1.0;
      auVar29._0_4_ = 1.0;
      auVar29._4_4_ = 1.0;
      auVar29._16_4_ = 1.0;
      auVar29._20_4_ = 1.0;
      auVar29._24_4_ = 1.0;
      auVar29._28_4_ = 1.0;
      auVar29._32_4_ = 1.0;
      auVar29._36_4_ = 1.0;
      auVar29._40_4_ = 1.0;
      auVar29._44_4_ = 1.0;
      auVar29._48_4_ = 1.0;
      auVar29._52_4_ = 1.0;
      auVar29._56_4_ = 1.0;
      auVar29._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar29);
      auVar286._16_8_ = uStack_121f0;
      auVar286._0_16_ = auStack_12200;
      auVar286._24_8_ = uStack_121e8;
      auVar286._32_8_ = uStack_121e0;
      auVar286._40_8_ = uStack_121d8;
      auVar286._48_8_ = uStack_121d0;
      auVar286._56_8_ = uStack_121c8;
      auVar298 = vcvttps2dq_avx512f(auVar286);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar303 = vmulps_avx512f(auVar300,auVar298);
      auStack_12300 = auVar303._0_8_;
      uStack_122f8 = auVar303._8_8_;
      uStack_122f0 = auVar303._16_8_;
      uStack_122e8 = auVar303._24_8_;
      uStack_122e0 = auVar303._32_8_;
      uStack_122d8 = auVar303._40_8_;
      uStack_122d0 = auVar303._48_8_;
      uStack_122c8 = auVar303._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x2c)));
      auVar298 = vsubps_avx512f(pauStack_16650[0xb],auVar298);
      auVar49._8_4_ = 88.37626;
      auVar49._12_4_ = 88.37626;
      auVar49._0_4_ = 88.37626;
      auVar49._4_4_ = 88.37626;
      auVar49._16_4_ = 88.37626;
      auVar49._20_4_ = 88.37626;
      auVar49._24_4_ = 88.37626;
      auVar49._28_4_ = 88.37626;
      auVar49._32_4_ = 88.37626;
      auVar49._36_4_ = 88.37626;
      auVar49._40_4_ = 88.37626;
      auVar49._44_4_ = 88.37626;
      auVar49._48_4_ = 88.37626;
      auVar49._52_4_ = 88.37626;
      auVar49._56_4_ = 88.37626;
      auVar49._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar49);
      auVar302._8_4_ = -88.37626;
      auVar302._12_4_ = -88.37626;
      auVar302._0_4_ = -88.37626;
      auVar302._4_4_ = -88.37626;
      auVar302._16_4_ = -88.37626;
      auVar302._20_4_ = -88.37626;
      auVar302._24_4_ = -88.37626;
      auVar302._28_4_ = -88.37626;
      auVar302._32_4_ = -88.37626;
      auVar302._36_4_ = -88.37626;
      auVar302._40_4_ = -88.37626;
      auVar302._44_4_ = -88.37626;
      auVar302._48_4_ = -88.37626;
      auVar302._52_4_ = -88.37626;
      auVar302._56_4_ = -88.37626;
      auVar302._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar302);
      auVar150._8_4_ = 1.442695;
      auVar150._12_4_ = 1.442695;
      auVar150._0_4_ = 1.442695;
      auVar150._4_4_ = 1.442695;
      auVar150._16_4_ = 1.442695;
      auVar150._20_4_ = 1.442695;
      auVar150._24_4_ = 1.442695;
      auVar150._28_4_ = 1.442695;
      auVar150._32_4_ = 1.442695;
      auVar150._36_4_ = 1.442695;
      auVar150._40_4_ = 1.442695;
      auVar150._44_4_ = 1.442695;
      auVar150._48_4_ = 1.442695;
      auVar150._52_4_ = 1.442695;
      auVar150._56_4_ = 1.442695;
      auVar150._60_4_ = 1.442695;
      auVar149._8_4_ = 0.5;
      auVar149._12_4_ = 0.5;
      auVar149._0_4_ = 0.5;
      auVar149._4_4_ = 0.5;
      auVar149._16_4_ = 0.5;
      auVar149._20_4_ = 0.5;
      auVar149._24_4_ = 0.5;
      auVar149._28_4_ = 0.5;
      auVar149._32_4_ = 0.5;
      auVar149._36_4_ = 0.5;
      auVar149._40_4_ = 0.5;
      auVar149._44_4_ = 0.5;
      auVar149._48_4_ = 0.5;
      auVar149._52_4_ = 0.5;
      auVar149._56_4_ = 0.5;
      auVar149._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar150,auVar299,auVar149);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar202._8_4_ = 1.0;
      auVar202._12_4_ = 1.0;
      auVar202._0_4_ = 1.0;
      auVar202._4_4_ = 1.0;
      auVar202._16_4_ = 1.0;
      auVar202._20_4_ = 1.0;
      auVar202._24_4_ = 1.0;
      auVar202._28_4_ = 1.0;
      auVar202._32_4_ = 1.0;
      auVar202._36_4_ = 1.0;
      auVar202._40_4_ = 1.0;
      auVar202._44_4_ = 1.0;
      auVar202._48_4_ = 1.0;
      auVar202._52_4_ = 1.0;
      auVar202._56_4_ = 1.0;
      auVar202._60_4_ = 1.0;
      local_5c40 = auVar300._0_4_;
      iStack_5c3c = auVar300._4_4_;
      iStack_5c38 = auVar300._8_4_;
      iStack_5c34 = auVar300._12_4_;
      iStack_5c30 = auVar300._16_4_;
      iStack_5c2c = auVar300._20_4_;
      iStack_5c28 = auVar300._24_4_;
      iStack_5c24 = auVar300._28_4_;
      iStack_5c20 = auVar300._32_4_;
      iStack_5c1c = auVar300._36_4_;
      iStack_5c18 = auVar300._40_4_;
      iStack_5c14 = auVar300._44_4_;
      iStack_5c10 = auVar300._48_4_;
      iStack_5c0c = auVar300._52_4_;
      iStack_5c08 = auVar300._56_4_;
      iStack_5c04 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar202);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12480._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_5c3c;
      auStack_12480._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5c40;
      auStack_12480._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5c38;
      auStack_12480._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5c34;
      uStack_12470._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5c30;
      uStack_12470._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_5c2c;
      uStack_12468._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5c28;
      uStack_12468._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5c24;
      auVar297 = _auStack_12480;
      uStack_12460._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5c20;
      uStack_12460._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_5c1c;
      auVar294 = _auStack_12480;
      uStack_12458._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5c18;
      uStack_12458._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5c14;
      auVar295 = _auStack_12480;
      uStack_12450._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5c10;
      uStack_12450._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_5c0c;
      auVar293 = _auStack_12480;
      uStack_12448._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5c08;
      uStack_12448._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5c04;
      auVar298 = _auStack_12480;
      uStack_12468 = auVar297._24_8_;
      uStack_12460 = auVar294._32_8_;
      uStack_12458 = auVar295._40_8_;
      uStack_12450 = auVar293._48_8_;
      uStack_12448 = auVar298._56_8_;
      auVar255._16_8_ = uStack_12470;
      auVar255._0_16_ = auStack_12480;
      auVar255._24_8_ = uStack_12468;
      auVar255._32_8_ = uStack_12460;
      auVar255._40_8_ = uStack_12458;
      auVar255._48_8_ = uStack_12450;
      auVar255._56_8_ = uStack_12448;
      auVar254._8_4_ = 0.6933594;
      auVar254._12_4_ = 0.6933594;
      auVar254._0_4_ = 0.6933594;
      auVar254._4_4_ = 0.6933594;
      auVar254._16_4_ = 0.6933594;
      auVar254._20_4_ = 0.6933594;
      auVar254._24_4_ = 0.6933594;
      auVar254._28_4_ = 0.6933594;
      auVar254._32_4_ = 0.6933594;
      auVar254._36_4_ = 0.6933594;
      auVar254._40_4_ = 0.6933594;
      auVar254._44_4_ = 0.6933594;
      auVar254._48_4_ = 0.6933594;
      auVar254._52_4_ = 0.6933594;
      auVar254._56_4_ = 0.6933594;
      auVar254._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar254,auVar255,auVar299);
      auVar253._16_8_ = uStack_12470;
      auVar253._0_16_ = auStack_12480;
      auVar253._24_8_ = uStack_12468;
      auVar253._32_8_ = uStack_12460;
      auVar253._40_8_ = uStack_12458;
      auVar253._48_8_ = uStack_12450;
      auVar253._56_8_ = uStack_12448;
      auVar252._8_4_ = -0.00021219444;
      auVar252._12_4_ = -0.00021219444;
      auVar252._0_4_ = -0.00021219444;
      auVar252._4_4_ = -0.00021219444;
      auVar252._16_4_ = -0.00021219444;
      auVar252._20_4_ = -0.00021219444;
      auVar252._24_4_ = -0.00021219444;
      auVar252._28_4_ = -0.00021219444;
      auVar252._32_4_ = -0.00021219444;
      auVar252._36_4_ = -0.00021219444;
      auVar252._40_4_ = -0.00021219444;
      auVar252._44_4_ = -0.00021219444;
      auVar252._48_4_ = -0.00021219444;
      auVar252._52_4_ = -0.00021219444;
      auVar252._56_4_ = -0.00021219444;
      auVar252._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar252,auVar253,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_12578._0_4_ = 0.00019875691;
      uStack_12578._4_4_ = 0.00019875691;
      auStack_12580._0_4_ = 0.00019875691;
      auStack_12580._4_4_ = 0.00019875691;
      auVar148._16_4_ = 0.00019875691;
      auVar148._20_4_ = 0.00019875691;
      auVar148._0_16_ = _auStack_12580;
      auVar148._24_4_ = 0.00019875691;
      auVar148._28_4_ = 0.00019875691;
      auVar148._32_4_ = 0.00019875691;
      auVar148._36_4_ = 0.00019875691;
      auVar148._40_4_ = 0.00019875691;
      auVar148._44_4_ = 0.00019875691;
      auVar148._48_4_ = 0.00019875691;
      auVar148._52_4_ = 0.00019875691;
      auVar148._56_4_ = 0.00019875691;
      auVar148._60_4_ = 0.00019875691;
      auVar147._8_4_ = 0.0013981999;
      auVar147._12_4_ = 0.0013981999;
      auVar147._0_4_ = 0.0013981999;
      auVar147._4_4_ = 0.0013981999;
      auVar147._16_4_ = 0.0013981999;
      auVar147._20_4_ = 0.0013981999;
      auVar147._24_4_ = 0.0013981999;
      auVar147._28_4_ = 0.0013981999;
      auVar147._32_4_ = 0.0013981999;
      auVar147._36_4_ = 0.0013981999;
      auVar147._40_4_ = 0.0013981999;
      auVar147._44_4_ = 0.0013981999;
      auVar147._48_4_ = 0.0013981999;
      auVar147._52_4_ = 0.0013981999;
      auVar147._56_4_ = 0.0013981999;
      auVar147._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar148,auVar147);
      auVar146._8_4_ = 0.008333452;
      auVar146._12_4_ = 0.008333452;
      auVar146._0_4_ = 0.008333452;
      auVar146._4_4_ = 0.008333452;
      auVar146._16_4_ = 0.008333452;
      auVar146._20_4_ = 0.008333452;
      auVar146._24_4_ = 0.008333452;
      auVar146._28_4_ = 0.008333452;
      auVar146._32_4_ = 0.008333452;
      auVar146._36_4_ = 0.008333452;
      auVar146._40_4_ = 0.008333452;
      auVar146._44_4_ = 0.008333452;
      auVar146._48_4_ = 0.008333452;
      auVar146._52_4_ = 0.008333452;
      auVar146._56_4_ = 0.008333452;
      auVar146._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar146);
      auVar145._8_4_ = 0.041665796;
      auVar145._12_4_ = 0.041665796;
      auVar145._0_4_ = 0.041665796;
      auVar145._4_4_ = 0.041665796;
      auVar145._16_4_ = 0.041665796;
      auVar145._20_4_ = 0.041665796;
      auVar145._24_4_ = 0.041665796;
      auVar145._28_4_ = 0.041665796;
      auVar145._32_4_ = 0.041665796;
      auVar145._36_4_ = 0.041665796;
      auVar145._40_4_ = 0.041665796;
      auVar145._44_4_ = 0.041665796;
      auVar145._48_4_ = 0.041665796;
      auVar145._52_4_ = 0.041665796;
      auVar145._56_4_ = 0.041665796;
      auVar145._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar145);
      auVar144._8_4_ = 0.16666666;
      auVar144._12_4_ = 0.16666666;
      auVar144._0_4_ = 0.16666666;
      auVar144._4_4_ = 0.16666666;
      auVar144._16_4_ = 0.16666666;
      auVar144._20_4_ = 0.16666666;
      auVar144._24_4_ = 0.16666666;
      auVar144._28_4_ = 0.16666666;
      auVar144._32_4_ = 0.16666666;
      auVar144._36_4_ = 0.16666666;
      auVar144._40_4_ = 0.16666666;
      auVar144._44_4_ = 0.16666666;
      auVar144._48_4_ = 0.16666666;
      auVar144._52_4_ = 0.16666666;
      auVar144._56_4_ = 0.16666666;
      auVar144._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar144);
      auVar143._8_4_ = 0.5;
      auVar143._12_4_ = 0.5;
      auVar143._0_4_ = 0.5;
      auVar143._4_4_ = 0.5;
      auVar143._16_4_ = 0.5;
      auVar143._20_4_ = 0.5;
      auVar143._24_4_ = 0.5;
      auVar143._28_4_ = 0.5;
      auVar143._32_4_ = 0.5;
      auVar143._36_4_ = 0.5;
      auVar143._40_4_ = 0.5;
      auVar143._44_4_ = 0.5;
      auVar143._48_4_ = 0.5;
      auVar143._52_4_ = 0.5;
      auVar143._56_4_ = 0.5;
      auVar143._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar143);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar30._8_4_ = 1.0;
      auVar30._12_4_ = 1.0;
      auVar30._0_4_ = 1.0;
      auVar30._4_4_ = 1.0;
      auVar30._16_4_ = 1.0;
      auVar30._20_4_ = 1.0;
      auVar30._24_4_ = 1.0;
      auVar30._28_4_ = 1.0;
      auVar30._32_4_ = 1.0;
      auVar30._36_4_ = 1.0;
      auVar30._40_4_ = 1.0;
      auVar30._44_4_ = 1.0;
      auVar30._48_4_ = 1.0;
      auVar30._52_4_ = 1.0;
      auVar30._56_4_ = 1.0;
      auVar30._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar30);
      auVar287._16_8_ = uStack_12470;
      auVar287._0_16_ = auStack_12480;
      auVar287._24_8_ = uStack_12468;
      auVar287._32_8_ = uStack_12460;
      auVar287._40_8_ = uStack_12458;
      auVar287._48_8_ = uStack_12450;
      auVar287._56_8_ = uStack_12448;
      auVar298 = vcvttps2dq_avx512f(auVar287);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar302 = vmulps_avx512f(auVar300,auVar298);
      auStack_12580 = auVar302._0_8_;
      uStack_12578 = auVar302._8_8_;
      uStack_12570 = auVar302._16_8_;
      uStack_12568 = auVar302._24_8_;
      uStack_12560 = auVar302._32_8_;
      uStack_12558 = auVar302._40_8_;
      uStack_12550 = auVar302._48_8_;
      uStack_12548 = auVar302._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x30)));
      auVar298 = vsubps_avx512f(pauStack_16650[0xc],auVar298);
      auVar50._8_4_ = 88.37626;
      auVar50._12_4_ = 88.37626;
      auVar50._0_4_ = 88.37626;
      auVar50._4_4_ = 88.37626;
      auVar50._16_4_ = 88.37626;
      auVar50._20_4_ = 88.37626;
      auVar50._24_4_ = 88.37626;
      auVar50._28_4_ = 88.37626;
      auVar50._32_4_ = 88.37626;
      auVar50._36_4_ = 88.37626;
      auVar50._40_4_ = 88.37626;
      auVar50._44_4_ = 88.37626;
      auVar50._48_4_ = 88.37626;
      auVar50._52_4_ = 88.37626;
      auVar50._56_4_ = 88.37626;
      auVar50._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar50);
      auVar301._8_4_ = -88.37626;
      auVar301._12_4_ = -88.37626;
      auVar301._0_4_ = -88.37626;
      auVar301._4_4_ = -88.37626;
      auVar301._16_4_ = -88.37626;
      auVar301._20_4_ = -88.37626;
      auVar301._24_4_ = -88.37626;
      auVar301._28_4_ = -88.37626;
      auVar301._32_4_ = -88.37626;
      auVar301._36_4_ = -88.37626;
      auVar301._40_4_ = -88.37626;
      auVar301._44_4_ = -88.37626;
      auVar301._48_4_ = -88.37626;
      auVar301._52_4_ = -88.37626;
      auVar301._56_4_ = -88.37626;
      auVar301._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar301);
      auVar158._8_4_ = 1.442695;
      auVar158._12_4_ = 1.442695;
      auVar158._0_4_ = 1.442695;
      auVar158._4_4_ = 1.442695;
      auVar158._16_4_ = 1.442695;
      auVar158._20_4_ = 1.442695;
      auVar158._24_4_ = 1.442695;
      auVar158._28_4_ = 1.442695;
      auVar158._32_4_ = 1.442695;
      auVar158._36_4_ = 1.442695;
      auVar158._40_4_ = 1.442695;
      auVar158._44_4_ = 1.442695;
      auVar158._48_4_ = 1.442695;
      auVar158._52_4_ = 1.442695;
      auVar158._56_4_ = 1.442695;
      auVar158._60_4_ = 1.442695;
      auVar157._8_4_ = 0.5;
      auVar157._12_4_ = 0.5;
      auVar157._0_4_ = 0.5;
      auVar157._4_4_ = 0.5;
      auVar157._16_4_ = 0.5;
      auVar157._20_4_ = 0.5;
      auVar157._24_4_ = 0.5;
      auVar157._28_4_ = 0.5;
      auVar157._32_4_ = 0.5;
      auVar157._36_4_ = 0.5;
      auVar157._40_4_ = 0.5;
      auVar157._44_4_ = 0.5;
      auVar157._48_4_ = 0.5;
      auVar157._52_4_ = 0.5;
      auVar157._56_4_ = 0.5;
      auVar157._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar158,auVar299,auVar157);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar203._8_4_ = 1.0;
      auVar203._12_4_ = 1.0;
      auVar203._0_4_ = 1.0;
      auVar203._4_4_ = 1.0;
      auVar203._16_4_ = 1.0;
      auVar203._20_4_ = 1.0;
      auVar203._24_4_ = 1.0;
      auVar203._28_4_ = 1.0;
      auVar203._32_4_ = 1.0;
      auVar203._36_4_ = 1.0;
      auVar203._40_4_ = 1.0;
      auVar203._44_4_ = 1.0;
      auVar203._48_4_ = 1.0;
      auVar203._52_4_ = 1.0;
      auVar203._56_4_ = 1.0;
      auVar203._60_4_ = 1.0;
      local_5ac0 = auVar300._0_4_;
      iStack_5abc = auVar300._4_4_;
      iStack_5ab8 = auVar300._8_4_;
      iStack_5ab4 = auVar300._12_4_;
      iStack_5ab0 = auVar300._16_4_;
      iStack_5aac = auVar300._20_4_;
      iStack_5aa8 = auVar300._24_4_;
      iStack_5aa4 = auVar300._28_4_;
      iStack_5aa0 = auVar300._32_4_;
      iStack_5a9c = auVar300._36_4_;
      iStack_5a98 = auVar300._40_4_;
      iStack_5a94 = auVar300._44_4_;
      iStack_5a90 = auVar300._48_4_;
      iStack_5a8c = auVar300._52_4_;
      iStack_5a88 = auVar300._56_4_;
      iStack_5a84 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar203);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12700._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_5abc;
      auStack_12700._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5ac0;
      auStack_12700._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5ab8;
      auStack_12700._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5ab4;
      uStack_126f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5ab0;
      uStack_126f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_5aac;
      uStack_126e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5aa8;
      uStack_126e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5aa4;
      auVar297 = _auStack_12700;
      uStack_126e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5aa0;
      uStack_126e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_5a9c;
      auVar294 = _auStack_12700;
      uStack_126d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5a98;
      uStack_126d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5a94;
      auVar295 = _auStack_12700;
      uStack_126d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5a90;
      uStack_126d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_5a8c;
      auVar293 = _auStack_12700;
      uStack_126c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5a88;
      uStack_126c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5a84;
      auVar298 = _auStack_12700;
      uStack_126e8 = auVar297._24_8_;
      uStack_126e0 = auVar294._32_8_;
      uStack_126d8 = auVar295._40_8_;
      uStack_126d0 = auVar293._48_8_;
      uStack_126c8 = auVar298._56_8_;
      auVar259._16_8_ = uStack_126f0;
      auVar259._0_16_ = auStack_12700;
      auVar259._24_8_ = uStack_126e8;
      auVar259._32_8_ = uStack_126e0;
      auVar259._40_8_ = uStack_126d8;
      auVar259._48_8_ = uStack_126d0;
      auVar259._56_8_ = uStack_126c8;
      auVar258._8_4_ = 0.6933594;
      auVar258._12_4_ = 0.6933594;
      auVar258._0_4_ = 0.6933594;
      auVar258._4_4_ = 0.6933594;
      auVar258._16_4_ = 0.6933594;
      auVar258._20_4_ = 0.6933594;
      auVar258._24_4_ = 0.6933594;
      auVar258._28_4_ = 0.6933594;
      auVar258._32_4_ = 0.6933594;
      auVar258._36_4_ = 0.6933594;
      auVar258._40_4_ = 0.6933594;
      auVar258._44_4_ = 0.6933594;
      auVar258._48_4_ = 0.6933594;
      auVar258._52_4_ = 0.6933594;
      auVar258._56_4_ = 0.6933594;
      auVar258._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar258,auVar259,auVar299);
      auVar257._16_8_ = uStack_126f0;
      auVar257._0_16_ = auStack_12700;
      auVar257._24_8_ = uStack_126e8;
      auVar257._32_8_ = uStack_126e0;
      auVar257._40_8_ = uStack_126d8;
      auVar257._48_8_ = uStack_126d0;
      auVar257._56_8_ = uStack_126c8;
      auVar256._8_4_ = -0.00021219444;
      auVar256._12_4_ = -0.00021219444;
      auVar256._0_4_ = -0.00021219444;
      auVar256._4_4_ = -0.00021219444;
      auVar256._16_4_ = -0.00021219444;
      auVar256._20_4_ = -0.00021219444;
      auVar256._24_4_ = -0.00021219444;
      auVar256._28_4_ = -0.00021219444;
      auVar256._32_4_ = -0.00021219444;
      auVar256._36_4_ = -0.00021219444;
      auVar256._40_4_ = -0.00021219444;
      auVar256._44_4_ = -0.00021219444;
      auVar256._48_4_ = -0.00021219444;
      auVar256._52_4_ = -0.00021219444;
      auVar256._56_4_ = -0.00021219444;
      auVar256._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar256,auVar257,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_127f8._0_4_ = 0.00019875691;
      uStack_127f8._4_4_ = 0.00019875691;
      auStack_12800._0_4_ = 0.00019875691;
      auStack_12800._4_4_ = 0.00019875691;
      auVar156._16_4_ = 0.00019875691;
      auVar156._20_4_ = 0.00019875691;
      auVar156._0_16_ = _auStack_12800;
      auVar156._24_4_ = 0.00019875691;
      auVar156._28_4_ = 0.00019875691;
      auVar156._32_4_ = 0.00019875691;
      auVar156._36_4_ = 0.00019875691;
      auVar156._40_4_ = 0.00019875691;
      auVar156._44_4_ = 0.00019875691;
      auVar156._48_4_ = 0.00019875691;
      auVar156._52_4_ = 0.00019875691;
      auVar156._56_4_ = 0.00019875691;
      auVar156._60_4_ = 0.00019875691;
      auVar155._8_4_ = 0.0013981999;
      auVar155._12_4_ = 0.0013981999;
      auVar155._0_4_ = 0.0013981999;
      auVar155._4_4_ = 0.0013981999;
      auVar155._16_4_ = 0.0013981999;
      auVar155._20_4_ = 0.0013981999;
      auVar155._24_4_ = 0.0013981999;
      auVar155._28_4_ = 0.0013981999;
      auVar155._32_4_ = 0.0013981999;
      auVar155._36_4_ = 0.0013981999;
      auVar155._40_4_ = 0.0013981999;
      auVar155._44_4_ = 0.0013981999;
      auVar155._48_4_ = 0.0013981999;
      auVar155._52_4_ = 0.0013981999;
      auVar155._56_4_ = 0.0013981999;
      auVar155._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar156,auVar155);
      auVar154._8_4_ = 0.008333452;
      auVar154._12_4_ = 0.008333452;
      auVar154._0_4_ = 0.008333452;
      auVar154._4_4_ = 0.008333452;
      auVar154._16_4_ = 0.008333452;
      auVar154._20_4_ = 0.008333452;
      auVar154._24_4_ = 0.008333452;
      auVar154._28_4_ = 0.008333452;
      auVar154._32_4_ = 0.008333452;
      auVar154._36_4_ = 0.008333452;
      auVar154._40_4_ = 0.008333452;
      auVar154._44_4_ = 0.008333452;
      auVar154._48_4_ = 0.008333452;
      auVar154._52_4_ = 0.008333452;
      auVar154._56_4_ = 0.008333452;
      auVar154._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar154);
      auVar153._8_4_ = 0.041665796;
      auVar153._12_4_ = 0.041665796;
      auVar153._0_4_ = 0.041665796;
      auVar153._4_4_ = 0.041665796;
      auVar153._16_4_ = 0.041665796;
      auVar153._20_4_ = 0.041665796;
      auVar153._24_4_ = 0.041665796;
      auVar153._28_4_ = 0.041665796;
      auVar153._32_4_ = 0.041665796;
      auVar153._36_4_ = 0.041665796;
      auVar153._40_4_ = 0.041665796;
      auVar153._44_4_ = 0.041665796;
      auVar153._48_4_ = 0.041665796;
      auVar153._52_4_ = 0.041665796;
      auVar153._56_4_ = 0.041665796;
      auVar153._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar153);
      auVar152._8_4_ = 0.16666666;
      auVar152._12_4_ = 0.16666666;
      auVar152._0_4_ = 0.16666666;
      auVar152._4_4_ = 0.16666666;
      auVar152._16_4_ = 0.16666666;
      auVar152._20_4_ = 0.16666666;
      auVar152._24_4_ = 0.16666666;
      auVar152._28_4_ = 0.16666666;
      auVar152._32_4_ = 0.16666666;
      auVar152._36_4_ = 0.16666666;
      auVar152._40_4_ = 0.16666666;
      auVar152._44_4_ = 0.16666666;
      auVar152._48_4_ = 0.16666666;
      auVar152._52_4_ = 0.16666666;
      auVar152._56_4_ = 0.16666666;
      auVar152._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar152);
      auVar151._8_4_ = 0.5;
      auVar151._12_4_ = 0.5;
      auVar151._0_4_ = 0.5;
      auVar151._4_4_ = 0.5;
      auVar151._16_4_ = 0.5;
      auVar151._20_4_ = 0.5;
      auVar151._24_4_ = 0.5;
      auVar151._28_4_ = 0.5;
      auVar151._32_4_ = 0.5;
      auVar151._36_4_ = 0.5;
      auVar151._40_4_ = 0.5;
      auVar151._44_4_ = 0.5;
      auVar151._48_4_ = 0.5;
      auVar151._52_4_ = 0.5;
      auVar151._56_4_ = 0.5;
      auVar151._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar151);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar31._8_4_ = 1.0;
      auVar31._12_4_ = 1.0;
      auVar31._0_4_ = 1.0;
      auVar31._4_4_ = 1.0;
      auVar31._16_4_ = 1.0;
      auVar31._20_4_ = 1.0;
      auVar31._24_4_ = 1.0;
      auVar31._28_4_ = 1.0;
      auVar31._32_4_ = 1.0;
      auVar31._36_4_ = 1.0;
      auVar31._40_4_ = 1.0;
      auVar31._44_4_ = 1.0;
      auVar31._48_4_ = 1.0;
      auVar31._52_4_ = 1.0;
      auVar31._56_4_ = 1.0;
      auVar31._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar31);
      auVar288._16_8_ = uStack_126f0;
      auVar288._0_16_ = auStack_12700;
      auVar288._24_8_ = uStack_126e8;
      auVar288._32_8_ = uStack_126e0;
      auVar288._40_8_ = uStack_126d8;
      auVar288._48_8_ = uStack_126d0;
      auVar288._56_8_ = uStack_126c8;
      auVar298 = vcvttps2dq_avx512f(auVar288);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar301 = vmulps_avx512f(auVar300,auVar298);
      auStack_12800 = auVar301._0_8_;
      uStack_127f8 = auVar301._8_8_;
      uStack_127f0 = auVar301._16_8_;
      uStack_127e8 = auVar301._24_8_;
      uStack_127e0 = auVar301._32_8_;
      uStack_127d8 = auVar301._40_8_;
      uStack_127d0 = auVar301._48_8_;
      uStack_127c8 = auVar301._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x34)));
      auVar298 = vsubps_avx512f(pauStack_16650[0xd],auVar298);
      auVar51._8_4_ = 88.37626;
      auVar51._12_4_ = 88.37626;
      auVar51._0_4_ = 88.37626;
      auVar51._4_4_ = 88.37626;
      auVar51._16_4_ = 88.37626;
      auVar51._20_4_ = 88.37626;
      auVar51._24_4_ = 88.37626;
      auVar51._28_4_ = 88.37626;
      auVar51._32_4_ = 88.37626;
      auVar51._36_4_ = 88.37626;
      auVar51._40_4_ = 88.37626;
      auVar51._44_4_ = 88.37626;
      auVar51._48_4_ = 88.37626;
      auVar51._52_4_ = 88.37626;
      auVar51._56_4_ = 88.37626;
      auVar51._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar51);
      auVar300._8_4_ = -88.37626;
      auVar300._12_4_ = -88.37626;
      auVar300._0_4_ = -88.37626;
      auVar300._4_4_ = -88.37626;
      auVar300._16_4_ = -88.37626;
      auVar300._20_4_ = -88.37626;
      auVar300._24_4_ = -88.37626;
      auVar300._28_4_ = -88.37626;
      auVar300._32_4_ = -88.37626;
      auVar300._36_4_ = -88.37626;
      auVar300._40_4_ = -88.37626;
      auVar300._44_4_ = -88.37626;
      auVar300._48_4_ = -88.37626;
      auVar300._52_4_ = -88.37626;
      auVar300._56_4_ = -88.37626;
      auVar300._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar300);
      auVar166._8_4_ = 1.442695;
      auVar166._12_4_ = 1.442695;
      auVar166._0_4_ = 1.442695;
      auVar166._4_4_ = 1.442695;
      auVar166._16_4_ = 1.442695;
      auVar166._20_4_ = 1.442695;
      auVar166._24_4_ = 1.442695;
      auVar166._28_4_ = 1.442695;
      auVar166._32_4_ = 1.442695;
      auVar166._36_4_ = 1.442695;
      auVar166._40_4_ = 1.442695;
      auVar166._44_4_ = 1.442695;
      auVar166._48_4_ = 1.442695;
      auVar166._52_4_ = 1.442695;
      auVar166._56_4_ = 1.442695;
      auVar166._60_4_ = 1.442695;
      auVar165._8_4_ = 0.5;
      auVar165._12_4_ = 0.5;
      auVar165._0_4_ = 0.5;
      auVar165._4_4_ = 0.5;
      auVar165._16_4_ = 0.5;
      auVar165._20_4_ = 0.5;
      auVar165._24_4_ = 0.5;
      auVar165._28_4_ = 0.5;
      auVar165._32_4_ = 0.5;
      auVar165._36_4_ = 0.5;
      auVar165._40_4_ = 0.5;
      auVar165._44_4_ = 0.5;
      auVar165._48_4_ = 0.5;
      auVar165._52_4_ = 0.5;
      auVar165._56_4_ = 0.5;
      auVar165._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar166,auVar299,auVar165);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar204._8_4_ = 1.0;
      auVar204._12_4_ = 1.0;
      auVar204._0_4_ = 1.0;
      auVar204._4_4_ = 1.0;
      auVar204._16_4_ = 1.0;
      auVar204._20_4_ = 1.0;
      auVar204._24_4_ = 1.0;
      auVar204._28_4_ = 1.0;
      auVar204._32_4_ = 1.0;
      auVar204._36_4_ = 1.0;
      auVar204._40_4_ = 1.0;
      auVar204._44_4_ = 1.0;
      auVar204._48_4_ = 1.0;
      auVar204._52_4_ = 1.0;
      auVar204._56_4_ = 1.0;
      auVar204._60_4_ = 1.0;
      local_5940 = auVar300._0_4_;
      iStack_593c = auVar300._4_4_;
      iStack_5938 = auVar300._8_4_;
      iStack_5934 = auVar300._12_4_;
      iStack_5930 = auVar300._16_4_;
      iStack_592c = auVar300._20_4_;
      iStack_5928 = auVar300._24_4_;
      iStack_5924 = auVar300._28_4_;
      iStack_5920 = auVar300._32_4_;
      iStack_591c = auVar300._36_4_;
      iStack_5918 = auVar300._40_4_;
      iStack_5914 = auVar300._44_4_;
      iStack_5910 = auVar300._48_4_;
      iStack_590c = auVar300._52_4_;
      iStack_5908 = auVar300._56_4_;
      iStack_5904 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar204);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12980._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_593c;
      auStack_12980._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5940;
      auStack_12980._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5938;
      auStack_12980._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5934;
      uStack_12970._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5930;
      uStack_12970._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_592c;
      uStack_12968._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5928;
      uStack_12968._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5924;
      auVar297 = _auStack_12980;
      uStack_12960._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5920;
      uStack_12960._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_591c;
      auVar294 = _auStack_12980;
      uStack_12958._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5918;
      uStack_12958._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5914;
      auVar295 = _auStack_12980;
      uStack_12950._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5910;
      uStack_12950._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_590c;
      auVar293 = _auStack_12980;
      uStack_12948._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5908;
      uStack_12948._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5904;
      auVar298 = _auStack_12980;
      uStack_12968 = auVar297._24_8_;
      uStack_12960 = auVar294._32_8_;
      uStack_12958 = auVar295._40_8_;
      uStack_12950 = auVar293._48_8_;
      uStack_12948 = auVar298._56_8_;
      auVar263._16_8_ = uStack_12970;
      auVar263._0_16_ = auStack_12980;
      auVar263._24_8_ = uStack_12968;
      auVar263._32_8_ = uStack_12960;
      auVar263._40_8_ = uStack_12958;
      auVar263._48_8_ = uStack_12950;
      auVar263._56_8_ = uStack_12948;
      auVar262._8_4_ = 0.6933594;
      auVar262._12_4_ = 0.6933594;
      auVar262._0_4_ = 0.6933594;
      auVar262._4_4_ = 0.6933594;
      auVar262._16_4_ = 0.6933594;
      auVar262._20_4_ = 0.6933594;
      auVar262._24_4_ = 0.6933594;
      auVar262._28_4_ = 0.6933594;
      auVar262._32_4_ = 0.6933594;
      auVar262._36_4_ = 0.6933594;
      auVar262._40_4_ = 0.6933594;
      auVar262._44_4_ = 0.6933594;
      auVar262._48_4_ = 0.6933594;
      auVar262._52_4_ = 0.6933594;
      auVar262._56_4_ = 0.6933594;
      auVar262._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar262,auVar263,auVar299);
      auVar261._16_8_ = uStack_12970;
      auVar261._0_16_ = auStack_12980;
      auVar261._24_8_ = uStack_12968;
      auVar261._32_8_ = uStack_12960;
      auVar261._40_8_ = uStack_12958;
      auVar261._48_8_ = uStack_12950;
      auVar261._56_8_ = uStack_12948;
      auVar260._8_4_ = -0.00021219444;
      auVar260._12_4_ = -0.00021219444;
      auVar260._0_4_ = -0.00021219444;
      auVar260._4_4_ = -0.00021219444;
      auVar260._16_4_ = -0.00021219444;
      auVar260._20_4_ = -0.00021219444;
      auVar260._24_4_ = -0.00021219444;
      auVar260._28_4_ = -0.00021219444;
      auVar260._32_4_ = -0.00021219444;
      auVar260._36_4_ = -0.00021219444;
      auVar260._40_4_ = -0.00021219444;
      auVar260._44_4_ = -0.00021219444;
      auVar260._48_4_ = -0.00021219444;
      auVar260._52_4_ = -0.00021219444;
      auVar260._56_4_ = -0.00021219444;
      auVar260._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar260,auVar261,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_12a78._0_4_ = 0.00019875691;
      uStack_12a78._4_4_ = 0.00019875691;
      auStack_12a80._0_4_ = 0.00019875691;
      auStack_12a80._4_4_ = 0.00019875691;
      auVar164._16_4_ = 0.00019875691;
      auVar164._20_4_ = 0.00019875691;
      auVar164._0_16_ = _auStack_12a80;
      auVar164._24_4_ = 0.00019875691;
      auVar164._28_4_ = 0.00019875691;
      auVar164._32_4_ = 0.00019875691;
      auVar164._36_4_ = 0.00019875691;
      auVar164._40_4_ = 0.00019875691;
      auVar164._44_4_ = 0.00019875691;
      auVar164._48_4_ = 0.00019875691;
      auVar164._52_4_ = 0.00019875691;
      auVar164._56_4_ = 0.00019875691;
      auVar164._60_4_ = 0.00019875691;
      auVar163._8_4_ = 0.0013981999;
      auVar163._12_4_ = 0.0013981999;
      auVar163._0_4_ = 0.0013981999;
      auVar163._4_4_ = 0.0013981999;
      auVar163._16_4_ = 0.0013981999;
      auVar163._20_4_ = 0.0013981999;
      auVar163._24_4_ = 0.0013981999;
      auVar163._28_4_ = 0.0013981999;
      auVar163._32_4_ = 0.0013981999;
      auVar163._36_4_ = 0.0013981999;
      auVar163._40_4_ = 0.0013981999;
      auVar163._44_4_ = 0.0013981999;
      auVar163._48_4_ = 0.0013981999;
      auVar163._52_4_ = 0.0013981999;
      auVar163._56_4_ = 0.0013981999;
      auVar163._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar164,auVar163);
      auVar162._8_4_ = 0.008333452;
      auVar162._12_4_ = 0.008333452;
      auVar162._0_4_ = 0.008333452;
      auVar162._4_4_ = 0.008333452;
      auVar162._16_4_ = 0.008333452;
      auVar162._20_4_ = 0.008333452;
      auVar162._24_4_ = 0.008333452;
      auVar162._28_4_ = 0.008333452;
      auVar162._32_4_ = 0.008333452;
      auVar162._36_4_ = 0.008333452;
      auVar162._40_4_ = 0.008333452;
      auVar162._44_4_ = 0.008333452;
      auVar162._48_4_ = 0.008333452;
      auVar162._52_4_ = 0.008333452;
      auVar162._56_4_ = 0.008333452;
      auVar162._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar162);
      auVar161._8_4_ = 0.041665796;
      auVar161._12_4_ = 0.041665796;
      auVar161._0_4_ = 0.041665796;
      auVar161._4_4_ = 0.041665796;
      auVar161._16_4_ = 0.041665796;
      auVar161._20_4_ = 0.041665796;
      auVar161._24_4_ = 0.041665796;
      auVar161._28_4_ = 0.041665796;
      auVar161._32_4_ = 0.041665796;
      auVar161._36_4_ = 0.041665796;
      auVar161._40_4_ = 0.041665796;
      auVar161._44_4_ = 0.041665796;
      auVar161._48_4_ = 0.041665796;
      auVar161._52_4_ = 0.041665796;
      auVar161._56_4_ = 0.041665796;
      auVar161._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar161);
      auVar160._8_4_ = 0.16666666;
      auVar160._12_4_ = 0.16666666;
      auVar160._0_4_ = 0.16666666;
      auVar160._4_4_ = 0.16666666;
      auVar160._16_4_ = 0.16666666;
      auVar160._20_4_ = 0.16666666;
      auVar160._24_4_ = 0.16666666;
      auVar160._28_4_ = 0.16666666;
      auVar160._32_4_ = 0.16666666;
      auVar160._36_4_ = 0.16666666;
      auVar160._40_4_ = 0.16666666;
      auVar160._44_4_ = 0.16666666;
      auVar160._48_4_ = 0.16666666;
      auVar160._52_4_ = 0.16666666;
      auVar160._56_4_ = 0.16666666;
      auVar160._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar160);
      auVar159._8_4_ = 0.5;
      auVar159._12_4_ = 0.5;
      auVar159._0_4_ = 0.5;
      auVar159._4_4_ = 0.5;
      auVar159._16_4_ = 0.5;
      auVar159._20_4_ = 0.5;
      auVar159._24_4_ = 0.5;
      auVar159._28_4_ = 0.5;
      auVar159._32_4_ = 0.5;
      auVar159._36_4_ = 0.5;
      auVar159._40_4_ = 0.5;
      auVar159._44_4_ = 0.5;
      auVar159._48_4_ = 0.5;
      auVar159._52_4_ = 0.5;
      auVar159._56_4_ = 0.5;
      auVar159._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar159);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar32._8_4_ = 1.0;
      auVar32._12_4_ = 1.0;
      auVar32._0_4_ = 1.0;
      auVar32._4_4_ = 1.0;
      auVar32._16_4_ = 1.0;
      auVar32._20_4_ = 1.0;
      auVar32._24_4_ = 1.0;
      auVar32._28_4_ = 1.0;
      auVar32._32_4_ = 1.0;
      auVar32._36_4_ = 1.0;
      auVar32._40_4_ = 1.0;
      auVar32._44_4_ = 1.0;
      auVar32._48_4_ = 1.0;
      auVar32._52_4_ = 1.0;
      auVar32._56_4_ = 1.0;
      auVar32._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar32);
      auVar289._16_8_ = uStack_12970;
      auVar289._0_16_ = auStack_12980;
      auVar289._24_8_ = uStack_12968;
      auVar289._32_8_ = uStack_12960;
      auVar289._40_8_ = uStack_12958;
      auVar289._48_8_ = uStack_12950;
      auVar289._56_8_ = uStack_12948;
      auVar298 = vcvttps2dq_avx512f(auVar289);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar300 = vmulps_avx512f(auVar300,auVar298);
      auStack_12a80 = auVar300._0_8_;
      uStack_12a78 = auVar300._8_8_;
      uStack_12a70 = auVar300._16_8_;
      uStack_12a68 = auVar300._24_8_;
      uStack_12a60 = auVar300._32_8_;
      uStack_12a58 = auVar300._40_8_;
      uStack_12a50 = auVar300._48_8_;
      uStack_12a48 = auVar300._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x38)));
      auVar298 = vsubps_avx512f(pauStack_16650[0xe],auVar298);
      auVar52._8_4_ = 88.37626;
      auVar52._12_4_ = 88.37626;
      auVar52._0_4_ = 88.37626;
      auVar52._4_4_ = 88.37626;
      auVar52._16_4_ = 88.37626;
      auVar52._20_4_ = 88.37626;
      auVar52._24_4_ = 88.37626;
      auVar52._28_4_ = 88.37626;
      auVar52._32_4_ = 88.37626;
      auVar52._36_4_ = 88.37626;
      auVar52._40_4_ = 88.37626;
      auVar52._44_4_ = 88.37626;
      auVar52._48_4_ = 88.37626;
      auVar52._52_4_ = 88.37626;
      auVar52._56_4_ = 88.37626;
      auVar52._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar52);
      auVar299._8_4_ = -88.37626;
      auVar299._12_4_ = -88.37626;
      auVar299._0_4_ = -88.37626;
      auVar299._4_4_ = -88.37626;
      auVar299._16_4_ = -88.37626;
      auVar299._20_4_ = -88.37626;
      auVar299._24_4_ = -88.37626;
      auVar299._28_4_ = -88.37626;
      auVar299._32_4_ = -88.37626;
      auVar299._36_4_ = -88.37626;
      auVar299._40_4_ = -88.37626;
      auVar299._44_4_ = -88.37626;
      auVar299._48_4_ = -88.37626;
      auVar299._52_4_ = -88.37626;
      auVar299._56_4_ = -88.37626;
      auVar299._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar299);
      auVar174._8_4_ = 1.442695;
      auVar174._12_4_ = 1.442695;
      auVar174._0_4_ = 1.442695;
      auVar174._4_4_ = 1.442695;
      auVar174._16_4_ = 1.442695;
      auVar174._20_4_ = 1.442695;
      auVar174._24_4_ = 1.442695;
      auVar174._28_4_ = 1.442695;
      auVar174._32_4_ = 1.442695;
      auVar174._36_4_ = 1.442695;
      auVar174._40_4_ = 1.442695;
      auVar174._44_4_ = 1.442695;
      auVar174._48_4_ = 1.442695;
      auVar174._52_4_ = 1.442695;
      auVar174._56_4_ = 1.442695;
      auVar174._60_4_ = 1.442695;
      auVar173._8_4_ = 0.5;
      auVar173._12_4_ = 0.5;
      auVar173._0_4_ = 0.5;
      auVar173._4_4_ = 0.5;
      auVar173._16_4_ = 0.5;
      auVar173._20_4_ = 0.5;
      auVar173._24_4_ = 0.5;
      auVar173._28_4_ = 0.5;
      auVar173._32_4_ = 0.5;
      auVar173._36_4_ = 0.5;
      auVar173._40_4_ = 0.5;
      auVar173._44_4_ = 0.5;
      auVar173._48_4_ = 0.5;
      auVar173._52_4_ = 0.5;
      auVar173._56_4_ = 0.5;
      auVar173._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar174,auVar299,auVar173);
      auVar314 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar314,1);
      uVar19 = (ushort)uVar18;
      auVar205._8_4_ = 1.0;
      auVar205._12_4_ = 1.0;
      auVar205._0_4_ = 1.0;
      auVar205._4_4_ = 1.0;
      auVar205._16_4_ = 1.0;
      auVar205._20_4_ = 1.0;
      auVar205._24_4_ = 1.0;
      auVar205._28_4_ = 1.0;
      auVar205._32_4_ = 1.0;
      auVar205._36_4_ = 1.0;
      auVar205._40_4_ = 1.0;
      auVar205._44_4_ = 1.0;
      auVar205._48_4_ = 1.0;
      auVar205._52_4_ = 1.0;
      auVar205._56_4_ = 1.0;
      auVar205._60_4_ = 1.0;
      local_57c0 = auVar314._0_4_;
      iStack_57bc = auVar314._4_4_;
      iStack_57b8 = auVar314._8_4_;
      iStack_57b4 = auVar314._12_4_;
      iStack_57b0 = auVar314._16_4_;
      iStack_57ac = auVar314._20_4_;
      iStack_57a8 = auVar314._24_4_;
      iStack_57a4 = auVar314._28_4_;
      iStack_57a0 = auVar314._32_4_;
      iStack_579c = auVar314._36_4_;
      iStack_5798 = auVar314._40_4_;
      iStack_5794 = auVar314._44_4_;
      iStack_5790 = auVar314._48_4_;
      iStack_578c = auVar314._52_4_;
      iStack_5788 = auVar314._56_4_;
      iStack_5784 = auVar314._60_4_;
      auVar298 = vsubps_avx512f(auVar314,auVar205);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12c00._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_57bc;
      auStack_12c00._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_57c0;
      auStack_12c00._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_57b8;
      auStack_12c00._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_57b4;
      uStack_12bf0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_57b0;
      uStack_12bf0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_57ac;
      uStack_12be8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_57a8;
      uStack_12be8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_57a4;
      auVar297 = _auStack_12c00;
      uStack_12be0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_57a0;
      uStack_12be0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_579c;
      auVar294 = _auStack_12c00;
      uStack_12bd8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5798;
      uStack_12bd8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5794;
      auVar295 = _auStack_12c00;
      uStack_12bd0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5790;
      uStack_12bd0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_578c;
      auVar293 = _auStack_12c00;
      uStack_12bc8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5788;
      uStack_12bc8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5784;
      auVar298 = _auStack_12c00;
      uStack_12be8 = auVar297._24_8_;
      uStack_12be0 = auVar294._32_8_;
      uStack_12bd8 = auVar295._40_8_;
      uStack_12bd0 = auVar293._48_8_;
      uStack_12bc8 = auVar298._56_8_;
      auVar267._16_8_ = uStack_12bf0;
      auVar267._0_16_ = auStack_12c00;
      auVar267._24_8_ = uStack_12be8;
      auVar267._32_8_ = uStack_12be0;
      auVar267._40_8_ = uStack_12bd8;
      auVar267._48_8_ = uStack_12bd0;
      auVar267._56_8_ = uStack_12bc8;
      auVar266._8_4_ = 0.6933594;
      auVar266._12_4_ = 0.6933594;
      auVar266._0_4_ = 0.6933594;
      auVar266._4_4_ = 0.6933594;
      auVar266._16_4_ = 0.6933594;
      auVar266._20_4_ = 0.6933594;
      auVar266._24_4_ = 0.6933594;
      auVar266._28_4_ = 0.6933594;
      auVar266._32_4_ = 0.6933594;
      auVar266._36_4_ = 0.6933594;
      auVar266._40_4_ = 0.6933594;
      auVar266._44_4_ = 0.6933594;
      auVar266._48_4_ = 0.6933594;
      auVar266._52_4_ = 0.6933594;
      auVar266._56_4_ = 0.6933594;
      auVar266._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar266,auVar267,auVar299);
      auVar265._16_8_ = uStack_12bf0;
      auVar265._0_16_ = auStack_12c00;
      auVar265._24_8_ = uStack_12be8;
      auVar265._32_8_ = uStack_12be0;
      auVar265._40_8_ = uStack_12bd8;
      auVar265._48_8_ = uStack_12bd0;
      auVar265._56_8_ = uStack_12bc8;
      auVar264._8_4_ = -0.00021219444;
      auVar264._12_4_ = -0.00021219444;
      auVar264._0_4_ = -0.00021219444;
      auVar264._4_4_ = -0.00021219444;
      auVar264._16_4_ = -0.00021219444;
      auVar264._20_4_ = -0.00021219444;
      auVar264._24_4_ = -0.00021219444;
      auVar264._28_4_ = -0.00021219444;
      auVar264._32_4_ = -0.00021219444;
      auVar264._36_4_ = -0.00021219444;
      auVar264._40_4_ = -0.00021219444;
      auVar264._44_4_ = -0.00021219444;
      auVar264._48_4_ = -0.00021219444;
      auVar264._52_4_ = -0.00021219444;
      auVar264._56_4_ = -0.00021219444;
      auVar264._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar264,auVar265,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_12cf8._0_4_ = 0.00019875691;
      uStack_12cf8._4_4_ = 0.00019875691;
      auStack_12d00._0_4_ = 0.00019875691;
      auStack_12d00._4_4_ = 0.00019875691;
      auVar172._16_4_ = 0.00019875691;
      auVar172._20_4_ = 0.00019875691;
      auVar172._0_16_ = _auStack_12d00;
      auVar172._24_4_ = 0.00019875691;
      auVar172._28_4_ = 0.00019875691;
      auVar172._32_4_ = 0.00019875691;
      auVar172._36_4_ = 0.00019875691;
      auVar172._40_4_ = 0.00019875691;
      auVar172._44_4_ = 0.00019875691;
      auVar172._48_4_ = 0.00019875691;
      auVar172._52_4_ = 0.00019875691;
      auVar172._56_4_ = 0.00019875691;
      auVar172._60_4_ = 0.00019875691;
      auVar171._8_4_ = 0.0013981999;
      auVar171._12_4_ = 0.0013981999;
      auVar171._0_4_ = 0.0013981999;
      auVar171._4_4_ = 0.0013981999;
      auVar171._16_4_ = 0.0013981999;
      auVar171._20_4_ = 0.0013981999;
      auVar171._24_4_ = 0.0013981999;
      auVar171._28_4_ = 0.0013981999;
      auVar171._32_4_ = 0.0013981999;
      auVar171._36_4_ = 0.0013981999;
      auVar171._40_4_ = 0.0013981999;
      auVar171._44_4_ = 0.0013981999;
      auVar171._48_4_ = 0.0013981999;
      auVar171._52_4_ = 0.0013981999;
      auVar171._56_4_ = 0.0013981999;
      auVar171._60_4_ = 0.0013981999;
      auVar314 = vfmadd213ps_avx512f(auVar298,auVar172,auVar171);
      auVar170._8_4_ = 0.008333452;
      auVar170._12_4_ = 0.008333452;
      auVar170._0_4_ = 0.008333452;
      auVar170._4_4_ = 0.008333452;
      auVar170._16_4_ = 0.008333452;
      auVar170._20_4_ = 0.008333452;
      auVar170._24_4_ = 0.008333452;
      auVar170._28_4_ = 0.008333452;
      auVar170._32_4_ = 0.008333452;
      auVar170._36_4_ = 0.008333452;
      auVar170._40_4_ = 0.008333452;
      auVar170._44_4_ = 0.008333452;
      auVar170._48_4_ = 0.008333452;
      auVar170._52_4_ = 0.008333452;
      auVar170._56_4_ = 0.008333452;
      auVar170._60_4_ = 0.008333452;
      auVar314 = vfmadd213ps_avx512f(auVar298,auVar314,auVar170);
      auVar169._8_4_ = 0.041665796;
      auVar169._12_4_ = 0.041665796;
      auVar169._0_4_ = 0.041665796;
      auVar169._4_4_ = 0.041665796;
      auVar169._16_4_ = 0.041665796;
      auVar169._20_4_ = 0.041665796;
      auVar169._24_4_ = 0.041665796;
      auVar169._28_4_ = 0.041665796;
      auVar169._32_4_ = 0.041665796;
      auVar169._36_4_ = 0.041665796;
      auVar169._40_4_ = 0.041665796;
      auVar169._44_4_ = 0.041665796;
      auVar169._48_4_ = 0.041665796;
      auVar169._52_4_ = 0.041665796;
      auVar169._56_4_ = 0.041665796;
      auVar169._60_4_ = 0.041665796;
      auVar314 = vfmadd213ps_avx512f(auVar298,auVar314,auVar169);
      auVar168._8_4_ = 0.16666666;
      auVar168._12_4_ = 0.16666666;
      auVar168._0_4_ = 0.16666666;
      auVar168._4_4_ = 0.16666666;
      auVar168._16_4_ = 0.16666666;
      auVar168._20_4_ = 0.16666666;
      auVar168._24_4_ = 0.16666666;
      auVar168._28_4_ = 0.16666666;
      auVar168._32_4_ = 0.16666666;
      auVar168._36_4_ = 0.16666666;
      auVar168._40_4_ = 0.16666666;
      auVar168._44_4_ = 0.16666666;
      auVar168._48_4_ = 0.16666666;
      auVar168._52_4_ = 0.16666666;
      auVar168._56_4_ = 0.16666666;
      auVar168._60_4_ = 0.16666666;
      auVar314 = vfmadd213ps_avx512f(auVar298,auVar314,auVar168);
      auVar167._8_4_ = 0.5;
      auVar167._12_4_ = 0.5;
      auVar167._0_4_ = 0.5;
      auVar167._4_4_ = 0.5;
      auVar167._16_4_ = 0.5;
      auVar167._20_4_ = 0.5;
      auVar167._24_4_ = 0.5;
      auVar167._28_4_ = 0.5;
      auVar167._32_4_ = 0.5;
      auVar167._36_4_ = 0.5;
      auVar167._40_4_ = 0.5;
      auVar167._44_4_ = 0.5;
      auVar167._48_4_ = 0.5;
      auVar167._52_4_ = 0.5;
      auVar167._56_4_ = 0.5;
      auVar167._60_4_ = 0.5;
      auVar314 = vfmadd213ps_avx512f(auVar298,auVar314,auVar167);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar314,auVar298);
      auVar33._8_4_ = 1.0;
      auVar33._12_4_ = 1.0;
      auVar33._0_4_ = 1.0;
      auVar33._4_4_ = 1.0;
      auVar33._16_4_ = 1.0;
      auVar33._20_4_ = 1.0;
      auVar33._24_4_ = 1.0;
      auVar33._28_4_ = 1.0;
      auVar33._32_4_ = 1.0;
      auVar33._36_4_ = 1.0;
      auVar33._40_4_ = 1.0;
      auVar33._44_4_ = 1.0;
      auVar33._48_4_ = 1.0;
      auVar33._52_4_ = 1.0;
      auVar33._56_4_ = 1.0;
      auVar33._60_4_ = 1.0;
      auVar314 = vaddps_avx512f(auVar298,auVar33);
      auVar290._16_8_ = uStack_12bf0;
      auVar290._0_16_ = auStack_12c00;
      auVar290._24_8_ = uStack_12be8;
      auVar290._32_8_ = uStack_12be0;
      auVar290._40_8_ = uStack_12bd8;
      auVar290._48_8_ = uStack_12bd0;
      auVar290._56_8_ = uStack_12bc8;
      auVar298 = vcvttps2dq_avx512f(auVar290);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar314 = vmulps_avx512f(auVar314,auVar298);
      auStack_12d00 = auVar314._0_8_;
      uStack_12cf8 = auVar314._8_8_;
      uStack_12cf0 = auVar314._16_8_;
      uStack_12ce8 = auVar314._24_8_;
      uStack_12ce0 = auVar314._32_8_;
      uStack_12cd8 = auVar314._40_8_;
      uStack_12cd0 = auVar314._48_8_;
      uStack_12cc8 = auVar314._56_8_;
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_16658 + 0x3c)));
      auVar298 = vsubps_avx512f(pauStack_16650[0xf],auVar298);
      auVar53._8_4_ = 88.37626;
      auVar53._12_4_ = 88.37626;
      auVar53._0_4_ = 88.37626;
      auVar53._4_4_ = 88.37626;
      auVar53._16_4_ = 88.37626;
      auVar53._20_4_ = 88.37626;
      auVar53._24_4_ = 88.37626;
      auVar53._28_4_ = 88.37626;
      auVar53._32_4_ = 88.37626;
      auVar53._36_4_ = 88.37626;
      auVar53._40_4_ = 88.37626;
      auVar53._44_4_ = 88.37626;
      auVar53._48_4_ = 88.37626;
      auVar53._52_4_ = 88.37626;
      auVar53._56_4_ = 88.37626;
      auVar53._60_4_ = 88.37626;
      auVar299 = vminps_avx512f(auVar298,auVar53);
      auVar298._8_4_ = -88.37626;
      auVar298._12_4_ = -88.37626;
      auVar298._0_4_ = -88.37626;
      auVar298._4_4_ = -88.37626;
      auVar298._16_4_ = -88.37626;
      auVar298._20_4_ = -88.37626;
      auVar298._24_4_ = -88.37626;
      auVar298._28_4_ = -88.37626;
      auVar298._32_4_ = -88.37626;
      auVar298._36_4_ = -88.37626;
      auVar298._40_4_ = -88.37626;
      auVar298._44_4_ = -88.37626;
      auVar298._48_4_ = -88.37626;
      auVar298._52_4_ = -88.37626;
      auVar298._56_4_ = -88.37626;
      auVar298._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar299,auVar298);
      auVar182._8_4_ = 1.442695;
      auVar182._12_4_ = 1.442695;
      auVar182._0_4_ = 1.442695;
      auVar182._4_4_ = 1.442695;
      auVar182._16_4_ = 1.442695;
      auVar182._20_4_ = 1.442695;
      auVar182._24_4_ = 1.442695;
      auVar182._28_4_ = 1.442695;
      auVar182._32_4_ = 1.442695;
      auVar182._36_4_ = 1.442695;
      auVar182._40_4_ = 1.442695;
      auVar182._44_4_ = 1.442695;
      auVar182._48_4_ = 1.442695;
      auVar182._52_4_ = 1.442695;
      auVar182._56_4_ = 1.442695;
      auVar182._60_4_ = 1.442695;
      auVar181._8_4_ = 0.5;
      auVar181._12_4_ = 0.5;
      auVar181._0_4_ = 0.5;
      auVar181._4_4_ = 0.5;
      auVar181._16_4_ = 0.5;
      auVar181._20_4_ = 0.5;
      auVar181._24_4_ = 0.5;
      auVar181._28_4_ = 0.5;
      auVar181._32_4_ = 0.5;
      auVar181._36_4_ = 0.5;
      auVar181._40_4_ = 0.5;
      auVar181._44_4_ = 0.5;
      auVar181._48_4_ = 0.5;
      auVar181._52_4_ = 0.5;
      auVar181._56_4_ = 0.5;
      auVar181._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar182,auVar299,auVar181);
      auVar315 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar315,1);
      uVar19 = (ushort)uVar18;
      auVar206._8_4_ = 1.0;
      auVar206._12_4_ = 1.0;
      auVar206._0_4_ = 1.0;
      auVar206._4_4_ = 1.0;
      auVar206._16_4_ = 1.0;
      auVar206._20_4_ = 1.0;
      auVar206._24_4_ = 1.0;
      auVar206._28_4_ = 1.0;
      auVar206._32_4_ = 1.0;
      auVar206._36_4_ = 1.0;
      auVar206._40_4_ = 1.0;
      auVar206._44_4_ = 1.0;
      auVar206._48_4_ = 1.0;
      auVar206._52_4_ = 1.0;
      auVar206._56_4_ = 1.0;
      auVar206._60_4_ = 1.0;
      local_5640 = auVar315._0_4_;
      iStack_563c = auVar315._4_4_;
      iStack_5638 = auVar315._8_4_;
      iStack_5634 = auVar315._12_4_;
      iStack_5630 = auVar315._16_4_;
      iStack_562c = auVar315._20_4_;
      iStack_5628 = auVar315._24_4_;
      iStack_5624 = auVar315._28_4_;
      iStack_5620 = auVar315._32_4_;
      iStack_561c = auVar315._36_4_;
      iStack_5618 = auVar315._40_4_;
      iStack_5614 = auVar315._44_4_;
      iStack_5610 = auVar315._48_4_;
      iStack_560c = auVar315._52_4_;
      iStack_5608 = auVar315._56_4_;
      iStack_5604 = auVar315._60_4_;
      auVar298 = vsubps_avx512f(auVar315,auVar206);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_12e80._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_563c;
      auStack_12e80._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_5640;
      auStack_12e80._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_5638;
      auStack_12e80._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_5634;
      uStack_12e70._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_5630;
      uStack_12e70._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_562c;
      uStack_12e68._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_5628;
      uStack_12e68._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_5624;
      auVar297 = _auStack_12e80;
      uStack_12e60._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5620;
      uStack_12e60._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_561c;
      auVar294 = _auStack_12e80;
      uStack_12e58._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5618;
      uStack_12e58._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5614;
      auVar295 = _auStack_12e80;
      uStack_12e50._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5610;
      uStack_12e50._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_560c;
      auVar293 = _auStack_12e80;
      uStack_12e48._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5608;
      uStack_12e48._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5604;
      auVar298 = _auStack_12e80;
      uStack_12e68 = auVar297._24_8_;
      uStack_12e60 = auVar294._32_8_;
      uStack_12e58 = auVar295._40_8_;
      uStack_12e50 = auVar293._48_8_;
      uStack_12e48 = auVar298._56_8_;
      auVar271._16_8_ = uStack_12e70;
      auVar271._0_16_ = auStack_12e80;
      auVar271._24_8_ = uStack_12e68;
      auVar271._32_8_ = uStack_12e60;
      auVar271._40_8_ = uStack_12e58;
      auVar271._48_8_ = uStack_12e50;
      auVar271._56_8_ = uStack_12e48;
      auVar270._8_4_ = 0.6933594;
      auVar270._12_4_ = 0.6933594;
      auVar270._0_4_ = 0.6933594;
      auVar270._4_4_ = 0.6933594;
      auVar270._16_4_ = 0.6933594;
      auVar270._20_4_ = 0.6933594;
      auVar270._24_4_ = 0.6933594;
      auVar270._28_4_ = 0.6933594;
      auVar270._32_4_ = 0.6933594;
      auVar270._36_4_ = 0.6933594;
      auVar270._40_4_ = 0.6933594;
      auVar270._44_4_ = 0.6933594;
      auVar270._48_4_ = 0.6933594;
      auVar270._52_4_ = 0.6933594;
      auVar270._56_4_ = 0.6933594;
      auVar270._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar270,auVar271,auVar299);
      auVar269._16_8_ = uStack_12e70;
      auVar269._0_16_ = auStack_12e80;
      auVar269._24_8_ = uStack_12e68;
      auVar269._32_8_ = uStack_12e60;
      auVar269._40_8_ = uStack_12e58;
      auVar269._48_8_ = uStack_12e50;
      auVar269._56_8_ = uStack_12e48;
      auVar268._8_4_ = -0.00021219444;
      auVar268._12_4_ = -0.00021219444;
      auVar268._0_4_ = -0.00021219444;
      auVar268._4_4_ = -0.00021219444;
      auVar268._16_4_ = -0.00021219444;
      auVar268._20_4_ = -0.00021219444;
      auVar268._24_4_ = -0.00021219444;
      auVar268._28_4_ = -0.00021219444;
      auVar268._32_4_ = -0.00021219444;
      auVar268._36_4_ = -0.00021219444;
      auVar268._40_4_ = -0.00021219444;
      auVar268._44_4_ = -0.00021219444;
      auVar268._48_4_ = -0.00021219444;
      auVar268._52_4_ = -0.00021219444;
      auVar268._56_4_ = -0.00021219444;
      auVar268._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar268,auVar269,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_12f78._0_4_ = 0.00019875691;
      uStack_12f78._4_4_ = 0.00019875691;
      auStack_12f80._0_4_ = 0.00019875691;
      auStack_12f80._4_4_ = 0.00019875691;
      auVar180._16_4_ = 0.00019875691;
      auVar180._20_4_ = 0.00019875691;
      auVar180._0_16_ = _auStack_12f80;
      auVar180._24_4_ = 0.00019875691;
      auVar180._28_4_ = 0.00019875691;
      auVar180._32_4_ = 0.00019875691;
      auVar180._36_4_ = 0.00019875691;
      auVar180._40_4_ = 0.00019875691;
      auVar180._44_4_ = 0.00019875691;
      auVar180._48_4_ = 0.00019875691;
      auVar180._52_4_ = 0.00019875691;
      auVar180._56_4_ = 0.00019875691;
      auVar180._60_4_ = 0.00019875691;
      auVar179._8_4_ = 0.0013981999;
      auVar179._12_4_ = 0.0013981999;
      auVar179._0_4_ = 0.0013981999;
      auVar179._4_4_ = 0.0013981999;
      auVar179._16_4_ = 0.0013981999;
      auVar179._20_4_ = 0.0013981999;
      auVar179._24_4_ = 0.0013981999;
      auVar179._28_4_ = 0.0013981999;
      auVar179._32_4_ = 0.0013981999;
      auVar179._36_4_ = 0.0013981999;
      auVar179._40_4_ = 0.0013981999;
      auVar179._44_4_ = 0.0013981999;
      auVar179._48_4_ = 0.0013981999;
      auVar179._52_4_ = 0.0013981999;
      auVar179._56_4_ = 0.0013981999;
      auVar179._60_4_ = 0.0013981999;
      auVar315 = vfmadd213ps_avx512f(auVar298,auVar180,auVar179);
      auVar178._8_4_ = 0.008333452;
      auVar178._12_4_ = 0.008333452;
      auVar178._0_4_ = 0.008333452;
      auVar178._4_4_ = 0.008333452;
      auVar178._16_4_ = 0.008333452;
      auVar178._20_4_ = 0.008333452;
      auVar178._24_4_ = 0.008333452;
      auVar178._28_4_ = 0.008333452;
      auVar178._32_4_ = 0.008333452;
      auVar178._36_4_ = 0.008333452;
      auVar178._40_4_ = 0.008333452;
      auVar178._44_4_ = 0.008333452;
      auVar178._48_4_ = 0.008333452;
      auVar178._52_4_ = 0.008333452;
      auVar178._56_4_ = 0.008333452;
      auVar178._60_4_ = 0.008333452;
      auVar315 = vfmadd213ps_avx512f(auVar298,auVar315,auVar178);
      auVar177._8_4_ = 0.041665796;
      auVar177._12_4_ = 0.041665796;
      auVar177._0_4_ = 0.041665796;
      auVar177._4_4_ = 0.041665796;
      auVar177._16_4_ = 0.041665796;
      auVar177._20_4_ = 0.041665796;
      auVar177._24_4_ = 0.041665796;
      auVar177._28_4_ = 0.041665796;
      auVar177._32_4_ = 0.041665796;
      auVar177._36_4_ = 0.041665796;
      auVar177._40_4_ = 0.041665796;
      auVar177._44_4_ = 0.041665796;
      auVar177._48_4_ = 0.041665796;
      auVar177._52_4_ = 0.041665796;
      auVar177._56_4_ = 0.041665796;
      auVar177._60_4_ = 0.041665796;
      auVar315 = vfmadd213ps_avx512f(auVar298,auVar315,auVar177);
      auVar176._8_4_ = 0.16666666;
      auVar176._12_4_ = 0.16666666;
      auVar176._0_4_ = 0.16666666;
      auVar176._4_4_ = 0.16666666;
      auVar176._16_4_ = 0.16666666;
      auVar176._20_4_ = 0.16666666;
      auVar176._24_4_ = 0.16666666;
      auVar176._28_4_ = 0.16666666;
      auVar176._32_4_ = 0.16666666;
      auVar176._36_4_ = 0.16666666;
      auVar176._40_4_ = 0.16666666;
      auVar176._44_4_ = 0.16666666;
      auVar176._48_4_ = 0.16666666;
      auVar176._52_4_ = 0.16666666;
      auVar176._56_4_ = 0.16666666;
      auVar176._60_4_ = 0.16666666;
      auVar315 = vfmadd213ps_avx512f(auVar298,auVar315,auVar176);
      auVar175._8_4_ = 0.5;
      auVar175._12_4_ = 0.5;
      auVar175._0_4_ = 0.5;
      auVar175._4_4_ = 0.5;
      auVar175._16_4_ = 0.5;
      auVar175._20_4_ = 0.5;
      auVar175._24_4_ = 0.5;
      auVar175._28_4_ = 0.5;
      auVar175._32_4_ = 0.5;
      auVar175._36_4_ = 0.5;
      auVar175._40_4_ = 0.5;
      auVar175._44_4_ = 0.5;
      auVar175._48_4_ = 0.5;
      auVar175._52_4_ = 0.5;
      auVar175._56_4_ = 0.5;
      auVar175._60_4_ = 0.5;
      auVar315 = vfmadd213ps_avx512f(auVar298,auVar315,auVar175);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar315,auVar298);
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      auVar315 = vaddps_avx512f(auVar298,auVar34);
      auVar291._16_8_ = uStack_12e70;
      auVar291._0_16_ = auStack_12e80;
      auVar291._24_8_ = uStack_12e68;
      auVar291._32_8_ = uStack_12e60;
      auVar291._40_8_ = uStack_12e58;
      auVar291._48_8_ = uStack_12e50;
      auVar291._56_8_ = uStack_12e48;
      auVar298 = vcvttps2dq_avx512f(auVar291);
      vmovdqa64_avx512f(auVar318);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmulps_avx512f(auVar315,auVar298);
      auStack_12f80 = auVar298._0_8_;
      uStack_12f78 = auVar298._8_8_;
      uStack_12f70 = auVar298._16_8_;
      uStack_12f68 = auVar298._24_8_;
      uStack_12f60 = auVar298._32_8_;
      uStack_12f58 = auVar298._40_8_;
      uStack_12f50 = auVar298._48_8_;
      uStack_12f48 = auVar298._56_8_;
      *(undefined1 (*) [8])*pauStack_16650 = auStack_10a00;
      *(undefined8 *)(*pauStack_16650 + 8) = uStack_109f8;
      *(undefined8 *)(*pauStack_16650 + 0x10) = uStack_109f0;
      *(undefined8 *)(*pauStack_16650 + 0x18) = uStack_109e8;
      *(undefined8 *)(*pauStack_16650 + 0x20) = uStack_109e0;
      *(undefined8 *)(*pauStack_16650 + 0x28) = uStack_109d8;
      *(undefined8 *)(*pauStack_16650 + 0x30) = uStack_109d0;
      *(undefined8 *)(*pauStack_16650 + 0x38) = uStack_109c8;
      *(undefined1 (*) [8])pauStack_16650[1] = auStack_10c80;
      *(undefined8 *)(pauStack_16650[1] + 8) = uStack_10c78;
      *(undefined8 *)(pauStack_16650[1] + 0x10) = uStack_10c70;
      *(undefined8 *)(pauStack_16650[1] + 0x18) = uStack_10c68;
      *(undefined8 *)(pauStack_16650[1] + 0x20) = uStack_10c60;
      *(undefined8 *)(pauStack_16650[1] + 0x28) = uStack_10c58;
      *(undefined8 *)(pauStack_16650[1] + 0x30) = uStack_10c50;
      *(undefined8 *)(pauStack_16650[1] + 0x38) = uStack_10c48;
      *(undefined1 (*) [8])pauStack_16650[2] = auStack_10f00;
      *(undefined8 *)(pauStack_16650[2] + 8) = uStack_10ef8;
      *(undefined8 *)(pauStack_16650[2] + 0x10) = uStack_10ef0;
      *(undefined8 *)(pauStack_16650[2] + 0x18) = uStack_10ee8;
      *(undefined8 *)(pauStack_16650[2] + 0x20) = uStack_10ee0;
      *(undefined8 *)(pauStack_16650[2] + 0x28) = uStack_10ed8;
      *(undefined8 *)(pauStack_16650[2] + 0x30) = uStack_10ed0;
      *(undefined8 *)(pauStack_16650[2] + 0x38) = uStack_10ec8;
      *(undefined1 (*) [8])pauStack_16650[3] = auStack_11180;
      *(undefined8 *)(pauStack_16650[3] + 8) = uStack_11178;
      *(undefined8 *)(pauStack_16650[3] + 0x10) = uStack_11170;
      *(undefined8 *)(pauStack_16650[3] + 0x18) = uStack_11168;
      *(undefined8 *)(pauStack_16650[3] + 0x20) = uStack_11160;
      *(undefined8 *)(pauStack_16650[3] + 0x28) = uStack_11158;
      *(undefined8 *)(pauStack_16650[3] + 0x30) = uStack_11150;
      *(undefined8 *)(pauStack_16650[3] + 0x38) = uStack_11148;
      *(undefined1 (*) [8])pauStack_16650[4] = auStack_11400;
      *(undefined8 *)(pauStack_16650[4] + 8) = uStack_113f8;
      *(undefined8 *)(pauStack_16650[4] + 0x10) = uStack_113f0;
      *(undefined8 *)(pauStack_16650[4] + 0x18) = uStack_113e8;
      *(undefined8 *)(pauStack_16650[4] + 0x20) = uStack_113e0;
      *(undefined8 *)(pauStack_16650[4] + 0x28) = uStack_113d8;
      *(undefined8 *)(pauStack_16650[4] + 0x30) = uStack_113d0;
      *(undefined8 *)(pauStack_16650[4] + 0x38) = uStack_113c8;
      *(undefined1 (*) [8])pauStack_16650[5] = auStack_11680;
      *(undefined8 *)(pauStack_16650[5] + 8) = uStack_11678;
      *(undefined8 *)(pauStack_16650[5] + 0x10) = uStack_11670;
      *(undefined8 *)(pauStack_16650[5] + 0x18) = uStack_11668;
      *(undefined8 *)(pauStack_16650[5] + 0x20) = uStack_11660;
      *(undefined8 *)(pauStack_16650[5] + 0x28) = uStack_11658;
      *(undefined8 *)(pauStack_16650[5] + 0x30) = uStack_11650;
      *(undefined8 *)(pauStack_16650[5] + 0x38) = uStack_11648;
      *(undefined1 (*) [8])pauStack_16650[6] = auStack_11900;
      *(undefined8 *)(pauStack_16650[6] + 8) = uStack_118f8;
      *(undefined8 *)(pauStack_16650[6] + 0x10) = uStack_118f0;
      *(undefined8 *)(pauStack_16650[6] + 0x18) = uStack_118e8;
      *(undefined8 *)(pauStack_16650[6] + 0x20) = uStack_118e0;
      *(undefined8 *)(pauStack_16650[6] + 0x28) = uStack_118d8;
      *(undefined8 *)(pauStack_16650[6] + 0x30) = uStack_118d0;
      *(undefined8 *)(pauStack_16650[6] + 0x38) = uStack_118c8;
      *(undefined1 (*) [8])pauStack_16650[7] = auStack_11b80;
      *(undefined8 *)(pauStack_16650[7] + 8) = uStack_11b78;
      *(undefined8 *)(pauStack_16650[7] + 0x10) = uStack_11b70;
      *(undefined8 *)(pauStack_16650[7] + 0x18) = uStack_11b68;
      *(undefined8 *)(pauStack_16650[7] + 0x20) = uStack_11b60;
      *(undefined8 *)(pauStack_16650[7] + 0x28) = uStack_11b58;
      *(undefined8 *)(pauStack_16650[7] + 0x30) = uStack_11b50;
      *(undefined8 *)(pauStack_16650[7] + 0x38) = uStack_11b48;
      *(undefined1 (*) [8])pauStack_16650[8] = auStack_11e00;
      *(undefined8 *)(pauStack_16650[8] + 8) = uStack_11df8;
      *(undefined8 *)(pauStack_16650[8] + 0x10) = uStack_11df0;
      *(undefined8 *)(pauStack_16650[8] + 0x18) = uStack_11de8;
      *(undefined8 *)(pauStack_16650[8] + 0x20) = uStack_11de0;
      *(undefined8 *)(pauStack_16650[8] + 0x28) = uStack_11dd8;
      *(undefined8 *)(pauStack_16650[8] + 0x30) = uStack_11dd0;
      *(undefined8 *)(pauStack_16650[8] + 0x38) = uStack_11dc8;
      *(undefined1 (*) [8])pauStack_16650[9] = auStack_12080;
      *(undefined8 *)(pauStack_16650[9] + 8) = uStack_12078;
      *(undefined8 *)(pauStack_16650[9] + 0x10) = uStack_12070;
      *(undefined8 *)(pauStack_16650[9] + 0x18) = uStack_12068;
      *(undefined8 *)(pauStack_16650[9] + 0x20) = uStack_12060;
      *(undefined8 *)(pauStack_16650[9] + 0x28) = uStack_12058;
      *(undefined8 *)(pauStack_16650[9] + 0x30) = uStack_12050;
      *(undefined8 *)(pauStack_16650[9] + 0x38) = uStack_12048;
      *(undefined1 (*) [8])pauStack_16650[10] = auStack_12300;
      *(undefined8 *)(pauStack_16650[10] + 8) = uStack_122f8;
      *(undefined8 *)(pauStack_16650[10] + 0x10) = uStack_122f0;
      *(undefined8 *)(pauStack_16650[10] + 0x18) = uStack_122e8;
      *(undefined8 *)(pauStack_16650[10] + 0x20) = uStack_122e0;
      *(undefined8 *)(pauStack_16650[10] + 0x28) = uStack_122d8;
      *(undefined8 *)(pauStack_16650[10] + 0x30) = uStack_122d0;
      *(undefined8 *)(pauStack_16650[10] + 0x38) = uStack_122c8;
      *(undefined1 (*) [8])pauStack_16650[0xb] = auStack_12580;
      *(undefined8 *)(pauStack_16650[0xb] + 8) = uStack_12578;
      *(undefined8 *)(pauStack_16650[0xb] + 0x10) = uStack_12570;
      *(undefined8 *)(pauStack_16650[0xb] + 0x18) = uStack_12568;
      *(undefined8 *)(pauStack_16650[0xb] + 0x20) = uStack_12560;
      *(undefined8 *)(pauStack_16650[0xb] + 0x28) = uStack_12558;
      *(undefined8 *)(pauStack_16650[0xb] + 0x30) = uStack_12550;
      *(undefined8 *)(pauStack_16650[0xb] + 0x38) = uStack_12548;
      *(undefined1 (*) [8])pauStack_16650[0xc] = auStack_12800;
      *(undefined8 *)(pauStack_16650[0xc] + 8) = uStack_127f8;
      *(undefined8 *)(pauStack_16650[0xc] + 0x10) = uStack_127f0;
      *(undefined8 *)(pauStack_16650[0xc] + 0x18) = uStack_127e8;
      *(undefined8 *)(pauStack_16650[0xc] + 0x20) = uStack_127e0;
      *(undefined8 *)(pauStack_16650[0xc] + 0x28) = uStack_127d8;
      *(undefined8 *)(pauStack_16650[0xc] + 0x30) = uStack_127d0;
      *(undefined8 *)(pauStack_16650[0xc] + 0x38) = uStack_127c8;
      *(undefined1 (*) [8])pauStack_16650[0xd] = auStack_12a80;
      *(undefined8 *)(pauStack_16650[0xd] + 8) = uStack_12a78;
      *(undefined8 *)(pauStack_16650[0xd] + 0x10) = uStack_12a70;
      *(undefined8 *)(pauStack_16650[0xd] + 0x18) = uStack_12a68;
      *(undefined8 *)(pauStack_16650[0xd] + 0x20) = uStack_12a60;
      *(undefined8 *)(pauStack_16650[0xd] + 0x28) = uStack_12a58;
      *(undefined8 *)(pauStack_16650[0xd] + 0x30) = uStack_12a50;
      *(undefined8 *)(pauStack_16650[0xd] + 0x38) = uStack_12a48;
      *(undefined1 (*) [8])pauStack_16650[0xe] = auStack_12d00;
      *(undefined8 *)(pauStack_16650[0xe] + 8) = uStack_12cf8;
      *(undefined8 *)(pauStack_16650[0xe] + 0x10) = uStack_12cf0;
      *(undefined8 *)(pauStack_16650[0xe] + 0x18) = uStack_12ce8;
      *(undefined8 *)(pauStack_16650[0xe] + 0x20) = uStack_12ce0;
      *(undefined8 *)(pauStack_16650[0xe] + 0x28) = uStack_12cd8;
      *(undefined8 *)(pauStack_16650[0xe] + 0x30) = uStack_12cd0;
      *(undefined8 *)(pauStack_16650[0xe] + 0x38) = uStack_12cc8;
      *(undefined1 (*) [8])pauStack_16650[0xf] = auStack_12f80;
      *(undefined8 *)(pauStack_16650[0xf] + 8) = uStack_12f78;
      *(undefined8 *)(pauStack_16650[0xf] + 0x10) = uStack_12f70;
      *(undefined8 *)(pauStack_16650[0xf] + 0x18) = uStack_12f68;
      *(undefined8 *)(pauStack_16650[0xf] + 0x20) = uStack_12f60;
      *(undefined8 *)(pauStack_16650[0xf] + 0x28) = uStack_12f58;
      *(undefined8 *)(pauStack_16650[0xf] + 0x30) = uStack_12f50;
      *(undefined8 *)(pauStack_16650[0xf] + 0x38) = uStack_12f48;
      auVar299 = vunpcklps_avx512f(auVar306,auVar307);
      auVar307 = vunpckhps_avx512f(auVar306,auVar307);
      auVar306 = vunpcklps_avx512f(auVar308,auVar309);
      auVar309 = vunpckhps_avx512f(auVar308,auVar309);
      auVar308 = vunpcklps_avx512f(auVar310,auVar311);
      auVar311 = vunpckhps_avx512f(auVar310,auVar311);
      auVar310 = vunpcklps_avx512f(auVar312,auVar313);
      auVar313 = vunpckhps_avx512f(auVar312,auVar313);
      auVar312 = vunpcklps_avx512f(auVar305,auVar304);
      auVar304 = vunpckhps_avx512f(auVar305,auVar304);
      auVar305 = vunpcklps_avx512f(auVar303,auVar302);
      auVar302 = vunpckhps_avx512f(auVar303,auVar302);
      auVar303 = vunpcklps_avx512f(auVar301,auVar300);
      auVar300 = vunpckhps_avx512f(auVar301,auVar300);
      auVar301 = vunpcklps_avx512f(auVar314,auVar298);
      auVar298 = vunpckhps_avx512f(auVar314,auVar298);
      auVar299 = vaddps_avx512f(auVar299,auVar307);
      auVar309 = vaddps_avx512f(auVar306,auVar309);
      auVar311 = vaddps_avx512f(auVar308,auVar311);
      auVar313 = vaddps_avx512f(auVar310,auVar313);
      auVar304 = vaddps_avx512f(auVar312,auVar304);
      auVar302 = vaddps_avx512f(auVar305,auVar302);
      auVar300 = vaddps_avx512f(auVar303,auVar300);
      auVar298 = vaddps_avx512f(auVar301,auVar298);
      auVar301 = vunpcklpd_avx512f(auVar299,auVar309);
      auVar299 = vunpckhpd_avx512f(auVar299,auVar309);
      auVar303 = vunpcklpd_avx512f(auVar311,auVar313);
      auVar305 = vunpckhpd_avx512f(auVar311,auVar313);
      auVar313 = vunpcklpd_avx512f(auVar304,auVar302);
      auVar302 = vunpckhpd_avx512f(auVar304,auVar302);
      auVar304 = vunpcklpd_avx512f(auVar300,auVar298);
      auVar298 = vunpckhpd_avx512f(auVar300,auVar298);
      auVar299 = vaddps_avx512f(auVar301,auVar299);
      auVar300 = vaddps_avx512f(auVar303,auVar305);
      auVar301 = vaddps_avx512f(auVar313,auVar302);
      auVar298 = vaddps_avx512f(auVar304,auVar298);
      auStack_17100 = auVar300._0_32_;
      auVar302 = vinsertf64x4_avx512f(auVar299,auStack_17100,1);
      auVar299 = vshuff64x2_avx512f(auVar299,auVar300,0xee);
      auStack_17180 = auVar298._0_32_;
      auVar300 = vinsertf64x4_avx512f(auVar301,auStack_17180,1);
      auVar298 = vshuff64x2_avx512f(auVar301,auVar298,0xee);
      auVar299 = vaddps_avx512f(auVar302,auVar299);
      auVar298 = vaddps_avx512f(auVar300,auVar298);
      auVar300 = vshuff64x2_avx512f(auVar299,auVar298,0x88);
      auVar298 = vshuff64x2_avx512f(auVar299,auVar298,0xdd);
      auVar298 = vaddps_avx512f(auVar300,auVar298);
      auVar298 = vaddps_avx512f(*pauStack_16660,auVar298);
      uStack_17280 = auVar298._0_8_;
      uStack_17278 = auVar298._8_8_;
      uStack_17270 = auVar298._16_8_;
      uStack_17268 = auVar298._24_8_;
      uStack_17260 = auVar298._32_8_;
      uStack_17258 = auVar298._40_8_;
      uStack_17250 = auVar298._48_8_;
      uStack_17248 = auVar298._56_8_;
      *(undefined8 *)*pauStack_16660 = uStack_17280;
      *(undefined8 *)(*pauStack_16660 + 8) = uStack_17278;
      *(undefined8 *)(*pauStack_16660 + 0x10) = uStack_17270;
      *(undefined8 *)(*pauStack_16660 + 0x18) = uStack_17268;
      *(undefined8 *)(*pauStack_16660 + 0x20) = uStack_17260;
      *(undefined8 *)(*pauStack_16660 + 0x28) = uStack_17258;
      *(undefined8 *)(*pauStack_16660 + 0x30) = uStack_17250;
      *(undefined8 *)(*pauStack_16660 + 0x38) = uStack_17248;
      pauStack_16650 = pauStack_16650 + 0x10;
      pauStack_16658 = pauStack_16658 + 1;
      pauStack_16660 = pauStack_16660 + 1;
    }
    for (; iStack_16664 < iStack_15994; iStack_16664 = iStack_16664 + 1) {
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauStack_16658));
      auVar298 = vsubps_avx512f(*pauStack_16650,auVar298);
      auVar54._8_4_ = 88.37626;
      auVar54._12_4_ = 88.37626;
      auVar54._0_4_ = 88.37626;
      auVar54._4_4_ = 88.37626;
      auVar54._16_4_ = 88.37626;
      auVar54._20_4_ = 88.37626;
      auVar54._24_4_ = 88.37626;
      auVar54._28_4_ = 88.37626;
      auVar54._32_4_ = 88.37626;
      auVar54._36_4_ = 88.37626;
      auVar54._40_4_ = 88.37626;
      auVar54._44_4_ = 88.37626;
      auVar54._48_4_ = 88.37626;
      auVar54._52_4_ = 88.37626;
      auVar54._56_4_ = 88.37626;
      auVar54._60_4_ = 88.37626;
      auVar298 = vminps_avx512f(auVar298,auVar54);
      auVar20._8_4_ = -88.37626;
      auVar20._12_4_ = -88.37626;
      auVar20._0_4_ = -88.37626;
      auVar20._4_4_ = -88.37626;
      auVar20._16_4_ = -88.37626;
      auVar20._20_4_ = -88.37626;
      auVar20._24_4_ = -88.37626;
      auVar20._28_4_ = -88.37626;
      auVar20._32_4_ = -88.37626;
      auVar20._36_4_ = -88.37626;
      auVar20._40_4_ = -88.37626;
      auVar20._44_4_ = -88.37626;
      auVar20._48_4_ = -88.37626;
      auVar20._52_4_ = -88.37626;
      auVar20._56_4_ = -88.37626;
      auVar20._60_4_ = -88.37626;
      auVar299 = vmaxps_avx512f(auVar298,auVar20);
      auVar190._8_4_ = 1.442695;
      auVar190._12_4_ = 1.442695;
      auVar190._0_4_ = 1.442695;
      auVar190._4_4_ = 1.442695;
      auVar190._16_4_ = 1.442695;
      auVar190._20_4_ = 1.442695;
      auVar190._24_4_ = 1.442695;
      auVar190._28_4_ = 1.442695;
      auVar190._32_4_ = 1.442695;
      auVar190._36_4_ = 1.442695;
      auVar190._40_4_ = 1.442695;
      auVar190._44_4_ = 1.442695;
      auVar190._48_4_ = 1.442695;
      auVar190._52_4_ = 1.442695;
      auVar190._56_4_ = 1.442695;
      auVar190._60_4_ = 1.442695;
      auVar189._8_4_ = 0.5;
      auVar189._12_4_ = 0.5;
      auVar189._0_4_ = 0.5;
      auVar189._4_4_ = 0.5;
      auVar189._16_4_ = 0.5;
      auVar189._20_4_ = 0.5;
      auVar189._24_4_ = 0.5;
      auVar189._28_4_ = 0.5;
      auVar189._32_4_ = 0.5;
      auVar189._36_4_ = 0.5;
      auVar189._40_4_ = 0.5;
      auVar189._44_4_ = 0.5;
      auVar189._48_4_ = 0.5;
      auVar189._52_4_ = 0.5;
      auVar189._56_4_ = 0.5;
      auVar189._60_4_ = 0.5;
      auVar298 = vfmadd213ps_avx512f(auVar190,auVar299,auVar189);
      auVar300 = vrndscaleps_avx512f(auVar298,1);
      uVar18 = vcmpps_avx512f(auVar298,auVar300,1);
      uVar19 = (ushort)uVar18;
      auVar207._8_4_ = 1.0;
      auVar207._12_4_ = 1.0;
      auVar207._0_4_ = 1.0;
      auVar207._4_4_ = 1.0;
      auVar207._16_4_ = 1.0;
      auVar207._20_4_ = 1.0;
      auVar207._24_4_ = 1.0;
      auVar207._28_4_ = 1.0;
      auVar207._32_4_ = 1.0;
      auVar207._36_4_ = 1.0;
      auVar207._40_4_ = 1.0;
      auVar207._44_4_ = 1.0;
      auVar207._48_4_ = 1.0;
      auVar207._52_4_ = 1.0;
      auVar207._56_4_ = 1.0;
      auVar207._60_4_ = 1.0;
      local_54c0 = auVar300._0_4_;
      iStack_54bc = auVar300._4_4_;
      iStack_54b8 = auVar300._8_4_;
      iStack_54b4 = auVar300._12_4_;
      iStack_54b0 = auVar300._16_4_;
      iStack_54ac = auVar300._20_4_;
      iStack_54a8 = auVar300._24_4_;
      iStack_54a4 = auVar300._28_4_;
      iStack_54a0 = auVar300._32_4_;
      iStack_549c = auVar300._36_4_;
      iStack_5498 = auVar300._40_4_;
      iStack_5494 = auVar300._44_4_;
      iStack_5490 = auVar300._48_4_;
      iStack_548c = auVar300._52_4_;
      iStack_5488 = auVar300._56_4_;
      iStack_5484 = auVar300._60_4_;
      auVar298 = vsubps_avx512f(auVar300,auVar207);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar19 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar18 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      auStack_13100._4_4_ = (uint)bVar2 * auVar298._4_4_ | (uint)!bVar2 * iStack_54bc;
      auStack_13100._0_4_ = (uint)bVar1 * auVar298._0_4_ | (uint)!bVar1 * local_54c0;
      auStack_13100._8_4_ = (uint)bVar3 * auVar298._8_4_ | (uint)!bVar3 * iStack_54b8;
      auStack_13100._12_4_ = (uint)bVar4 * auVar298._12_4_ | (uint)!bVar4 * iStack_54b4;
      uStack_130f0._0_4_ = (uint)bVar5 * auVar298._16_4_ | (uint)!bVar5 * iStack_54b0;
      uStack_130f0._4_4_ = (uint)bVar6 * auVar298._20_4_ | (uint)!bVar6 * iStack_54ac;
      uStack_130e8._0_4_ = (uint)bVar7 * auVar298._24_4_ | (uint)!bVar7 * iStack_54a8;
      uStack_130e8._4_4_ = (uint)bVar8 * auVar298._28_4_ | (uint)!bVar8 * iStack_54a4;
      auVar297 = _auStack_13100;
      uStack_130e0._0_4_ =
           (uint)(bVar9 & 1) * auVar298._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_54a0;
      uStack_130e0._4_4_ = (uint)bVar10 * auVar298._36_4_ | (uint)!bVar10 * iStack_549c;
      auVar294 = _auStack_13100;
      uStack_130d8._0_4_ = (uint)bVar11 * auVar298._40_4_ | (uint)!bVar11 * iStack_5498;
      uStack_130d8._4_4_ = (uint)bVar12 * auVar298._44_4_ | (uint)!bVar12 * iStack_5494;
      auVar295 = _auStack_13100;
      uStack_130d0._0_4_ = (uint)bVar13 * auVar298._48_4_ | (uint)!bVar13 * iStack_5490;
      uStack_130d0._4_4_ = (uint)bVar14 * auVar298._52_4_ | (uint)!bVar14 * iStack_548c;
      auVar293 = _auStack_13100;
      uStack_130c8._0_4_ = (uint)bVar15 * auVar298._56_4_ | (uint)!bVar15 * iStack_5488;
      uStack_130c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar298._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5484;
      auVar298 = _auStack_13100;
      uStack_130e8 = auVar297._24_8_;
      uStack_130e0 = auVar294._32_8_;
      uStack_130d8 = auVar295._40_8_;
      uStack_130d0 = auVar293._48_8_;
      uStack_130c8 = auVar298._56_8_;
      auVar275._16_8_ = uStack_130f0;
      auVar275._0_16_ = auStack_13100;
      auVar275._24_8_ = uStack_130e8;
      auVar275._32_8_ = uStack_130e0;
      auVar275._40_8_ = uStack_130d8;
      auVar275._48_8_ = uStack_130d0;
      auVar275._56_8_ = uStack_130c8;
      auVar274._8_4_ = 0.6933594;
      auVar274._12_4_ = 0.6933594;
      auVar274._0_4_ = 0.6933594;
      auVar274._4_4_ = 0.6933594;
      auVar274._16_4_ = 0.6933594;
      auVar274._20_4_ = 0.6933594;
      auVar274._24_4_ = 0.6933594;
      auVar274._28_4_ = 0.6933594;
      auVar274._32_4_ = 0.6933594;
      auVar274._36_4_ = 0.6933594;
      auVar274._40_4_ = 0.6933594;
      auVar274._44_4_ = 0.6933594;
      auVar274._48_4_ = 0.6933594;
      auVar274._52_4_ = 0.6933594;
      auVar274._56_4_ = 0.6933594;
      auVar274._60_4_ = 0.6933594;
      auVar298 = vfnmadd213ps_avx512f(auVar274,auVar275,auVar299);
      auVar273._16_8_ = uStack_130f0;
      auVar273._0_16_ = auStack_13100;
      auVar273._24_8_ = uStack_130e8;
      auVar273._32_8_ = uStack_130e0;
      auVar273._40_8_ = uStack_130d8;
      auVar273._48_8_ = uStack_130d0;
      auVar273._56_8_ = uStack_130c8;
      auVar272._8_4_ = -0.00021219444;
      auVar272._12_4_ = -0.00021219444;
      auVar272._0_4_ = -0.00021219444;
      auVar272._4_4_ = -0.00021219444;
      auVar272._16_4_ = -0.00021219444;
      auVar272._20_4_ = -0.00021219444;
      auVar272._24_4_ = -0.00021219444;
      auVar272._28_4_ = -0.00021219444;
      auVar272._32_4_ = -0.00021219444;
      auVar272._36_4_ = -0.00021219444;
      auVar272._40_4_ = -0.00021219444;
      auVar272._44_4_ = -0.00021219444;
      auVar272._48_4_ = -0.00021219444;
      auVar272._52_4_ = -0.00021219444;
      auVar272._56_4_ = -0.00021219444;
      auVar272._60_4_ = -0.00021219444;
      auVar298 = vfnmadd213ps_avx512f(auVar272,auVar273,auVar298);
      auVar299 = vmulps_avx512f(auVar298,auVar298);
      uStack_131f8._0_4_ = 0.00019875691;
      uStack_131f8._4_4_ = 0.00019875691;
      auStack_13200._0_4_ = 0.00019875691;
      auStack_13200._4_4_ = 0.00019875691;
      auVar188._16_4_ = 0.00019875691;
      auVar188._20_4_ = 0.00019875691;
      auVar188._0_16_ = _auStack_13200;
      auVar188._24_4_ = 0.00019875691;
      auVar188._28_4_ = 0.00019875691;
      auVar188._32_4_ = 0.00019875691;
      auVar188._36_4_ = 0.00019875691;
      auVar188._40_4_ = 0.00019875691;
      auVar188._44_4_ = 0.00019875691;
      auVar188._48_4_ = 0.00019875691;
      auVar188._52_4_ = 0.00019875691;
      auVar188._56_4_ = 0.00019875691;
      auVar188._60_4_ = 0.00019875691;
      auVar187._8_4_ = 0.0013981999;
      auVar187._12_4_ = 0.0013981999;
      auVar187._0_4_ = 0.0013981999;
      auVar187._4_4_ = 0.0013981999;
      auVar187._16_4_ = 0.0013981999;
      auVar187._20_4_ = 0.0013981999;
      auVar187._24_4_ = 0.0013981999;
      auVar187._28_4_ = 0.0013981999;
      auVar187._32_4_ = 0.0013981999;
      auVar187._36_4_ = 0.0013981999;
      auVar187._40_4_ = 0.0013981999;
      auVar187._44_4_ = 0.0013981999;
      auVar187._48_4_ = 0.0013981999;
      auVar187._52_4_ = 0.0013981999;
      auVar187._56_4_ = 0.0013981999;
      auVar187._60_4_ = 0.0013981999;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar188,auVar187);
      auVar186._8_4_ = 0.008333452;
      auVar186._12_4_ = 0.008333452;
      auVar186._0_4_ = 0.008333452;
      auVar186._4_4_ = 0.008333452;
      auVar186._16_4_ = 0.008333452;
      auVar186._20_4_ = 0.008333452;
      auVar186._24_4_ = 0.008333452;
      auVar186._28_4_ = 0.008333452;
      auVar186._32_4_ = 0.008333452;
      auVar186._36_4_ = 0.008333452;
      auVar186._40_4_ = 0.008333452;
      auVar186._44_4_ = 0.008333452;
      auVar186._48_4_ = 0.008333452;
      auVar186._52_4_ = 0.008333452;
      auVar186._56_4_ = 0.008333452;
      auVar186._60_4_ = 0.008333452;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar186);
      auVar185._8_4_ = 0.041665796;
      auVar185._12_4_ = 0.041665796;
      auVar185._0_4_ = 0.041665796;
      auVar185._4_4_ = 0.041665796;
      auVar185._16_4_ = 0.041665796;
      auVar185._20_4_ = 0.041665796;
      auVar185._24_4_ = 0.041665796;
      auVar185._28_4_ = 0.041665796;
      auVar185._32_4_ = 0.041665796;
      auVar185._36_4_ = 0.041665796;
      auVar185._40_4_ = 0.041665796;
      auVar185._44_4_ = 0.041665796;
      auVar185._48_4_ = 0.041665796;
      auVar185._52_4_ = 0.041665796;
      auVar185._56_4_ = 0.041665796;
      auVar185._60_4_ = 0.041665796;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar185);
      auVar184._8_4_ = 0.16666666;
      auVar184._12_4_ = 0.16666666;
      auVar184._0_4_ = 0.16666666;
      auVar184._4_4_ = 0.16666666;
      auVar184._16_4_ = 0.16666666;
      auVar184._20_4_ = 0.16666666;
      auVar184._24_4_ = 0.16666666;
      auVar184._28_4_ = 0.16666666;
      auVar184._32_4_ = 0.16666666;
      auVar184._36_4_ = 0.16666666;
      auVar184._40_4_ = 0.16666666;
      auVar184._44_4_ = 0.16666666;
      auVar184._48_4_ = 0.16666666;
      auVar184._52_4_ = 0.16666666;
      auVar184._56_4_ = 0.16666666;
      auVar184._60_4_ = 0.16666666;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar184);
      auVar183._8_4_ = 0.5;
      auVar183._12_4_ = 0.5;
      auVar183._0_4_ = 0.5;
      auVar183._4_4_ = 0.5;
      auVar183._16_4_ = 0.5;
      auVar183._20_4_ = 0.5;
      auVar183._24_4_ = 0.5;
      auVar183._28_4_ = 0.5;
      auVar183._32_4_ = 0.5;
      auVar183._36_4_ = 0.5;
      auVar183._40_4_ = 0.5;
      auVar183._44_4_ = 0.5;
      auVar183._48_4_ = 0.5;
      auVar183._52_4_ = 0.5;
      auVar183._56_4_ = 0.5;
      auVar183._60_4_ = 0.5;
      auVar300 = vfmadd213ps_avx512f(auVar298,auVar300,auVar183);
      auVar298 = vfmadd213ps_avx512f(auVar299,auVar300,auVar298);
      auVar35._8_4_ = 1.0;
      auVar35._12_4_ = 1.0;
      auVar35._0_4_ = 1.0;
      auVar35._4_4_ = 1.0;
      auVar35._16_4_ = 1.0;
      auVar35._20_4_ = 1.0;
      auVar35._24_4_ = 1.0;
      auVar35._28_4_ = 1.0;
      auVar35._32_4_ = 1.0;
      auVar35._36_4_ = 1.0;
      auVar35._40_4_ = 1.0;
      auVar35._44_4_ = 1.0;
      auVar35._48_4_ = 1.0;
      auVar35._52_4_ = 1.0;
      auVar35._56_4_ = 1.0;
      auVar35._60_4_ = 1.0;
      auVar300 = vaddps_avx512f(auVar298,auVar35);
      auVar292._16_8_ = uStack_130f0;
      auVar292._0_16_ = auStack_13100;
      auVar292._24_8_ = uStack_130e8;
      auVar292._32_8_ = uStack_130e0;
      auVar292._40_8_ = uStack_130d8;
      auVar292._48_8_ = uStack_130d0;
      auVar292._56_8_ = uStack_130c8;
      auVar298 = vcvttps2dq_avx512f(auVar292);
      vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar299 = vmovdqa64_avx512f(auVar299);
      auVar298 = vpaddd_avx512f(auVar298,auVar299);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vpslld_avx512f(auVar298,ZEXT416(0x17));
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmovdqa64_avx512f(auVar298);
      auVar298 = vmulps_avx512f(auVar300,auVar298);
      auStack_13200 = auVar298._0_8_;
      uStack_131f8 = auVar298._8_8_;
      uStack_131f0 = auVar298._16_8_;
      uStack_131e8 = auVar298._24_8_;
      uStack_131e0 = auVar298._32_8_;
      uStack_131d8 = auVar298._40_8_;
      uStack_131d0 = auVar298._48_8_;
      uStack_131c8 = auVar298._56_8_;
      *(undefined1 (*) [8])*pauStack_16650 = auStack_13200;
      *(undefined8 *)(*pauStack_16650 + 8) = uStack_131f8;
      *(undefined8 *)(*pauStack_16650 + 0x10) = uStack_131f0;
      *(undefined8 *)(*pauStack_16650 + 0x18) = uStack_131e8;
      *(undefined8 *)(*pauStack_16650 + 0x20) = uStack_131e0;
      *(undefined8 *)(*pauStack_16650 + 0x28) = uStack_131d8;
      *(undefined8 *)(*pauStack_16650 + 0x30) = uStack_131d0;
      *(undefined8 *)(*pauStack_16650 + 0x38) = uStack_131c8;
      auVar297 = vextractf64x4_avx512f(auVar298,1);
      fStack_e810 = auVar298._16_4_;
      fStack_e80c = auVar298._20_4_;
      fStack_e808 = auVar298._24_4_;
      fStack_e804 = auVar298._28_4_;
      fStack_e830 = auVar297._16_4_;
      fStack_e82c = auVar297._20_4_;
      fStack_e828 = auVar297._24_4_;
      fStack_e824 = auVar297._28_4_;
      fVar316 = fStack_e810 + fStack_e830 + local_e7e0;
      fVar317 = fStack_e80c + fStack_e82c + fStack_e7dc;
      uVar18 = CONCAT44(fVar317,fVar316);
      uVar37 = CONCAT44(fStack_e804 + fStack_e824 + fStack_e7d4,
                        fStack_e808 + fStack_e828 + fStack_e7d8);
      auVar38._8_8_ = uVar37;
      auVar38._0_8_ = uVar18;
      auVar16._8_8_ = uVar37;
      auVar16._0_8_ = uVar18;
      auVar17 = vunpckhpd_avx(auVar16,auVar38);
      local_e800 = auVar17._0_4_;
      fStack_e7fc = auVar17._4_4_;
      *(float *)*pauStack_16660 =
           fVar316 + local_e800 + fVar317 + fStack_e7fc + *(float *)*pauStack_16660;
      pauStack_16650 = pauStack_16650 + 1;
      pauStack_16658 = (undefined1 (*) [64])(*pauStack_16658 + 4);
      pauStack_16660 = (undefined1 (*) [64])(*pauStack_16660 + 4);
    }
  }
  pauStack_17308 = pauStack_159a8;
  iStack_1730c = 0;
  auVar298 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  for (; iStack_1730c + 0xf < iStack_15994; iStack_1730c = iStack_1730c + 0x10) {
    auVar299 = vdivps_avx512f(auVar298,*pauStack_17308);
    uStack_173c0 = auVar299._0_8_;
    uStack_173b8 = auVar299._8_8_;
    uStack_173b0 = auVar299._16_8_;
    uStack_173a8 = auVar299._24_8_;
    uStack_173a0 = auVar299._32_8_;
    uStack_17398 = auVar299._40_8_;
    uStack_17390 = auVar299._48_8_;
    uStack_17388 = auVar299._56_8_;
    *(undefined8 *)*pauStack_17308 = uStack_173c0;
    *(undefined8 *)(*pauStack_17308 + 8) = uStack_173b8;
    *(undefined8 *)(*pauStack_17308 + 0x10) = uStack_173b0;
    *(undefined8 *)(*pauStack_17308 + 0x18) = uStack_173a8;
    *(undefined8 *)(*pauStack_17308 + 0x20) = uStack_173a0;
    *(undefined8 *)(*pauStack_17308 + 0x28) = uStack_17398;
    *(undefined8 *)(*pauStack_17308 + 0x30) = uStack_17390;
    *(undefined8 *)(*pauStack_17308 + 0x38) = uStack_17388;
    pauStack_17308 = pauStack_17308 + 1;
  }
  auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
  auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
  uStack_d430 = auVar17._0_8_;
  uStack_d428 = auVar17._8_8_;
  for (; iStack_1730c + 7 < iStack_15994; iStack_1730c = iStack_1730c + 8) {
    auVar297._16_8_ = uStack_d430;
    auVar297._0_16_ = auVar16;
    auVar297._24_8_ = uStack_d428;
    auVar297 = vdivps_avx(auVar297,*(undefined1 (*) [32])*pauStack_17308);
    uStack_17400 = auVar297._0_8_;
    uStack_173f8 = auVar297._8_8_;
    uStack_173f0 = auVar297._16_8_;
    uStack_173e8 = auVar297._24_8_;
    *(undefined8 *)*pauStack_17308 = uStack_17400;
    *(undefined8 *)(*pauStack_17308 + 8) = uStack_173f8;
    *(undefined8 *)(*pauStack_17308 + 0x10) = uStack_173f0;
    *(undefined8 *)(*pauStack_17308 + 0x18) = uStack_173e8;
    pauStack_17308 = (undefined1 (*) [64])(*pauStack_17308 + 0x20);
  }
  for (; iStack_1730c + 3 < iStack_15994; iStack_1730c = iStack_1730c + 4) {
    auVar36._8_8_ = 0x3f8000003f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar17 = vdivps_avx(auVar36,*(undefined1 (*) [16])*pauStack_17308);
    uStack_17420 = auVar17._0_8_;
    uStack_17418 = auVar17._8_8_;
    *(undefined8 *)*pauStack_17308 = uStack_17420;
    *(undefined8 *)(*pauStack_17308 + 8) = uStack_17418;
    pauStack_17308 = (undefined1 (*) [64])(*pauStack_17308 + 0x10);
  }
  for (; iStack_1730c < iStack_15994; iStack_1730c = iStack_1730c + 1) {
    *(float *)*pauStack_17308 = 1.0 / *(float *)*pauStack_17308;
    pauStack_17308 = (undefined1 (*) [64])(*pauStack_17308 + 4);
  }
  for (iStack_17424 = 0; iStack_17424 < iStack_1598c; iStack_17424 = iStack_17424 + 1) {
    pauStack_17430 = (undefined1 (*) [64])(lStack_15988 + (long)(iStack_17424 * iStack_15990) * 4);
    pauStack_17438 = pauStack_159a8;
    for (iStack_1743c = 0; iStack_1743c + 3 < iStack_15994; iStack_1743c = iStack_1743c + 4) {
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauStack_17438));
      auVar298 = vmulps_avx512f(*pauStack_17430,auVar298);
      auVar299 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_17438 + 4)));
      auVar299 = vmulps_avx512f(pauStack_17430[1],auVar299);
      auVar300 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_17438 + 8)));
      auVar300 = vmulps_avx512f(pauStack_17430[2],auVar300);
      auVar301 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauStack_17438 + 0xc)));
      auVar301 = vmulps_avx512f(pauStack_17430[3],auVar301);
      uStack_17480 = auVar298._0_8_;
      uStack_17478 = auVar298._8_8_;
      uStack_17470 = auVar298._16_8_;
      uStack_17468 = auVar298._24_8_;
      uStack_17460 = auVar298._32_8_;
      uStack_17458 = auVar298._40_8_;
      uStack_17450 = auVar298._48_8_;
      uStack_17448 = auVar298._56_8_;
      *(undefined8 *)*pauStack_17430 = uStack_17480;
      *(undefined8 *)(*pauStack_17430 + 8) = uStack_17478;
      *(undefined8 *)(*pauStack_17430 + 0x10) = uStack_17470;
      *(undefined8 *)(*pauStack_17430 + 0x18) = uStack_17468;
      *(undefined8 *)(*pauStack_17430 + 0x20) = uStack_17460;
      *(undefined8 *)(*pauStack_17430 + 0x28) = uStack_17458;
      *(undefined8 *)(*pauStack_17430 + 0x30) = uStack_17450;
      *(undefined8 *)(*pauStack_17430 + 0x38) = uStack_17448;
      uStack_174c0 = auVar299._0_8_;
      uStack_174b8 = auVar299._8_8_;
      uStack_174b0 = auVar299._16_8_;
      uStack_174a8 = auVar299._24_8_;
      uStack_174a0 = auVar299._32_8_;
      uStack_17498 = auVar299._40_8_;
      uStack_17490 = auVar299._48_8_;
      uStack_17488 = auVar299._56_8_;
      *(undefined8 *)pauStack_17430[1] = uStack_174c0;
      *(undefined8 *)(pauStack_17430[1] + 8) = uStack_174b8;
      *(undefined8 *)(pauStack_17430[1] + 0x10) = uStack_174b0;
      *(undefined8 *)(pauStack_17430[1] + 0x18) = uStack_174a8;
      *(undefined8 *)(pauStack_17430[1] + 0x20) = uStack_174a0;
      *(undefined8 *)(pauStack_17430[1] + 0x28) = uStack_17498;
      *(undefined8 *)(pauStack_17430[1] + 0x30) = uStack_17490;
      *(undefined8 *)(pauStack_17430[1] + 0x38) = uStack_17488;
      uStack_17500 = auVar300._0_8_;
      uStack_174f8 = auVar300._8_8_;
      uStack_174f0 = auVar300._16_8_;
      uStack_174e8 = auVar300._24_8_;
      uStack_174e0 = auVar300._32_8_;
      uStack_174d8 = auVar300._40_8_;
      uStack_174d0 = auVar300._48_8_;
      uStack_174c8 = auVar300._56_8_;
      *(undefined8 *)pauStack_17430[2] = uStack_17500;
      *(undefined8 *)(pauStack_17430[2] + 8) = uStack_174f8;
      *(undefined8 *)(pauStack_17430[2] + 0x10) = uStack_174f0;
      *(undefined8 *)(pauStack_17430[2] + 0x18) = uStack_174e8;
      *(undefined8 *)(pauStack_17430[2] + 0x20) = uStack_174e0;
      *(undefined8 *)(pauStack_17430[2] + 0x28) = uStack_174d8;
      *(undefined8 *)(pauStack_17430[2] + 0x30) = uStack_174d0;
      *(undefined8 *)(pauStack_17430[2] + 0x38) = uStack_174c8;
      uStack_17540 = auVar301._0_8_;
      uStack_17538 = auVar301._8_8_;
      uStack_17530 = auVar301._16_8_;
      uStack_17528 = auVar301._24_8_;
      uStack_17520 = auVar301._32_8_;
      uStack_17518 = auVar301._40_8_;
      uStack_17510 = auVar301._48_8_;
      uStack_17508 = auVar301._56_8_;
      *(undefined8 *)pauStack_17430[3] = uStack_17540;
      *(undefined8 *)(pauStack_17430[3] + 8) = uStack_17538;
      *(undefined8 *)(pauStack_17430[3] + 0x10) = uStack_17530;
      *(undefined8 *)(pauStack_17430[3] + 0x18) = uStack_17528;
      *(undefined8 *)(pauStack_17430[3] + 0x20) = uStack_17520;
      *(undefined8 *)(pauStack_17430[3] + 0x28) = uStack_17518;
      *(undefined8 *)(pauStack_17430[3] + 0x30) = uStack_17510;
      *(undefined8 *)(pauStack_17430[3] + 0x38) = uStack_17508;
      pauStack_17430 = pauStack_17430 + 4;
      pauStack_17438 = (undefined1 (*) [64])(*pauStack_17438 + 0x10);
    }
    for (; iStack_1743c < iStack_15994; iStack_1743c = iStack_1743c + 1) {
      auVar298 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauStack_17438));
      auVar298 = vmulps_avx512f(*pauStack_17430,auVar298);
      uStack_17580 = auVar298._0_8_;
      uStack_17578 = auVar298._8_8_;
      uStack_17570 = auVar298._16_8_;
      uStack_17568 = auVar298._24_8_;
      uStack_17560 = auVar298._32_8_;
      uStack_17558 = auVar298._40_8_;
      uStack_17550 = auVar298._48_8_;
      uStack_17548 = auVar298._56_8_;
      *(undefined8 *)*pauStack_17430 = uStack_17580;
      *(undefined8 *)(*pauStack_17430 + 8) = uStack_17578;
      *(undefined8 *)(*pauStack_17430 + 0x10) = uStack_17570;
      *(undefined8 *)(*pauStack_17430 + 0x18) = uStack_17568;
      *(undefined8 *)(*pauStack_17430 + 0x20) = uStack_17560;
      *(undefined8 *)(*pauStack_17430 + 0x28) = uStack_17558;
      *(undefined8 *)(*pauStack_17430 + 0x30) = uStack_17550;
      *(undefined8 *)(*pauStack_17430 + 0x38) = uStack_17548;
      pauStack_17430 = pauStack_17430 + 1;
      pauStack_17438 = (undefined1 (*) [64])(*pauStack_17438 + 4);
    }
  }
  return;
}

Assistant:

static void softmax_pack16(float* _ptr, int elemcount, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    for (int i = 0; i < elemcount; i++)
    {
        const float* ptr = _ptr + i * stride;
        float* maxptr = _maxptr;

        int j = 0;
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 16 * 2);
            __m512 _p3 = _mm512_loadu_ps(ptr + 16 * 3);
            __m512 _p4 = _mm512_loadu_ps(ptr + 16 * 4);
            __m512 _p5 = _mm512_loadu_ps(ptr + 16 * 5);
            __m512 _p6 = _mm512_loadu_ps(ptr + 16 * 6);
            __m512 _p7 = _mm512_loadu_ps(ptr + 16 * 7);
            __m512 _p8 = _mm512_loadu_ps(ptr + 16 * 8);
            __m512 _p9 = _mm512_loadu_ps(ptr + 16 * 9);
            __m512 _pa = _mm512_loadu_ps(ptr + 16 * 10);
            __m512 _pb = _mm512_loadu_ps(ptr + 16 * 11);
            __m512 _pc = _mm512_loadu_ps(ptr + 16 * 12);
            __m512 _pd = _mm512_loadu_ps(ptr + 16 * 13);
            __m512 _pe = _mm512_loadu_ps(ptr + 16 * 14);
            __m512 _pf = _mm512_loadu_ps(ptr + 16 * 15);

            __m512 _tmp0 = _mm512_unpacklo_ps(_p0, _p1);
            __m512 _tmp1 = _mm512_unpackhi_ps(_p0, _p1);
            __m512 _tmp2 = _mm512_unpacklo_ps(_p2, _p3);
            __m512 _tmp3 = _mm512_unpackhi_ps(_p2, _p3);
            __m512 _tmp4 = _mm512_unpacklo_ps(_p4, _p5);
            __m512 _tmp5 = _mm512_unpackhi_ps(_p4, _p5);
            __m512 _tmp6 = _mm512_unpacklo_ps(_p6, _p7);
            __m512 _tmp7 = _mm512_unpackhi_ps(_p6, _p7);
            __m512 _tmp8 = _mm512_unpacklo_ps(_p8, _p9);
            __m512 _tmp9 = _mm512_unpackhi_ps(_p8, _p9);
            __m512 _tmpa = _mm512_unpacklo_ps(_pa, _pb);
            __m512 _tmpb = _mm512_unpackhi_ps(_pa, _pb);
            __m512 _tmpc = _mm512_unpacklo_ps(_pc, _pd);
            __m512 _tmpd = _mm512_unpackhi_ps(_pc, _pd);
            __m512 _tmpe = _mm512_unpacklo_ps(_pe, _pf);
            __m512 _tmpf = _mm512_unpackhi_ps(_pe, _pf);

            __m512 _max01 = _mm512_max_ps(_tmp0, _tmp1);
            __m512 _max23 = _mm512_max_ps(_tmp2, _tmp3);
            __m512 _max45 = _mm512_max_ps(_tmp4, _tmp5);
            __m512 _max67 = _mm512_max_ps(_tmp6, _tmp7);
            __m512 _max89 = _mm512_max_ps(_tmp8, _tmp9);
            __m512 _maxab = _mm512_max_ps(_tmpa, _tmpb);
            __m512 _maxcd = _mm512_max_ps(_tmpc, _tmpd);
            __m512 _maxef = _mm512_max_ps(_tmpe, _tmpf);

            _tmp0 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_max01), _mm512_castps_pd(_max23)));
            _tmp1 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_max01), _mm512_castps_pd(_max23)));
            _tmp2 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_max45), _mm512_castps_pd(_max67)));
            _tmp3 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_max45), _mm512_castps_pd(_max67)));
            _tmp4 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_max89), _mm512_castps_pd(_maxab)));
            _tmp5 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_max89), _mm512_castps_pd(_maxab)));
            _tmp6 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_maxcd), _mm512_castps_pd(_maxef)));
            _tmp7 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_maxcd), _mm512_castps_pd(_maxef)));

            __m512 _max0123 = _mm512_max_ps(_tmp0, _tmp1);
            __m512 _max4567 = _mm512_max_ps(_tmp2, _tmp3);
            __m512 _max89ab = _mm512_max_ps(_tmp4, _tmp5);
            __m512 _maxcdef = _mm512_max_ps(_tmp6, _tmp7);

            _tmp0 = _mm512_shuffle_f32x4(_max0123, _max4567, _MM_SHUFFLE(1, 0, 1, 0));
            _tmp1 = _mm512_shuffle_f32x4(_max0123, _max4567, _MM_SHUFFLE(3, 2, 3, 2));
            _tmp2 = _mm512_shuffle_f32x4(_max89ab, _maxcdef, _MM_SHUFFLE(1, 0, 1, 0));
            _tmp3 = _mm512_shuffle_f32x4(_max89ab, _maxcdef, _MM_SHUFFLE(3, 2, 3, 2));

            __m512 _max01234567 = _mm512_max_ps(_tmp0, _tmp1);
            __m512 _max89abcdef = _mm512_max_ps(_tmp2, _tmp3);

            _tmp0 = _mm512_shuffle_f32x4(_max01234567, _max89abcdef, _MM_SHUFFLE(2, 0, 2, 0));
            _tmp1 = _mm512_shuffle_f32x4(_max01234567, _max89abcdef, _MM_SHUFFLE(3, 1, 3, 1));

            __m512 _max1 = _mm512_max_ps(_tmp0, _tmp1);

            __m512 _max = _mm512_loadu_ps(maxptr);
            _max = _mm512_max_ps(_max, _max1);
            _mm512_storeu_ps(maxptr, _max);
            ptr += 256;
            maxptr += 16;
        }
        for (; j < size1; j++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            *maxptr = std::max(*maxptr, _mm512_comp_reduce_max_ps(_p));
            ptr += 16;
            maxptr++;
        }
    }

    // reduce exp(x - max)
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* maxptr = _maxptr;
        float* sumptr = _sumptr;

        int j = 0;
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 16 * 2);
            __m512 _p3 = _mm512_loadu_ps(ptr + 16 * 3);
            __m512 _p4 = _mm512_loadu_ps(ptr + 16 * 4);
            __m512 _p5 = _mm512_loadu_ps(ptr + 16 * 5);
            __m512 _p6 = _mm512_loadu_ps(ptr + 16 * 6);
            __m512 _p7 = _mm512_loadu_ps(ptr + 16 * 7);
            __m512 _p8 = _mm512_loadu_ps(ptr + 16 * 8);
            __m512 _p9 = _mm512_loadu_ps(ptr + 16 * 9);
            __m512 _pa = _mm512_loadu_ps(ptr + 16 * 10);
            __m512 _pb = _mm512_loadu_ps(ptr + 16 * 11);
            __m512 _pc = _mm512_loadu_ps(ptr + 16 * 12);
            __m512 _pd = _mm512_loadu_ps(ptr + 16 * 13);
            __m512 _pe = _mm512_loadu_ps(ptr + 16 * 14);
            __m512 _pf = _mm512_loadu_ps(ptr + 16 * 15);
            _p0 = exp512_ps(_mm512_sub_ps(_p0, _mm512_set1_ps(maxptr[0])));
            _p1 = exp512_ps(_mm512_sub_ps(_p1, _mm512_set1_ps(maxptr[1])));
            _p2 = exp512_ps(_mm512_sub_ps(_p2, _mm512_set1_ps(maxptr[2])));
            _p3 = exp512_ps(_mm512_sub_ps(_p3, _mm512_set1_ps(maxptr[3])));
            _p4 = exp512_ps(_mm512_sub_ps(_p4, _mm512_set1_ps(maxptr[4])));
            _p5 = exp512_ps(_mm512_sub_ps(_p5, _mm512_set1_ps(maxptr[5])));
            _p6 = exp512_ps(_mm512_sub_ps(_p6, _mm512_set1_ps(maxptr[6])));
            _p7 = exp512_ps(_mm512_sub_ps(_p7, _mm512_set1_ps(maxptr[7])));
            _p8 = exp512_ps(_mm512_sub_ps(_p8, _mm512_set1_ps(maxptr[8])));
            _p9 = exp512_ps(_mm512_sub_ps(_p9, _mm512_set1_ps(maxptr[9])));
            _pa = exp512_ps(_mm512_sub_ps(_pa, _mm512_set1_ps(maxptr[10])));
            _pb = exp512_ps(_mm512_sub_ps(_pb, _mm512_set1_ps(maxptr[11])));
            _pc = exp512_ps(_mm512_sub_ps(_pc, _mm512_set1_ps(maxptr[12])));
            _pd = exp512_ps(_mm512_sub_ps(_pd, _mm512_set1_ps(maxptr[13])));
            _pe = exp512_ps(_mm512_sub_ps(_pe, _mm512_set1_ps(maxptr[14])));
            _pf = exp512_ps(_mm512_sub_ps(_pf, _mm512_set1_ps(maxptr[15])));
            _mm512_storeu_ps(ptr, _p0);
            _mm512_storeu_ps(ptr + 16, _p1);
            _mm512_storeu_ps(ptr + 16 * 2, _p2);
            _mm512_storeu_ps(ptr + 16 * 3, _p3);
            _mm512_storeu_ps(ptr + 16 * 4, _p4);
            _mm512_storeu_ps(ptr + 16 * 5, _p5);
            _mm512_storeu_ps(ptr + 16 * 6, _p6);
            _mm512_storeu_ps(ptr + 16 * 7, _p7);
            _mm512_storeu_ps(ptr + 16 * 8, _p8);
            _mm512_storeu_ps(ptr + 16 * 9, _p9);
            _mm512_storeu_ps(ptr + 16 * 10, _pa);
            _mm512_storeu_ps(ptr + 16 * 11, _pb);
            _mm512_storeu_ps(ptr + 16 * 12, _pc);
            _mm512_storeu_ps(ptr + 16 * 13, _pd);
            _mm512_storeu_ps(ptr + 16 * 14, _pe);
            _mm512_storeu_ps(ptr + 16 * 15, _pf);

            __m512 _tmp0 = _mm512_unpacklo_ps(_p0, _p1);
            __m512 _tmp1 = _mm512_unpackhi_ps(_p0, _p1);
            __m512 _tmp2 = _mm512_unpacklo_ps(_p2, _p3);
            __m512 _tmp3 = _mm512_unpackhi_ps(_p2, _p3);
            __m512 _tmp4 = _mm512_unpacklo_ps(_p4, _p5);
            __m512 _tmp5 = _mm512_unpackhi_ps(_p4, _p5);
            __m512 _tmp6 = _mm512_unpacklo_ps(_p6, _p7);
            __m512 _tmp7 = _mm512_unpackhi_ps(_p6, _p7);
            __m512 _tmp8 = _mm512_unpacklo_ps(_p8, _p9);
            __m512 _tmp9 = _mm512_unpackhi_ps(_p8, _p9);
            __m512 _tmpa = _mm512_unpacklo_ps(_pa, _pb);
            __m512 _tmpb = _mm512_unpackhi_ps(_pa, _pb);
            __m512 _tmpc = _mm512_unpacklo_ps(_pc, _pd);
            __m512 _tmpd = _mm512_unpackhi_ps(_pc, _pd);
            __m512 _tmpe = _mm512_unpacklo_ps(_pe, _pf);
            __m512 _tmpf = _mm512_unpackhi_ps(_pe, _pf);

            __m512 _sum01 = _mm512_add_ps(_tmp0, _tmp1);
            __m512 _sum23 = _mm512_add_ps(_tmp2, _tmp3);
            __m512 _sum45 = _mm512_add_ps(_tmp4, _tmp5);
            __m512 _sum67 = _mm512_add_ps(_tmp6, _tmp7);
            __m512 _sum89 = _mm512_add_ps(_tmp8, _tmp9);
            __m512 _sumab = _mm512_add_ps(_tmpa, _tmpb);
            __m512 _sumcd = _mm512_add_ps(_tmpc, _tmpd);
            __m512 _sumef = _mm512_add_ps(_tmpe, _tmpf);

            _tmp0 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_sum01), _mm512_castps_pd(_sum23)));
            _tmp1 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_sum01), _mm512_castps_pd(_sum23)));
            _tmp2 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_sum45), _mm512_castps_pd(_sum67)));
            _tmp3 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_sum45), _mm512_castps_pd(_sum67)));
            _tmp4 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_sum89), _mm512_castps_pd(_sumab)));
            _tmp5 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_sum89), _mm512_castps_pd(_sumab)));
            _tmp6 = _mm512_castpd_ps(_mm512_unpacklo_pd(_mm512_castps_pd(_sumcd), _mm512_castps_pd(_sumef)));
            _tmp7 = _mm512_castpd_ps(_mm512_unpackhi_pd(_mm512_castps_pd(_sumcd), _mm512_castps_pd(_sumef)));

            __m512 _sum0123 = _mm512_add_ps(_tmp0, _tmp1);
            __m512 _sum4567 = _mm512_add_ps(_tmp2, _tmp3);
            __m512 _sum89ab = _mm512_add_ps(_tmp4, _tmp5);
            __m512 _sumcdef = _mm512_add_ps(_tmp6, _tmp7);

            _tmp0 = _mm512_shuffle_f32x4(_sum0123, _sum4567, _MM_SHUFFLE(1, 0, 1, 0));
            _tmp1 = _mm512_shuffle_f32x4(_sum0123, _sum4567, _MM_SHUFFLE(3, 2, 3, 2));
            _tmp2 = _mm512_shuffle_f32x4(_sum89ab, _sumcdef, _MM_SHUFFLE(1, 0, 1, 0));
            _tmp3 = _mm512_shuffle_f32x4(_sum89ab, _sumcdef, _MM_SHUFFLE(3, 2, 3, 2));

            __m512 _sum01234567 = _mm512_add_ps(_tmp0, _tmp1);
            __m512 _sum89abcdef = _mm512_add_ps(_tmp2, _tmp3);

            _tmp0 = _mm512_shuffle_f32x4(_sum01234567, _sum89abcdef, _MM_SHUFFLE(2, 0, 2, 0));
            _tmp1 = _mm512_shuffle_f32x4(_sum01234567, _sum89abcdef, _MM_SHUFFLE(3, 1, 3, 1));

            __m512 _sum1 = _mm512_add_ps(_tmp0, _tmp1);

            __m512 _sum = _mm512_loadu_ps(sumptr);
            _sum = _mm512_add_ps(_sum, _sum1);
            _mm512_storeu_ps(sumptr, _sum);
            ptr += 256;
            maxptr += 16;
            sumptr += 16;
        }
        for (; j < size1; j++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _max = _mm512_set1_ps(*maxptr);
            _p = exp512_ps(_mm512_sub_ps(_p, _max));
            _mm512_storeu_ps(ptr, _p);
            *sumptr += _mm512_comp_reduce_add_ps(_p);
            ptr += 16;
            maxptr++;
            sumptr++;
        }
    }

    {
        float* sumptr = _sumptr;
        int j = 0;
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _sum = _mm512_loadu_ps(sumptr);
            _sum = _mm512_div_ps(_one_avx512, _sum);
            _mm512_storeu_ps(sumptr, _sum);
            sumptr += 16;
        }
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; j + 7 < size1; j += 8)
        {
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _sum = _mm256_div_ps(_one_avx, _sum);
            _mm256_storeu_ps(sumptr, _sum);
            sumptr += 8;
        }
        __m128 _one = _mm_set1_ps(1.f);
        for (; j + 3 < size1; j += 4)
        {
            __m128 _sum = _mm_loadu_ps(sumptr);
            _sum = _mm_div_ps(_one, _sum);
            _mm_storeu_ps(sumptr, _sum);
            sumptr += 4;
        }
        for (; j < size1; j++)
        {
            *sumptr = 1.f / *sumptr;
            sumptr++;
        }
    }

    // div sum
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* sumptr = _sumptr;

        int j = 0;
        for (; j + 3 < size1; j += 4)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 32);
            __m512 _p3 = _mm512_loadu_ps(ptr + 48);
            _p0 = _mm512_mul_ps(_p0, _mm512_set1_ps(sumptr[0]));
            _p1 = _mm512_mul_ps(_p1, _mm512_set1_ps(sumptr[1]));
            _p2 = _mm512_mul_ps(_p2, _mm512_set1_ps(sumptr[2]));
            _p3 = _mm512_mul_ps(_p3, _mm512_set1_ps(sumptr[3]));
            _mm512_storeu_ps(ptr, _p0);
            _mm512_storeu_ps(ptr + 16, _p1);
            _mm512_storeu_ps(ptr + 32, _p2);
            _mm512_storeu_ps(ptr + 48, _p3);
            ptr += 64;
            sumptr += 4;
        }
        for (; j < size1; j++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _sum = _mm512_set1_ps(*sumptr);
            _p = _mm512_mul_ps(_p, _sum);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
            sumptr++;
        }
    }
}